

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  RTCRayQueryContext *pRVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  ulong uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  byte bVar63;
  byte bVar64;
  byte bVar65;
  byte bVar66;
  byte bVar67;
  ulong uVar68;
  byte bVar69;
  ulong uVar70;
  undefined8 in_R10;
  long lVar71;
  bool bVar72;
  undefined1 uVar73;
  undefined1 uVar74;
  uint uVar75;
  uint uVar138;
  uint uVar139;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  uint uVar141;
  uint uVar142;
  uint uVar143;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  uint uVar140;
  uint uVar144;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  float fVar145;
  float fVar146;
  vint4 bi_2;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar161;
  float fVar162;
  undefined4 uVar163;
  float fVar177;
  float fVar179;
  vint4 bi_1;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar178;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar172 [16];
  undefined1 auVar176 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  vint4 ai_2;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar228 [32];
  vint4 bi;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  vint4 ai;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar240 [16];
  undefined1 auVar239 [16];
  undefined1 auVar242 [32];
  undefined1 auVar241 [16];
  undefined1 auVar243 [32];
  vint4 ai_1;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [64];
  undefined1 auVar253 [16];
  undefined1 auVar256 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar257 [64];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [28];
  undefined1 auVar262 [32];
  undefined1 auVar263 [64];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [64];
  undefined1 auVar269 [32];
  undefined1 auVar270 [64];
  undefined1 in_ZMM31 [64];
  vfloat<8> dOdO;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  int local_d04;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  RTCFilterFunctionNArguments local_b30;
  undefined1 local_b00 [32];
  undefined1 (*local_ad8) [32];
  Primitive *local_ad0;
  ulong local_ac8;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [64];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [64];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar227 [32];
  
  uVar70 = (ulong)(byte)prim[1];
  fVar145 = *(float *)(prim + uVar70 * 0x19 + 0x12);
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar80 = vsubps_avx(auVar80,*(undefined1 (*) [16])(prim + uVar70 * 0x19 + 6));
  auVar209._0_4_ = fVar145 * auVar80._0_4_;
  auVar209._4_4_ = fVar145 * auVar80._4_4_;
  auVar209._8_4_ = fVar145 * auVar80._8_4_;
  auVar209._12_4_ = fVar145 * auVar80._12_4_;
  auVar89._0_4_ = fVar145 * auVar79._0_4_;
  auVar89._4_4_ = fVar145 * auVar79._4_4_;
  auVar89._8_4_ = fVar145 * auVar79._8_4_;
  auVar89._12_4_ = fVar145 * auVar79._12_4_;
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xb + 6)));
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xc + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xd + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x12 + 6)));
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x13 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x14 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar266._4_4_ = auVar89._0_4_;
  auVar266._0_4_ = auVar89._0_4_;
  auVar266._8_4_ = auVar89._0_4_;
  auVar266._12_4_ = auVar89._0_4_;
  auVar85 = vshufps_avx(auVar89,auVar89,0x55);
  auVar87 = vshufps_avx(auVar89,auVar89,0xaa);
  fVar145 = auVar87._0_4_;
  auVar229._0_4_ = fVar145 * auVar76._0_4_;
  fVar161 = auVar87._4_4_;
  auVar229._4_4_ = fVar161 * auVar76._4_4_;
  fVar177 = auVar87._8_4_;
  auVar229._8_4_ = fVar177 * auVar76._8_4_;
  fVar179 = auVar87._12_4_;
  auVar229._12_4_ = fVar179 * auVar76._12_4_;
  auVar164._0_4_ = auVar77._0_4_ * fVar145;
  auVar164._4_4_ = auVar77._4_4_ * fVar161;
  auVar164._8_4_ = auVar77._8_4_ * fVar177;
  auVar164._12_4_ = auVar77._12_4_ * fVar179;
  auVar90._0_4_ = auVar78._0_4_ * fVar145;
  auVar90._4_4_ = auVar78._4_4_ * fVar161;
  auVar90._8_4_ = auVar78._8_4_ * fVar177;
  auVar90._12_4_ = auVar78._12_4_ * fVar179;
  auVar87 = vfmadd231ps_fma(auVar229,auVar85,auVar79);
  auVar88 = vfmadd231ps_fma(auVar164,auVar85,auVar81);
  auVar85 = vfmadd231ps_fma(auVar90,auVar82,auVar85);
  auVar86 = vfmadd231ps_fma(auVar87,auVar266,auVar80);
  auVar88 = vfmadd231ps_fma(auVar88,auVar266,auVar83);
  auVar89 = vfmadd231ps_fma(auVar85,auVar84,auVar266);
  auVar267._4_4_ = auVar209._0_4_;
  auVar267._0_4_ = auVar209._0_4_;
  auVar267._8_4_ = auVar209._0_4_;
  auVar267._12_4_ = auVar209._0_4_;
  auVar85 = vshufps_avx(auVar209,auVar209,0x55);
  auVar87 = vshufps_avx(auVar209,auVar209,0xaa);
  auVar76 = vmulps_avx512vl(auVar87,auVar76);
  auVar210._0_4_ = auVar87._0_4_ * auVar77._0_4_;
  auVar210._4_4_ = auVar87._4_4_ * auVar77._4_4_;
  auVar210._8_4_ = auVar87._8_4_ * auVar77._8_4_;
  auVar210._12_4_ = auVar87._12_4_ * auVar77._12_4_;
  auVar189._0_4_ = auVar87._0_4_ * auVar78._0_4_;
  auVar189._4_4_ = auVar87._4_4_ * auVar78._4_4_;
  auVar189._8_4_ = auVar87._8_4_ * auVar78._8_4_;
  auVar189._12_4_ = auVar87._12_4_ * auVar78._12_4_;
  auVar77 = vfmadd231ps_avx512vl(auVar76,auVar85,auVar79);
  auVar79 = vfmadd231ps_fma(auVar210,auVar85,auVar81);
  auVar76 = vfmadd231ps_fma(auVar189,auVar85,auVar82);
  auVar78 = vfmadd231ps_avx512vl(auVar77,auVar267,auVar80);
  auVar77 = vfmadd231ps_fma(auVar79,auVar267,auVar83);
  auVar82 = vfmadd231ps_fma(auVar76,auVar267,auVar84);
  auVar253._8_4_ = 0x7fffffff;
  auVar253._0_8_ = 0x7fffffff7fffffff;
  auVar253._12_4_ = 0x7fffffff;
  auVar80 = vandps_avx(auVar86,auVar253);
  auVar244._8_4_ = 0x219392ef;
  auVar244._0_8_ = 0x219392ef219392ef;
  auVar244._12_4_ = 0x219392ef;
  uVar68 = vcmpps_avx512vl(auVar80,auVar244,1);
  bVar72 = (bool)((byte)uVar68 & 1);
  auVar87._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar86._0_4_;
  bVar72 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar86._4_4_;
  bVar72 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar86._8_4_;
  bVar72 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar86._12_4_;
  auVar80 = vandps_avx(auVar88,auVar253);
  uVar68 = vcmpps_avx512vl(auVar80,auVar244,1);
  bVar72 = (bool)((byte)uVar68 & 1);
  auVar86._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar88._0_4_;
  bVar72 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar88._4_4_;
  bVar72 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar88._8_4_;
  bVar72 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar88._12_4_;
  auVar80 = vandps_avx(auVar89,auVar253);
  uVar68 = vcmpps_avx512vl(auVar80,auVar244,1);
  bVar72 = (bool)((byte)uVar68 & 1);
  auVar88._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar89._0_4_;
  bVar72 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar89._4_4_;
  bVar72 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar89._8_4_;
  bVar72 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar89._12_4_;
  auVar79 = vrcp14ps_avx512vl(auVar87);
  auVar245._8_4_ = 0x3f800000;
  auVar245._0_8_ = 0x3f8000003f800000;
  auVar245._12_4_ = 0x3f800000;
  auVar80 = vfnmadd213ps_fma(auVar87,auVar79,auVar245);
  auVar76 = vfmadd132ps_fma(auVar80,auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar86);
  auVar80 = vfnmadd213ps_fma(auVar86,auVar79,auVar245);
  auVar81 = vfmadd132ps_fma(auVar80,auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar88);
  auVar80 = vfnmadd213ps_fma(auVar88,auVar79,auVar245);
  auVar84 = vfmadd132ps_fma(auVar80,auVar79,auVar79);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar80 = vpmovsxwd_avx(auVar80);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx512vl(auVar80,auVar78);
  auVar236._0_4_ = auVar76._0_4_ * auVar80._0_4_;
  auVar236._4_4_ = auVar76._4_4_ * auVar80._4_4_;
  auVar236._8_4_ = auVar76._8_4_ * auVar80._8_4_;
  auVar236._12_4_ = auVar76._12_4_ * auVar80._12_4_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar80 = vpmovsxwd_avx(auVar79);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx512vl(auVar80,auVar78);
  auVar230._0_4_ = auVar76._0_4_ * auVar80._0_4_;
  auVar230._4_4_ = auVar76._4_4_ * auVar80._4_4_;
  auVar230._8_4_ = auVar76._8_4_ * auVar80._8_4_;
  auVar230._12_4_ = auVar76._12_4_ * auVar80._12_4_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar70 * 0xe + 6);
  auVar80 = vpmovsxwd_avx(auVar76);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar77);
  auVar246._0_4_ = auVar81._0_4_ * auVar80._0_4_;
  auVar246._4_4_ = auVar81._4_4_ * auVar80._4_4_;
  auVar246._8_4_ = auVar81._8_4_ * auVar80._8_4_;
  auVar246._12_4_ = auVar81._12_4_ * auVar80._12_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar80 = vpmovsxwd_avx(auVar83);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar77);
  auVar165._0_4_ = auVar81._0_4_ * auVar80._0_4_;
  auVar165._4_4_ = auVar81._4_4_ * auVar80._4_4_;
  auVar165._8_4_ = auVar81._8_4_ * auVar80._8_4_;
  auVar165._12_4_ = auVar81._12_4_ * auVar80._12_4_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar70 * 0x15 + 6);
  auVar80 = vpmovsxwd_avx(auVar81);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar82);
  auVar211._0_4_ = auVar84._0_4_ * auVar80._0_4_;
  auVar211._4_4_ = auVar84._4_4_ * auVar80._4_4_;
  auVar211._8_4_ = auVar84._8_4_ * auVar80._8_4_;
  auVar211._12_4_ = auVar84._12_4_ * auVar80._12_4_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar70 * 0x17 + 6);
  auVar80 = vpmovsxwd_avx(auVar77);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar82);
  auVar147._0_4_ = auVar84._0_4_ * auVar80._0_4_;
  auVar147._4_4_ = auVar84._4_4_ * auVar80._4_4_;
  auVar147._8_4_ = auVar84._8_4_ * auVar80._8_4_;
  auVar147._12_4_ = auVar84._12_4_ * auVar80._12_4_;
  auVar80 = vpminsd_avx(auVar236,auVar230);
  auVar79 = vpminsd_avx(auVar246,auVar165);
  auVar80 = vmaxps_avx(auVar80,auVar79);
  auVar79 = vpminsd_avx(auVar211,auVar147);
  uVar163 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar84._4_4_ = uVar163;
  auVar84._0_4_ = uVar163;
  auVar84._8_4_ = uVar163;
  auVar84._12_4_ = uVar163;
  auVar79 = vmaxps_avx512vl(auVar79,auVar84);
  auVar80 = vmaxps_avx(auVar80,auVar79);
  auVar82._8_4_ = 0x3f7ffffa;
  auVar82._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar82._12_4_ = 0x3f7ffffa;
  local_620 = vmulps_avx512vl(auVar80,auVar82);
  auVar80 = vpmaxsd_avx(auVar236,auVar230);
  auVar79 = vpmaxsd_avx(auVar246,auVar165);
  auVar80 = vminps_avx(auVar80,auVar79);
  auVar79 = vpmaxsd_avx(auVar211,auVar147);
  uVar163 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar78._4_4_ = uVar163;
  auVar78._0_4_ = uVar163;
  auVar78._8_4_ = uVar163;
  auVar78._12_4_ = uVar163;
  auVar79 = vminps_avx512vl(auVar79,auVar78);
  auVar80 = vminps_avx(auVar80,auVar79);
  auVar85._8_4_ = 0x3f800003;
  auVar85._0_8_ = 0x3f8000033f800003;
  auVar85._12_4_ = 0x3f800003;
  auVar80 = vmulps_avx512vl(auVar80,auVar85);
  auVar79 = vpbroadcastd_avx512vl();
  uVar23 = vcmpps_avx512vl(local_620,auVar80,2);
  uVar26 = vpcmpgtd_avx512vl(auVar79,_DAT_01f4ad30);
  local_ac8 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)((byte)uVar23 & 0xf & (byte)uVar26));
  local_ad8 = (undefined1 (*) [32])local_240;
  auVar160 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar160);
  local_ad0 = prim;
LAB_0182dedb:
  if (local_ac8 == 0) {
    return;
  }
  lVar71 = 0;
  for (uVar68 = local_ac8; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    lVar71 = lVar71 + 1;
  }
  uVar5 = *(uint *)(prim + 2);
  uVar6 = *(uint *)(prim + lVar71 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar6);
  p_Var8 = pGVar7[1].intersectionFilterN;
  lVar71 = *(long *)&pGVar7[1].time_range.upper;
  auVar80 = *(undefined1 (*) [16])(lVar71 + (long)p_Var8 * uVar68);
  auVar79 = *(undefined1 (*) [16])(lVar71 + (uVar68 + 1) * (long)p_Var8);
  auVar76 = *(undefined1 (*) [16])(lVar71 + (uVar68 + 2) * (long)p_Var8);
  local_ac8 = local_ac8 - 1 & local_ac8;
  auVar83 = *(undefined1 (*) [16])(lVar71 + (uVar68 + 3) * (long)p_Var8);
  if (local_ac8 != 0) {
    uVar70 = local_ac8 - 1 & local_ac8;
    for (uVar68 = local_ac8; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    }
    if (uVar70 != 0) {
      for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar77 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_700 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  local_720 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar81 = vunpcklps_avx512vl(local_700._0_16_,local_720._0_16_);
  _local_740 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar78 = local_740._0_16_;
  local_9d0 = vinsertps_avx512f(auVar81,auVar78,0x28);
  auVar237._0_4_ = auVar80._0_4_ + auVar79._0_4_ + auVar76._0_4_ + auVar83._0_4_;
  auVar237._4_4_ = auVar80._4_4_ + auVar79._4_4_ + auVar76._4_4_ + auVar83._4_4_;
  auVar237._8_4_ = auVar80._8_4_ + auVar79._8_4_ + auVar76._8_4_ + auVar83._8_4_;
  auVar237._12_4_ = auVar80._12_4_ + auVar79._12_4_ + auVar76._12_4_ + auVar83._12_4_;
  auVar27._8_4_ = 0x3e800000;
  auVar27._0_8_ = 0x3e8000003e800000;
  auVar27._12_4_ = 0x3e800000;
  auVar81 = vmulps_avx512vl(auVar237,auVar27);
  auVar81 = vsubps_avx(auVar81,auVar77);
  auVar81 = vdpps_avx(auVar81,local_9d0,0x7f);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  fVar145 = *(float *)(ray + k * 4 + 0xc0);
  auVar247._4_12_ = ZEXT812(0) << 0x20;
  auVar247._0_4_ = local_9e0._0_4_;
  auVar82 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar247);
  auVar84 = vfnmadd213ss_fma(auVar82,local_9e0,ZEXT416(0x40000000));
  local_580 = auVar81._0_4_ * auVar82._0_4_ * auVar84._0_4_;
  auVar248._4_4_ = local_580;
  auVar248._0_4_ = local_580;
  auVar248._8_4_ = local_580;
  auVar248._12_4_ = local_580;
  fStack_990 = local_580;
  _local_9a0 = auVar248;
  fStack_98c = local_580;
  fStack_988 = local_580;
  fStack_984 = local_580;
  auVar81 = vfmadd231ps_fma(auVar77,local_9d0,auVar248);
  auVar81 = vblendps_avx(auVar81,ZEXT816(0) << 0x40,8);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar76 = vsubps_avx(auVar76,auVar81);
  auVar79 = vsubps_avx(auVar79,auVar81);
  auVar83 = vsubps_avx(auVar83,auVar81);
  uVar163 = auVar80._0_4_;
  local_a60._4_4_ = uVar163;
  local_a60._0_4_ = uVar163;
  local_a60._8_4_ = uVar163;
  local_a60._12_4_ = uVar163;
  local_a60._16_4_ = uVar163;
  local_a60._20_4_ = uVar163;
  local_a60._24_4_ = uVar163;
  local_a60._28_4_ = uVar163;
  auVar260 = ZEXT3264(local_a60);
  auVar97._8_4_ = 1;
  auVar97._0_8_ = 0x100000001;
  auVar97._12_4_ = 1;
  auVar97._16_4_ = 1;
  auVar97._20_4_ = 1;
  auVar97._24_4_ = 1;
  auVar97._28_4_ = 1;
  local_820 = ZEXT1632(auVar80);
  local_a80 = vpermps_avx2(auVar97,local_820);
  auVar265 = ZEXT3264(local_a80);
  auVar98._8_4_ = 2;
  auVar98._0_8_ = 0x200000002;
  auVar98._12_4_ = 2;
  auVar98._16_4_ = 2;
  auVar98._20_4_ = 2;
  auVar98._24_4_ = 2;
  auVar98._28_4_ = 2;
  local_aa0 = vpermps_avx2(auVar98,local_820);
  auVar268 = ZEXT3264(local_aa0);
  auVar99._8_4_ = 3;
  auVar99._0_8_ = 0x300000003;
  auVar99._12_4_ = 3;
  auVar99._16_4_ = 3;
  auVar99._20_4_ = 3;
  auVar99._24_4_ = 3;
  auVar99._28_4_ = 3;
  local_a00 = vpermps_avx2(auVar99,local_820);
  uVar163 = auVar79._0_4_;
  local_a20._4_4_ = uVar163;
  local_a20._0_4_ = uVar163;
  local_a20._8_4_ = uVar163;
  local_a20._12_4_ = uVar163;
  local_a20._16_4_ = uVar163;
  local_a20._20_4_ = uVar163;
  local_a20._24_4_ = uVar163;
  local_a20._28_4_ = uVar163;
  auVar252 = ZEXT3264(local_a20);
  local_860 = ZEXT1632(auVar79);
  local_a40 = vpermps_avx2(auVar97,local_860);
  local_ac0 = vpermps_avx2(auVar98,local_860);
  auVar270 = ZEXT3264(local_ac0);
  auVar91 = vpermps_avx512vl(auVar99,local_860);
  auVar259 = ZEXT3264(local_a40);
  auVar92 = vbroadcastss_avx512vl(auVar76);
  local_840 = ZEXT1632(auVar76);
  auVar93 = vpermps_avx512vl(auVar97,local_840);
  auVar94 = vpermps_avx512vl(auVar98,local_840);
  auVar95 = vpermps_avx512vl(auVar99,local_840);
  auVar257 = ZEXT3264(local_a00);
  auVar96 = vbroadcastss_avx512vl(auVar83);
  _local_880 = ZEXT1632(auVar83);
  auVar97 = vpermps_avx512vl(auVar97,_local_880);
  auVar98 = vpermps_avx512vl(auVar98,_local_880);
  auVar99 = vpermps_avx512vl(auVar99,_local_880);
  auVar80 = vmulss_avx512f(auVar78,auVar78);
  auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),local_720,local_720);
  auVar100 = vfmadd231ps_avx512vl(auVar100,local_700,local_700);
  auVar101 = vbroadcastss_avx512vl(auVar100._0_16_);
  auVar100._8_4_ = 0x7fffffff;
  auVar100._0_8_ = 0x7fffffff7fffffff;
  auVar100._12_4_ = 0x7fffffff;
  auVar100._16_4_ = 0x7fffffff;
  auVar100._20_4_ = 0x7fffffff;
  auVar100._24_4_ = 0x7fffffff;
  auVar100._28_4_ = 0x7fffffff;
  vandps_avx512vl(auVar101,auVar100);
  local_560 = auVar101;
  local_960 = ZEXT416((uint)local_580);
  local_580 = fVar145 - local_580;
  fStack_57c = local_580;
  fStack_578 = local_580;
  fStack_574 = local_580;
  fStack_570 = local_580;
  fStack_56c = local_580;
  fStack_568 = local_580;
  fStack_564 = local_580;
  auVar160 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar160);
  uVar68 = 0;
  local_d04 = 1;
  auVar160 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar160);
  auVar80 = vsqrtss_avx(local_9e0,local_9e0);
  auVar79 = vsqrtss_avx(local_9e0,local_9e0);
  auVar263 = ZEXT3264(local_ac0);
  local_610 = ZEXT816(0x3f80000000000000);
  auVar160 = ZEXT3264(_DAT_01f7b040);
  do {
    auVar76 = vmovshdup_avx(local_610);
    auVar76 = vsubps_avx(auVar76,local_610);
    fVar183 = auVar76._0_4_;
    fVar146 = fVar183 * 0.04761905;
    auVar204._0_4_ = local_610._0_4_;
    auVar204._4_4_ = auVar204._0_4_;
    auVar204._8_4_ = auVar204._0_4_;
    auVar204._12_4_ = auVar204._0_4_;
    auVar204._16_4_ = auVar204._0_4_;
    auVar204._20_4_ = auVar204._0_4_;
    auVar204._24_4_ = auVar204._0_4_;
    auVar204._28_4_ = auVar204._0_4_;
    auVar212._4_4_ = fVar183;
    auVar212._0_4_ = fVar183;
    auVar212._8_4_ = fVar183;
    auVar212._12_4_ = fVar183;
    auVar227._16_4_ = fVar183;
    auVar227._0_16_ = auVar212;
    auVar227._20_4_ = fVar183;
    auVar227._24_4_ = fVar183;
    auVar227._28_4_ = fVar183;
    auVar76 = vfmadd231ps_fma(auVar204,auVar227,auVar160._0_32_);
    auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar100 = vsubps_avx512vl(auVar102,ZEXT1632(auVar76));
    fVar161 = auVar76._0_4_;
    fVar177 = auVar76._4_4_;
    auVar104._4_4_ = auVar252._4_4_ * fVar177;
    auVar104._0_4_ = auVar252._0_4_ * fVar161;
    fVar179 = auVar76._8_4_;
    auVar104._8_4_ = auVar252._8_4_ * fVar179;
    fVar181 = auVar76._12_4_;
    auVar104._12_4_ = auVar252._12_4_ * fVar181;
    auVar104._16_4_ = auVar252._16_4_ * 0.0;
    auVar104._20_4_ = auVar252._20_4_ * 0.0;
    auVar104._24_4_ = auVar252._24_4_ * 0.0;
    auVar104._28_4_ = auVar204._0_4_;
    auVar105._4_4_ = auVar259._4_4_ * fVar177;
    auVar105._0_4_ = auVar259._0_4_ * fVar161;
    auVar105._8_4_ = auVar259._8_4_ * fVar179;
    auVar105._12_4_ = auVar259._12_4_ * fVar181;
    auVar105._16_4_ = auVar259._16_4_ * 0.0;
    auVar105._20_4_ = auVar259._20_4_ * 0.0;
    auVar105._24_4_ = auVar259._24_4_ * 0.0;
    auVar105._28_4_ = fVar183;
    auVar137._0_4_ = auVar263._0_4_ * fVar161;
    auVar137._4_4_ = auVar263._4_4_ * fVar177;
    auVar137._8_4_ = auVar263._8_4_ * fVar179;
    auVar137._12_4_ = auVar263._12_4_ * fVar181;
    auVar137._16_4_ = auVar263._16_4_ * 0.0;
    auVar137._20_4_ = auVar263._20_4_ * 0.0;
    auVar137._28_36_ = auVar160._28_36_;
    auVar137._24_4_ = auVar263._24_4_ * 0.0;
    auVar103 = vmulps_avx512vl(auVar91,ZEXT1632(auVar76));
    auVar83 = vfmadd231ps_fma(auVar104,auVar100,auVar260._0_32_);
    auVar81 = vfmadd231ps_fma(auVar105,auVar100,auVar265._0_32_);
    auVar77 = vfmadd231ps_fma(auVar137._0_32_,auVar100,auVar268._0_32_);
    auVar84 = vfmadd231ps_fma(auVar103,auVar100,auVar257._0_32_);
    auVar103 = vmulps_avx512vl(auVar92,ZEXT1632(auVar76));
    auVar109 = ZEXT1632(auVar76);
    auVar104 = vmulps_avx512vl(auVar93,auVar109);
    auVar105 = vmulps_avx512vl(auVar94,auVar109);
    auVar106 = vmulps_avx512vl(auVar95,auVar109);
    auVar82 = vfmadd231ps_fma(auVar103,auVar100,auVar252._0_32_);
    auVar78 = vfmadd231ps_fma(auVar104,auVar100,auVar259._0_32_);
    auVar85 = vfmadd231ps_fma(auVar105,auVar100,auVar263._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar106,auVar100,auVar91);
    auVar104 = vmulps_avx512vl(auVar96,auVar109);
    auVar105 = vmulps_avx512vl(auVar97,auVar109);
    auVar106 = vmulps_avx512vl(auVar98,auVar109);
    auVar107 = vmulps_avx512vl(auVar99,auVar109);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar100,auVar92);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar100,auVar93);
    auVar108 = vfmadd231ps_avx512vl(auVar106,auVar100,auVar94);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar100,auVar95);
    auVar160._28_36_ = auVar270._28_36_;
    auVar160._0_28_ =
         ZEXT1628(CONCAT412(fVar181 * auVar82._12_4_,
                            CONCAT48(fVar179 * auVar82._8_4_,
                                     CONCAT44(fVar177 * auVar82._4_4_,fVar161 * auVar82._0_4_))));
    auVar106 = vmulps_avx512vl(auVar109,ZEXT1632(auVar78));
    auVar109 = vmulps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar85));
    auVar110 = vmulps_avx512vl(ZEXT1632(auVar76),auVar103);
    auVar76 = vfmadd231ps_fma(auVar160._0_32_,auVar100,ZEXT1632(auVar83));
    auVar111 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar81));
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar100,ZEXT1632(auVar77));
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar100,ZEXT1632(auVar84));
    auVar114._0_4_ = auVar104._0_4_ * fVar161;
    auVar114._4_4_ = auVar104._4_4_ * fVar177;
    auVar114._8_4_ = auVar104._8_4_ * fVar179;
    auVar114._12_4_ = auVar104._12_4_ * fVar181;
    auVar114._16_4_ = auVar104._16_4_ * 0.0;
    auVar114._20_4_ = auVar104._20_4_ * 0.0;
    auVar114._24_4_ = auVar104._24_4_ * 0.0;
    auVar114._28_4_ = 0;
    auVar106._4_4_ = auVar105._4_4_ * fVar177;
    auVar106._0_4_ = auVar105._0_4_ * fVar161;
    auVar106._8_4_ = auVar105._8_4_ * fVar179;
    auVar106._12_4_ = auVar105._12_4_ * fVar181;
    auVar106._16_4_ = auVar105._16_4_ * 0.0;
    auVar106._20_4_ = auVar105._20_4_ * 0.0;
    auVar106._24_4_ = auVar105._24_4_ * 0.0;
    auVar106._28_4_ = auVar104._28_4_;
    auVar112._4_4_ = auVar108._4_4_ * fVar177;
    auVar112._0_4_ = auVar108._0_4_ * fVar161;
    auVar112._8_4_ = auVar108._8_4_ * fVar179;
    auVar112._12_4_ = auVar108._12_4_ * fVar181;
    auVar112._16_4_ = auVar108._16_4_ * 0.0;
    auVar112._20_4_ = auVar108._20_4_ * 0.0;
    auVar112._24_4_ = auVar108._24_4_ * 0.0;
    auVar112._28_4_ = auVar105._28_4_;
    auVar113._4_4_ = auVar107._4_4_ * fVar177;
    auVar113._0_4_ = auVar107._0_4_ * fVar161;
    auVar113._8_4_ = auVar107._8_4_ * fVar179;
    auVar113._12_4_ = auVar107._12_4_ * fVar181;
    auVar113._16_4_ = auVar107._16_4_ * 0.0;
    auVar113._20_4_ = auVar107._20_4_ * 0.0;
    auVar113._24_4_ = auVar107._24_4_ * 0.0;
    auVar113._28_4_ = auVar108._28_4_;
    auVar83 = vfmadd231ps_fma(auVar114,auVar100,ZEXT1632(auVar82));
    auVar81 = vfmadd231ps_fma(auVar106,auVar100,ZEXT1632(auVar78));
    auVar77 = vfmadd231ps_fma(auVar112,auVar100,ZEXT1632(auVar85));
    auVar84 = vfmadd231ps_fma(auVar113,auVar100,auVar103);
    auVar82 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar181 * auVar83._12_4_,
                                                 CONCAT48(fVar179 * auVar83._8_4_,
                                                          CONCAT44(fVar177 * auVar83._4_4_,
                                                                   fVar161 * auVar83._0_4_)))),
                              auVar100,ZEXT1632(auVar76));
    auVar112 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar81._12_4_ * fVar181,
                                             CONCAT48(auVar81._8_4_ * fVar179,
                                                      CONCAT44(auVar81._4_4_ * fVar177,
                                                               auVar81._0_4_ * fVar161)))),auVar100,
                          auVar111);
    auVar113 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar77._12_4_ * fVar181,
                                             CONCAT48(auVar77._8_4_ * fVar179,
                                                      CONCAT44(auVar77._4_4_ * fVar177,
                                                               auVar77._0_4_ * fVar161)))),auVar100,
                          auVar109);
    auVar103 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar84._12_4_ * fVar181,
                                             CONCAT48(auVar84._8_4_ * fVar179,
                                                      CONCAT44(auVar84._4_4_ * fVar177,
                                                               auVar84._0_4_ * fVar161)))),auVar110,
                          auVar100);
    auVar100 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar76));
    auVar104 = vsubps_avx512vl(ZEXT1632(auVar81),auVar111);
    auVar105 = vsubps_avx512vl(ZEXT1632(auVar77),auVar109);
    auVar106 = vsubps_avx512vl(ZEXT1632(auVar84),auVar110);
    auVar129._0_4_ = fVar146 * auVar100._0_4_ * 3.0;
    auVar129._4_4_ = fVar146 * auVar100._4_4_ * 3.0;
    auVar129._8_4_ = fVar146 * auVar100._8_4_ * 3.0;
    auVar129._12_4_ = fVar146 * auVar100._12_4_ * 3.0;
    auVar129._16_4_ = fVar146 * auVar100._16_4_ * 3.0;
    auVar129._20_4_ = fVar146 * auVar100._20_4_ * 3.0;
    auVar129._24_4_ = fVar146 * auVar100._24_4_ * 3.0;
    auVar129._28_4_ = 0;
    auVar130._0_4_ = fVar146 * auVar104._0_4_ * 3.0;
    auVar130._4_4_ = fVar146 * auVar104._4_4_ * 3.0;
    auVar130._8_4_ = fVar146 * auVar104._8_4_ * 3.0;
    auVar130._12_4_ = fVar146 * auVar104._12_4_ * 3.0;
    auVar130._16_4_ = fVar146 * auVar104._16_4_ * 3.0;
    auVar130._20_4_ = fVar146 * auVar104._20_4_ * 3.0;
    auVar130._24_4_ = fVar146 * auVar104._24_4_ * 3.0;
    auVar130._28_4_ = 0;
    auVar111._4_4_ = fVar146 * auVar105._4_4_ * 3.0;
    auVar111._0_4_ = fVar146 * auVar105._0_4_ * 3.0;
    auVar111._8_4_ = fVar146 * auVar105._8_4_ * 3.0;
    auVar111._12_4_ = fVar146 * auVar105._12_4_ * 3.0;
    auVar111._16_4_ = fVar146 * auVar105._16_4_ * 3.0;
    auVar111._20_4_ = fVar146 * auVar105._20_4_ * 3.0;
    auVar111._24_4_ = fVar146 * auVar105._24_4_ * 3.0;
    auVar111._28_4_ = auVar107._28_4_;
    fVar161 = auVar106._0_4_ * 3.0 * fVar146;
    fVar177 = auVar106._4_4_ * 3.0 * fVar146;
    auVar120._4_4_ = fVar177;
    auVar120._0_4_ = fVar161;
    fVar179 = auVar106._8_4_ * 3.0 * fVar146;
    auVar120._8_4_ = fVar179;
    fVar181 = auVar106._12_4_ * 3.0 * fVar146;
    auVar120._12_4_ = fVar181;
    fVar183 = auVar106._16_4_ * 3.0 * fVar146;
    auVar120._16_4_ = fVar183;
    fVar185 = auVar106._20_4_ * 3.0 * fVar146;
    auVar120._20_4_ = fVar185;
    fVar187 = auVar106._24_4_ * 3.0 * fVar146;
    auVar120._24_4_ = fVar187;
    auVar120._28_4_ = fVar146;
    auVar76 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar76);
    auVar114 = vpermt2ps_avx512vl(ZEXT1632(auVar82),_DAT_01fb9fc0,ZEXT1632(auVar76));
    auVar115 = vpermt2ps_avx512vl(auVar112,_DAT_01fb9fc0,ZEXT1632(auVar76));
    auVar104 = ZEXT1632(auVar76);
    auVar116 = vpermt2ps_avx512vl(auVar113,_DAT_01fb9fc0,auVar104);
    auVar117._0_4_ = auVar103._0_4_ + fVar161;
    auVar117._4_4_ = auVar103._4_4_ + fVar177;
    auVar117._8_4_ = auVar103._8_4_ + fVar179;
    auVar117._12_4_ = auVar103._12_4_ + fVar181;
    auVar117._16_4_ = auVar103._16_4_ + fVar183;
    auVar117._20_4_ = auVar103._20_4_ + fVar185;
    auVar117._24_4_ = auVar103._24_4_ + fVar187;
    auVar117._28_4_ = auVar103._28_4_ + fVar146;
    auVar100 = vmaxps_avx(auVar103,auVar117);
    auVar107 = vminps_avx512vl(auVar103,auVar117);
    auVar108 = vpermt2ps_avx512vl(auVar103,_DAT_01fb9fc0,auVar104);
    auVar117 = vpermt2ps_avx512vl(auVar129,_DAT_01fb9fc0,auVar104);
    auVar118 = vpermt2ps_avx512vl(auVar130,_DAT_01fb9fc0,auVar104);
    auVar126 = ZEXT1632(auVar76);
    auVar119 = vpermt2ps_avx512vl(auVar111,_DAT_01fb9fc0,auVar126);
    auVar103 = vpermt2ps_avx512vl(auVar120,_DAT_01fb9fc0,auVar126);
    auVar103 = vsubps_avx(auVar108,auVar103);
    auVar104 = vsubps_avx(auVar114,ZEXT1632(auVar82));
    auVar105 = vsubps_avx(auVar115,auVar112);
    auVar106 = vsubps_avx(auVar116,auVar113);
    auVar109 = vmulps_avx512vl(auVar105,auVar111);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar130,auVar106);
    auVar110 = vmulps_avx512vl(auVar106,auVar129);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar111,auVar104);
    auVar120 = vmulps_avx512vl(auVar104,auVar130);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar129,auVar105);
    auVar120 = vmulps_avx512vl(auVar120,auVar120);
    auVar110 = vfmadd231ps_avx512vl(auVar120,auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar110 = vmulps_avx512vl(auVar106,auVar106);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar105,auVar105);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar104,auVar104);
    auVar120 = vrcp14ps_avx512vl(auVar110);
    auVar121 = vfnmadd213ps_avx512vl(auVar120,auVar110,auVar102);
    auVar120 = vfmadd132ps_avx512vl(auVar121,auVar120,auVar120);
    auVar109 = vmulps_avx512vl(auVar109,auVar120);
    auVar121 = vmulps_avx512vl(auVar105,auVar119);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar118,auVar106);
    auVar122 = vmulps_avx512vl(auVar106,auVar117);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar119,auVar104);
    auVar123 = vmulps_avx512vl(auVar104,auVar118);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar117,auVar105);
    auVar123 = vmulps_avx512vl(auVar123,auVar123);
    auVar122 = vfmadd231ps_avx512vl(auVar123,auVar122,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar121,auVar121);
    auVar120 = vmulps_avx512vl(auVar121,auVar120);
    auVar109 = vmaxps_avx512vl(auVar109,auVar120);
    auVar109 = vsqrtps_avx512vl(auVar109);
    auVar120 = vmaxps_avx512vl(auVar103,auVar108);
    auVar100 = vmaxps_avx512vl(auVar100,auVar120);
    auVar120 = vaddps_avx512vl(auVar109,auVar100);
    auVar100 = vminps_avx(auVar103,auVar108);
    auVar100 = vminps_avx512vl(auVar107,auVar100);
    auVar100 = vsubps_avx512vl(auVar100,auVar109);
    auVar103._8_4_ = 0x3f800002;
    auVar103._0_8_ = 0x3f8000023f800002;
    auVar103._12_4_ = 0x3f800002;
    auVar103._16_4_ = 0x3f800002;
    auVar103._20_4_ = 0x3f800002;
    auVar103._24_4_ = 0x3f800002;
    auVar103._28_4_ = 0x3f800002;
    auVar103 = vmulps_avx512vl(auVar120,auVar103);
    auVar107._8_4_ = 0x3f7ffffc;
    auVar107._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar107._12_4_ = 0x3f7ffffc;
    auVar107._16_4_ = 0x3f7ffffc;
    auVar107._20_4_ = 0x3f7ffffc;
    auVar107._24_4_ = 0x3f7ffffc;
    auVar107._28_4_ = 0x3f7ffffc;
    local_b00 = vmulps_avx512vl(auVar100,auVar107);
    auVar100 = vmulps_avx512vl(auVar103,auVar103);
    auVar103 = vrsqrt14ps_avx512vl(auVar110);
    auVar108._8_4_ = 0xbf000000;
    auVar108._0_8_ = 0xbf000000bf000000;
    auVar108._12_4_ = 0xbf000000;
    auVar108._16_4_ = 0xbf000000;
    auVar108._20_4_ = 0xbf000000;
    auVar108._24_4_ = 0xbf000000;
    auVar108._28_4_ = 0xbf000000;
    auVar107 = vmulps_avx512vl(auVar110,auVar108);
    fVar161 = auVar103._0_4_;
    fVar177 = auVar103._4_4_;
    fVar179 = auVar103._8_4_;
    fVar181 = auVar103._12_4_;
    fVar146 = auVar103._16_4_;
    fVar183 = auVar103._20_4_;
    fVar185 = auVar103._24_4_;
    auVar121._4_4_ = fVar177 * fVar177 * fVar177 * auVar107._4_4_;
    auVar121._0_4_ = fVar161 * fVar161 * fVar161 * auVar107._0_4_;
    auVar121._8_4_ = fVar179 * fVar179 * fVar179 * auVar107._8_4_;
    auVar121._12_4_ = fVar181 * fVar181 * fVar181 * auVar107._12_4_;
    auVar121._16_4_ = fVar146 * fVar146 * fVar146 * auVar107._16_4_;
    auVar121._20_4_ = fVar183 * fVar183 * fVar183 * auVar107._20_4_;
    auVar121._24_4_ = fVar185 * fVar185 * fVar185 * auVar107._24_4_;
    auVar121._28_4_ = auVar120._28_4_;
    auVar109._8_4_ = 0x3fc00000;
    auVar109._0_8_ = 0x3fc000003fc00000;
    auVar109._12_4_ = 0x3fc00000;
    auVar109._16_4_ = 0x3fc00000;
    auVar109._20_4_ = 0x3fc00000;
    auVar109._24_4_ = 0x3fc00000;
    auVar109._28_4_ = 0x3fc00000;
    auVar103 = vfmadd231ps_avx512vl(auVar121,auVar103,auVar109);
    auVar270 = ZEXT3264(auVar103);
    auVar107 = vmulps_avx512vl(auVar104,auVar103);
    auVar108 = vmulps_avx512vl(auVar105,auVar103);
    auVar109 = vmulps_avx512vl(auVar106,auVar103);
    auVar235 = ZEXT1632(auVar82);
    auVar120 = vsubps_avx512vl(auVar126,auVar235);
    auVar121 = vsubps_avx512vl(auVar126,auVar112);
    auVar122 = vsubps_avx512vl(auVar126,auVar113);
    auVar110 = vmulps_avx512vl(_local_740,auVar122);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_720,auVar121);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_700,auVar120);
    auVar123 = vmulps_avx512vl(auVar122,auVar122);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar121,auVar121);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar120,auVar120);
    auVar124 = vmulps_avx512vl(_local_740,auVar109);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar108,local_720);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar107,local_700);
    auVar109 = vmulps_avx512vl(auVar122,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar121,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar120,auVar107);
    auVar108 = vmulps_avx512vl(auVar124,auVar124);
    auVar109 = vsubps_avx512vl(auVar101,auVar108);
    auVar125 = vmulps_avx512vl(auVar124,auVar107);
    auVar110 = vsubps_avx512vl(auVar110,auVar125);
    auVar125 = vaddps_avx512vl(auVar110,auVar110);
    auVar110 = vmulps_avx512vl(auVar107,auVar107);
    auVar123 = vsubps_avx512vl(auVar123,auVar110);
    auVar100 = vsubps_avx512vl(auVar123,auVar100);
    local_760 = vmulps_avx512vl(auVar125,auVar125);
    auVar110._8_4_ = 0x40800000;
    auVar110._0_8_ = 0x4080000040800000;
    auVar110._12_4_ = 0x40800000;
    auVar110._16_4_ = 0x40800000;
    auVar110._20_4_ = 0x40800000;
    auVar110._24_4_ = 0x40800000;
    auVar110._28_4_ = 0x40800000;
    _local_780 = vmulps_avx512vl(auVar109,auVar110);
    auVar110 = vmulps_avx512vl(_local_780,auVar100);
    auVar110 = vsubps_avx512vl(local_760,auVar110);
    uVar70 = vcmpps_avx512vl(auVar110,auVar126,5);
    bVar63 = (byte)uVar70;
    fVar161 = (float)local_9a0._0_4_;
    fVar177 = (float)local_9a0._4_4_;
    fVar179 = fStack_998;
    fVar181 = fStack_994;
    fVar146 = fStack_990;
    fVar183 = fStack_98c;
    fVar185 = fStack_988;
    fVar187 = fStack_984;
    if (bVar63 == 0) {
LAB_0182eb8d:
      auVar160 = ZEXT3264(_DAT_01f7b040);
      auVar260 = ZEXT3264(local_a60);
      auVar265 = ZEXT3264(local_a80);
      auVar268 = ZEXT3264(local_aa0);
      auVar257 = ZEXT3264(local_a00);
      auVar252 = ZEXT3264(local_a20);
      auVar259 = ZEXT3264(local_a40);
      auVar263 = ZEXT3264(local_ac0);
    }
    else {
      local_900._0_32_ = auVar123;
      auVar110 = vsqrtps_avx512vl(auVar110);
      local_800 = vaddps_avx512vl(auVar109,auVar109);
      in_ZMM31 = ZEXT3264(local_800);
      local_8a0 = vrcp14ps_avx512vl(local_800);
      auVar102 = vfnmadd213ps_avx512vl(local_8a0,local_800,auVar102);
      auVar126 = vfmadd132ps_avx512vl(auVar102,local_8a0,local_8a0);
      auVar102._8_4_ = 0x80000000;
      auVar102._0_8_ = 0x8000000080000000;
      auVar102._12_4_ = 0x80000000;
      auVar102._16_4_ = 0x80000000;
      auVar102._20_4_ = 0x80000000;
      auVar102._24_4_ = 0x80000000;
      auVar102._28_4_ = 0x80000000;
      local_7a0 = vxorps_avx512vl(auVar125,auVar102);
      auVar102 = vsubps_avx512vl(local_7a0,auVar110);
      local_9c0 = vmulps_avx512vl(auVar102,auVar126);
      auVar110 = vsubps_avx512vl(auVar110,auVar125);
      local_7c0 = vmulps_avx512vl(auVar110,auVar126);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar102 = vblendmps_avx512vl(auVar110,local_9c0);
      auVar127._0_4_ =
           (uint)(bVar63 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar110._0_4_;
      bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar127._4_4_ = (uint)bVar72 * auVar102._4_4_ | (uint)!bVar72 * auVar110._4_4_;
      bVar72 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar127._8_4_ = (uint)bVar72 * auVar102._8_4_ | (uint)!bVar72 * auVar110._8_4_;
      bVar72 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar127._12_4_ = (uint)bVar72 * auVar102._12_4_ | (uint)!bVar72 * auVar110._12_4_;
      bVar72 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar127._16_4_ = (uint)bVar72 * auVar102._16_4_ | (uint)!bVar72 * auVar110._16_4_;
      bVar72 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar127._20_4_ = (uint)bVar72 * auVar102._20_4_ | (uint)!bVar72 * auVar110._20_4_;
      bVar72 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar127._24_4_ = (uint)bVar72 * auVar102._24_4_ | (uint)!bVar72 * auVar110._24_4_;
      bVar72 = SUB81(uVar70 >> 7,0);
      auVar127._28_4_ = (uint)bVar72 * auVar102._28_4_ | (uint)!bVar72 * auVar110._28_4_;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar102 = vblendmps_avx512vl(auVar110,local_7c0);
      auVar128._0_4_ =
           (uint)(bVar63 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar110._0_4_;
      bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar128._4_4_ = (uint)bVar72 * auVar102._4_4_ | (uint)!bVar72 * auVar110._4_4_;
      bVar72 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar128._8_4_ = (uint)bVar72 * auVar102._8_4_ | (uint)!bVar72 * auVar110._8_4_;
      bVar72 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar128._12_4_ = (uint)bVar72 * auVar102._12_4_ | (uint)!bVar72 * auVar110._12_4_;
      bVar72 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar128._16_4_ = (uint)bVar72 * auVar102._16_4_ | (uint)!bVar72 * auVar110._16_4_;
      bVar72 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar128._20_4_ = (uint)bVar72 * auVar102._20_4_ | (uint)!bVar72 * auVar110._20_4_;
      bVar72 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar128._24_4_ = (uint)bVar72 * auVar102._24_4_ | (uint)!bVar72 * auVar110._24_4_;
      bVar72 = SUB81(uVar70 >> 7,0);
      auVar128._28_4_ = (uint)bVar72 * auVar102._28_4_ | (uint)!bVar72 * auVar110._28_4_;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar108,auVar110);
      local_7e0 = vmaxps_avx512vl(local_560,auVar110);
      auVar126._8_4_ = 0x36000000;
      auVar126._0_8_ = 0x3600000036000000;
      auVar126._12_4_ = 0x36000000;
      auVar126._16_4_ = 0x36000000;
      auVar126._20_4_ = 0x36000000;
      auVar126._24_4_ = 0x36000000;
      auVar126._28_4_ = 0x36000000;
      local_980 = vmulps_avx512vl(local_7e0,auVar126);
      vandps_avx512vl(auVar109,auVar110);
      uVar24 = vcmpps_avx512vl(local_980,local_980,1);
      uVar70 = uVar70 & uVar24;
      bVar69 = (byte)uVar70;
      if (bVar69 != 0) {
        uVar24 = vcmpps_avx512vl(auVar100,_DAT_01f7b000,2);
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar109 = vblendmps_avx512vl(auVar100,auVar108);
        bVar67 = (byte)uVar24;
        uVar75 = (uint)(bVar67 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar67 & 1) * local_980._0_4_;
        bVar72 = (bool)((byte)(uVar24 >> 1) & 1);
        uVar138 = (uint)bVar72 * auVar109._4_4_ | (uint)!bVar72 * local_980._4_4_;
        bVar72 = (bool)((byte)(uVar24 >> 2) & 1);
        uVar139 = (uint)bVar72 * auVar109._8_4_ | (uint)!bVar72 * local_980._8_4_;
        bVar72 = (bool)((byte)(uVar24 >> 3) & 1);
        uVar140 = (uint)bVar72 * auVar109._12_4_ | (uint)!bVar72 * local_980._12_4_;
        bVar72 = (bool)((byte)(uVar24 >> 4) & 1);
        uVar141 = (uint)bVar72 * auVar109._16_4_ | (uint)!bVar72 * local_980._16_4_;
        bVar72 = (bool)((byte)(uVar24 >> 5) & 1);
        uVar142 = (uint)bVar72 * auVar109._20_4_ | (uint)!bVar72 * local_980._20_4_;
        bVar72 = (bool)((byte)(uVar24 >> 6) & 1);
        uVar143 = (uint)bVar72 * auVar109._24_4_ | (uint)!bVar72 * local_980._24_4_;
        bVar72 = SUB81(uVar24 >> 7,0);
        uVar144 = (uint)bVar72 * auVar109._28_4_ | (uint)!bVar72 * local_980._28_4_;
        auVar127._0_4_ = (bVar69 & 1) * uVar75 | !(bool)(bVar69 & 1) * auVar127._0_4_;
        bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar127._4_4_ = bVar72 * uVar138 | !bVar72 * auVar127._4_4_;
        bVar72 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar127._8_4_ = bVar72 * uVar139 | !bVar72 * auVar127._8_4_;
        bVar72 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar127._12_4_ = bVar72 * uVar140 | !bVar72 * auVar127._12_4_;
        bVar72 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar127._16_4_ = bVar72 * uVar141 | !bVar72 * auVar127._16_4_;
        bVar72 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar127._20_4_ = bVar72 * uVar142 | !bVar72 * auVar127._20_4_;
        bVar72 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar127._24_4_ = bVar72 * uVar143 | !bVar72 * auVar127._24_4_;
        bVar72 = SUB81(uVar70 >> 7,0);
        auVar127._28_4_ = bVar72 * uVar144 | !bVar72 * auVar127._28_4_;
        auVar100 = vblendmps_avx512vl(auVar108,auVar100);
        bVar72 = (bool)((byte)(uVar24 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar24 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar24 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar24 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar24 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar24 >> 6) & 1);
        bVar16 = SUB81(uVar24 >> 7,0);
        auVar128._0_4_ =
             (uint)(bVar69 & 1) *
             ((uint)(bVar67 & 1) * auVar100._0_4_ | !(bool)(bVar67 & 1) * uVar75) |
             !(bool)(bVar69 & 1) * auVar128._0_4_;
        bVar10 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar128._4_4_ =
             (uint)bVar10 * ((uint)bVar72 * auVar100._4_4_ | !bVar72 * uVar138) |
             !bVar10 * auVar128._4_4_;
        bVar72 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar128._8_4_ =
             (uint)bVar72 * ((uint)bVar11 * auVar100._8_4_ | !bVar11 * uVar139) |
             !bVar72 * auVar128._8_4_;
        bVar72 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar128._12_4_ =
             (uint)bVar72 * ((uint)bVar12 * auVar100._12_4_ | !bVar12 * uVar140) |
             !bVar72 * auVar128._12_4_;
        bVar72 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar128._16_4_ =
             (uint)bVar72 * ((uint)bVar13 * auVar100._16_4_ | !bVar13 * uVar141) |
             !bVar72 * auVar128._16_4_;
        bVar72 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar128._20_4_ =
             (uint)bVar72 * ((uint)bVar14 * auVar100._20_4_ | !bVar14 * uVar142) |
             !bVar72 * auVar128._20_4_;
        bVar72 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar128._24_4_ =
             (uint)bVar72 * ((uint)bVar15 * auVar100._24_4_ | !bVar15 * uVar143) |
             !bVar72 * auVar128._24_4_;
        bVar72 = SUB81(uVar70 >> 7,0);
        auVar128._28_4_ =
             (uint)bVar72 * ((uint)bVar16 * auVar100._28_4_ | !bVar16 * uVar144) |
             !bVar72 * auVar128._28_4_;
        bVar63 = (~bVar69 | bVar67) & bVar63;
      }
      if ((bVar63 & 0x7f) == 0) {
        auVar160 = ZEXT3264(_DAT_01f7b040);
        auVar260 = ZEXT3264(local_a60);
        auVar265 = ZEXT3264(local_a80);
        auVar268 = ZEXT3264(local_aa0);
        auVar257 = ZEXT3264(local_a00);
        auVar252 = ZEXT3264(local_a20);
        auVar259 = ZEXT3264(local_a40);
        auVar263 = ZEXT3264(local_ac0);
      }
      else {
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar102 = vxorps_avx512vl(auVar119,auVar110);
        auVar117 = vxorps_avx512vl(auVar117,auVar110);
        auVar160 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
        auVar126 = vxorps_avx512vl(auVar118,auVar110);
        auVar76 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                                 ZEXT416((uint)local_960._0_4_));
        auVar100 = vbroadcastss_avx512vl(auVar76);
        auVar100 = vminps_avx512vl(auVar100,auVar128);
        auVar119._4_4_ = fStack_57c;
        auVar119._0_4_ = local_580;
        auVar119._8_4_ = fStack_578;
        auVar119._12_4_ = fStack_574;
        auVar119._16_4_ = fStack_570;
        auVar119._20_4_ = fStack_56c;
        auVar119._24_4_ = fStack_568;
        auVar119._28_4_ = fStack_564;
        auVar108 = vmaxps_avx512vl(auVar119,auVar127);
        auVar109 = vmulps_avx512vl(auVar122,auVar111);
        auVar109 = vfmadd213ps_avx512vl(auVar121,auVar130,auVar109);
        auVar76 = vfmadd213ps_fma(auVar120,auVar129,auVar109);
        auVar109 = vmulps_avx512vl(_local_740,auVar111);
        in_ZMM31 = ZEXT3264(local_720);
        auVar109 = vfmadd231ps_avx512vl(auVar109,local_720,auVar130);
        auVar109 = vfmadd231ps_avx512vl(auVar109,local_700,auVar129);
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar109,auVar111);
        auVar120 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar23 = vcmpps_avx512vl(auVar111,auVar120,1);
        auVar121 = vxorps_avx512vl(ZEXT1632(auVar76),auVar110);
        auVar119 = vrcp14ps_avx512vl(auVar109);
        auVar122 = vxorps_avx512vl(auVar109,auVar110);
        auVar129 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar118 = vfnmadd213ps_avx512vl(auVar119,auVar109,auVar129);
        auVar76 = vfmadd132ps_fma(auVar118,auVar119,auVar119);
        fVar162 = auVar76._0_4_ * auVar121._0_4_;
        fVar178 = auVar76._4_4_ * auVar121._4_4_;
        auVar118._4_4_ = fVar178;
        auVar118._0_4_ = fVar162;
        fVar180 = auVar76._8_4_ * auVar121._8_4_;
        auVar118._8_4_ = fVar180;
        fVar182 = auVar76._12_4_ * auVar121._12_4_;
        auVar118._12_4_ = fVar182;
        fVar184 = auVar121._16_4_ * 0.0;
        auVar118._16_4_ = fVar184;
        fVar186 = auVar121._20_4_ * 0.0;
        auVar118._20_4_ = fVar186;
        fVar188 = auVar121._24_4_ * 0.0;
        auVar118._24_4_ = fVar188;
        auVar118._28_4_ = auVar121._28_4_;
        uVar26 = vcmpps_avx512vl(auVar109,auVar122,1);
        bVar69 = (byte)uVar23 | (byte)uVar26;
        auVar130 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar118 = vblendmps_avx512vl(auVar118,auVar130);
        auVar131._0_4_ =
             (uint)(bVar69 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar119._0_4_;
        bVar72 = (bool)(bVar69 >> 1 & 1);
        auVar131._4_4_ = (uint)bVar72 * auVar118._4_4_ | (uint)!bVar72 * auVar119._4_4_;
        bVar72 = (bool)(bVar69 >> 2 & 1);
        auVar131._8_4_ = (uint)bVar72 * auVar118._8_4_ | (uint)!bVar72 * auVar119._8_4_;
        bVar72 = (bool)(bVar69 >> 3 & 1);
        auVar131._12_4_ = (uint)bVar72 * auVar118._12_4_ | (uint)!bVar72 * auVar119._12_4_;
        bVar72 = (bool)(bVar69 >> 4 & 1);
        auVar131._16_4_ = (uint)bVar72 * auVar118._16_4_ | (uint)!bVar72 * auVar119._16_4_;
        bVar72 = (bool)(bVar69 >> 5 & 1);
        auVar131._20_4_ = (uint)bVar72 * auVar118._20_4_ | (uint)!bVar72 * auVar119._20_4_;
        bVar72 = (bool)(bVar69 >> 6 & 1);
        auVar131._24_4_ = (uint)bVar72 * auVar118._24_4_ | (uint)!bVar72 * auVar119._24_4_;
        auVar131._28_4_ =
             (uint)(bVar69 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar69 >> 7) * auVar119._28_4_;
        auVar118 = vmaxps_avx512vl(auVar108,auVar131);
        uVar26 = vcmpps_avx512vl(auVar109,auVar122,6);
        bVar69 = (byte)uVar23 | (byte)uVar26;
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar122._0_4_ =
             (uint)(bVar69 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar69 & 1) * (int)fVar162;
        bVar72 = (bool)(bVar69 >> 1 & 1);
        auVar122._4_4_ = (uint)bVar72 * auVar119._4_4_ | (uint)!bVar72 * (int)fVar178;
        bVar72 = (bool)(bVar69 >> 2 & 1);
        auVar122._8_4_ = (uint)bVar72 * auVar119._8_4_ | (uint)!bVar72 * (int)fVar180;
        bVar72 = (bool)(bVar69 >> 3 & 1);
        auVar122._12_4_ = (uint)bVar72 * auVar119._12_4_ | (uint)!bVar72 * (int)fVar182;
        bVar72 = (bool)(bVar69 >> 4 & 1);
        auVar122._16_4_ = (uint)bVar72 * auVar119._16_4_ | (uint)!bVar72 * (int)fVar184;
        bVar72 = (bool)(bVar69 >> 5 & 1);
        auVar122._20_4_ = (uint)bVar72 * auVar119._20_4_ | (uint)!bVar72 * (int)fVar186;
        bVar72 = (bool)(bVar69 >> 6 & 1);
        auVar122._24_4_ = (uint)bVar72 * auVar119._24_4_ | (uint)!bVar72 * (int)fVar188;
        auVar122._28_4_ =
             (uint)(bVar69 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar69 >> 7) * auVar121._28_4_;
        auVar121 = vminps_avx512vl(auVar100,auVar122);
        auVar100 = vsubps_avx(ZEXT832(0) << 0x20,auVar114);
        auVar108 = vsubps_avx(ZEXT832(0) << 0x20,auVar115);
        auVar114 = ZEXT832(0) << 0x20;
        auVar109 = vsubps_avx(auVar114,auVar116);
        auVar109 = vmulps_avx512vl(auVar109,auVar102);
        auVar108 = vfmadd231ps_avx512vl(auVar109,auVar126,auVar108);
        auVar100 = vfmadd231ps_avx512vl(auVar108,auVar117,auVar100);
        auVar108 = vmulps_avx512vl(_local_740,auVar102);
        auVar108 = vfmadd231ps_avx512vl(auVar108,local_720,auVar126);
        auVar108 = vfmadd231ps_avx512vl(auVar108,local_700,auVar117);
        vandps_avx512vl(auVar108,auVar111);
        uVar23 = vcmpps_avx512vl(auVar108,auVar120,1);
        auVar100 = vxorps_avx512vl(auVar100,auVar110);
        auVar109 = vrcp14ps_avx512vl(auVar108);
        auVar110 = vxorps_avx512vl(auVar108,auVar110);
        auVar111 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar129);
        auVar76 = vfmadd132ps_fma(auVar111,auVar109,auVar109);
        fVar162 = auVar76._0_4_ * auVar100._0_4_;
        fVar178 = auVar76._4_4_ * auVar100._4_4_;
        auVar115._4_4_ = fVar178;
        auVar115._0_4_ = fVar162;
        fVar180 = auVar76._8_4_ * auVar100._8_4_;
        auVar115._8_4_ = fVar180;
        fVar182 = auVar76._12_4_ * auVar100._12_4_;
        auVar115._12_4_ = fVar182;
        fVar184 = auVar100._16_4_ * 0.0;
        auVar115._16_4_ = fVar184;
        fVar186 = auVar100._20_4_ * 0.0;
        auVar115._20_4_ = fVar186;
        fVar188 = auVar100._24_4_ * 0.0;
        auVar115._24_4_ = fVar188;
        auVar115._28_4_ = auVar100._28_4_;
        uVar26 = vcmpps_avx512vl(auVar108,auVar110,1);
        bVar69 = (byte)uVar23 | (byte)uVar26;
        auVar111 = vblendmps_avx512vl(auVar115,auVar130);
        auVar116._0_4_ =
             (uint)(bVar69 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar109._0_4_;
        bVar72 = (bool)(bVar69 >> 1 & 1);
        auVar116._4_4_ = (uint)bVar72 * auVar111._4_4_ | (uint)!bVar72 * auVar109._4_4_;
        bVar72 = (bool)(bVar69 >> 2 & 1);
        auVar116._8_4_ = (uint)bVar72 * auVar111._8_4_ | (uint)!bVar72 * auVar109._8_4_;
        bVar72 = (bool)(bVar69 >> 3 & 1);
        auVar116._12_4_ = (uint)bVar72 * auVar111._12_4_ | (uint)!bVar72 * auVar109._12_4_;
        bVar72 = (bool)(bVar69 >> 4 & 1);
        auVar116._16_4_ = (uint)bVar72 * auVar111._16_4_ | (uint)!bVar72 * auVar109._16_4_;
        bVar72 = (bool)(bVar69 >> 5 & 1);
        auVar116._20_4_ = (uint)bVar72 * auVar111._20_4_ | (uint)!bVar72 * auVar109._20_4_;
        bVar72 = (bool)(bVar69 >> 6 & 1);
        auVar116._24_4_ = (uint)bVar72 * auVar111._24_4_ | (uint)!bVar72 * auVar109._24_4_;
        auVar116._28_4_ =
             (uint)(bVar69 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar69 >> 7) * auVar109._28_4_;
        local_6e0 = vmaxps_avx(auVar118,auVar116);
        uVar26 = vcmpps_avx512vl(auVar108,auVar110,6);
        bVar69 = (byte)uVar23 | (byte)uVar26;
        auVar132._0_4_ =
             (uint)(bVar69 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar69 & 1) * (int)fVar162;
        bVar72 = (bool)(bVar69 >> 1 & 1);
        auVar132._4_4_ = (uint)bVar72 * auVar119._4_4_ | (uint)!bVar72 * (int)fVar178;
        bVar72 = (bool)(bVar69 >> 2 & 1);
        auVar132._8_4_ = (uint)bVar72 * auVar119._8_4_ | (uint)!bVar72 * (int)fVar180;
        bVar72 = (bool)(bVar69 >> 3 & 1);
        auVar132._12_4_ = (uint)bVar72 * auVar119._12_4_ | (uint)!bVar72 * (int)fVar182;
        bVar72 = (bool)(bVar69 >> 4 & 1);
        auVar132._16_4_ = (uint)bVar72 * auVar119._16_4_ | (uint)!bVar72 * (int)fVar184;
        bVar72 = (bool)(bVar69 >> 5 & 1);
        auVar132._20_4_ = (uint)bVar72 * auVar119._20_4_ | (uint)!bVar72 * (int)fVar186;
        bVar72 = (bool)(bVar69 >> 6 & 1);
        auVar132._24_4_ = (uint)bVar72 * auVar119._24_4_ | (uint)!bVar72 * (int)fVar188;
        auVar132._28_4_ =
             (uint)(bVar69 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar69 >> 7) * auVar100._28_4_;
        local_5c0 = vminps_avx(auVar121,auVar132);
        uVar23 = vcmpps_avx512vl(local_6e0,local_5c0,2);
        bVar63 = bVar63 & 0x7f & (byte)uVar23;
        if (bVar63 == 0) goto LAB_0182eb8d;
        auVar100 = vmaxps_avx(auVar114,local_b00);
        auVar108 = vfmadd213ps_avx512vl(local_9c0,auVar124,auVar107);
        fVar162 = auVar103._0_4_;
        fVar178 = auVar103._4_4_;
        auVar42._4_4_ = fVar178 * auVar108._4_4_;
        auVar42._0_4_ = fVar162 * auVar108._0_4_;
        fVar180 = auVar103._8_4_;
        auVar42._8_4_ = fVar180 * auVar108._8_4_;
        fVar182 = auVar103._12_4_;
        auVar42._12_4_ = fVar182 * auVar108._12_4_;
        fVar184 = auVar103._16_4_;
        auVar42._16_4_ = fVar184 * auVar108._16_4_;
        fVar186 = auVar103._20_4_;
        auVar42._20_4_ = fVar186 * auVar108._20_4_;
        fVar188 = auVar103._24_4_;
        auVar42._24_4_ = fVar188 * auVar108._24_4_;
        auVar42._28_4_ = auVar108._28_4_;
        auVar108 = vfmadd213ps_avx512vl(local_7c0,auVar124,auVar107);
        auVar43._4_4_ = fVar178 * auVar108._4_4_;
        auVar43._0_4_ = fVar162 * auVar108._0_4_;
        auVar43._8_4_ = fVar180 * auVar108._8_4_;
        auVar43._12_4_ = fVar182 * auVar108._12_4_;
        auVar43._16_4_ = fVar184 * auVar108._16_4_;
        auVar43._20_4_ = fVar186 * auVar108._20_4_;
        auVar43._24_4_ = fVar188 * auVar108._24_4_;
        auVar43._28_4_ = auVar108._28_4_;
        auVar108 = vminps_avx512vl(auVar42,auVar129);
        auVar109 = ZEXT832(0) << 0x20;
        auVar108 = vmaxps_avx(auVar108,ZEXT832(0) << 0x20);
        auVar110 = vminps_avx512vl(auVar43,auVar129);
        auVar44._4_4_ = (auVar108._4_4_ + 1.0) * 0.125;
        auVar44._0_4_ = (auVar108._0_4_ + 0.0) * 0.125;
        auVar44._8_4_ = (auVar108._8_4_ + 2.0) * 0.125;
        auVar44._12_4_ = (auVar108._12_4_ + 3.0) * 0.125;
        auVar44._16_4_ = (auVar108._16_4_ + 4.0) * 0.125;
        auVar44._20_4_ = (auVar108._20_4_ + 5.0) * 0.125;
        auVar44._24_4_ = (auVar108._24_4_ + 6.0) * 0.125;
        auVar44._28_4_ = auVar108._28_4_ + 7.0;
        local_4e0 = vfmadd213ps_avx512vl(auVar44,auVar227,auVar204);
        auVar108 = vmaxps_avx(auVar110,ZEXT832(0) << 0x20);
        auVar45._4_4_ = (auVar108._4_4_ + 1.0) * 0.125;
        auVar45._0_4_ = (auVar108._0_4_ + 0.0) * 0.125;
        auVar45._8_4_ = (auVar108._8_4_ + 2.0) * 0.125;
        auVar45._12_4_ = (auVar108._12_4_ + 3.0) * 0.125;
        auVar45._16_4_ = (auVar108._16_4_ + 4.0) * 0.125;
        auVar45._20_4_ = (auVar108._20_4_ + 5.0) * 0.125;
        auVar45._24_4_ = (auVar108._24_4_ + 6.0) * 0.125;
        auVar45._28_4_ = auVar108._28_4_ + 7.0;
        local_500 = vfmadd213ps_avx512vl(auVar45,auVar227,auVar204);
        auVar46._4_4_ = auVar100._4_4_ * auVar100._4_4_;
        auVar46._0_4_ = auVar100._0_4_ * auVar100._0_4_;
        auVar46._8_4_ = auVar100._8_4_ * auVar100._8_4_;
        auVar46._12_4_ = auVar100._12_4_ * auVar100._12_4_;
        auVar46._16_4_ = auVar100._16_4_ * auVar100._16_4_;
        auVar46._20_4_ = auVar100._20_4_ * auVar100._20_4_;
        auVar46._24_4_ = auVar100._24_4_ * auVar100._24_4_;
        auVar46._28_4_ = auVar100._28_4_;
        auVar108 = vsubps_avx(auVar123,auVar46);
        auVar123._4_4_ = auVar108._4_4_ * (float)local_780._4_4_;
        auVar123._0_4_ = auVar108._0_4_ * (float)local_780._0_4_;
        auVar123._8_4_ = auVar108._8_4_ * fStack_778;
        auVar123._12_4_ = auVar108._12_4_ * fStack_774;
        auVar123._16_4_ = auVar108._16_4_ * fStack_770;
        auVar123._20_4_ = auVar108._20_4_ * fStack_76c;
        auVar123._24_4_ = auVar108._24_4_ * fStack_768;
        auVar123._28_4_ = auVar100._28_4_;
        auVar100 = vsubps_avx(local_760,auVar123);
        uVar23 = vcmpps_avx512vl(auVar100,ZEXT832(0) << 0x20,5);
        bVar69 = (byte)uVar23;
        if (bVar69 == 0) {
          bVar69 = 0;
          auVar103 = ZEXT832(0) << 0x20;
          auVar252 = ZEXT864(0) << 0x20;
          auVar100 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar110 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar261 = SUB3228(ZEXT832(0),0) << 0x20;
          auVar124._8_4_ = 0x7f800000;
          auVar124._0_8_ = 0x7f8000007f800000;
          auVar124._12_4_ = 0x7f800000;
          auVar124._16_4_ = 0x7f800000;
          auVar124._20_4_ = 0x7f800000;
          auVar124._24_4_ = 0x7f800000;
          auVar124._28_4_ = 0x7f800000;
          auVar125._8_4_ = 0xff800000;
          auVar125._0_8_ = 0xff800000ff800000;
          auVar125._12_4_ = 0xff800000;
          auVar125._16_4_ = 0xff800000;
          auVar125._20_4_ = 0xff800000;
          auVar125._24_4_ = 0xff800000;
          auVar125._28_4_ = 0xff800000;
        }
        else {
          auVar83 = vxorps_avx512vl(auVar212,auVar212);
          uVar70 = vcmpps_avx512vl(auVar100,auVar114,5);
          auVar100 = vsqrtps_avx(auVar100);
          auVar109 = vfnmadd213ps_avx512vl(local_800,local_8a0,auVar129);
          auVar76 = vfmadd132ps_fma(auVar109,local_8a0,local_8a0);
          auVar109 = vsubps_avx(local_7a0,auVar100);
          auVar47._4_4_ = auVar76._4_4_ * auVar109._4_4_;
          auVar47._0_4_ = auVar76._0_4_ * auVar109._0_4_;
          auVar47._8_4_ = auVar76._8_4_ * auVar109._8_4_;
          auVar47._12_4_ = auVar76._12_4_ * auVar109._12_4_;
          auVar47._16_4_ = auVar109._16_4_ * 0.0;
          auVar47._20_4_ = auVar109._20_4_ * 0.0;
          auVar47._24_4_ = auVar109._24_4_ * 0.0;
          auVar47._28_4_ = 0x3e000000;
          auVar100 = vsubps_avx512vl(auVar100,auVar125);
          auVar269._0_4_ = auVar76._0_4_ * auVar100._0_4_;
          auVar269._4_4_ = auVar76._4_4_ * auVar100._4_4_;
          auVar269._8_4_ = auVar76._8_4_ * auVar100._8_4_;
          auVar269._12_4_ = auVar76._12_4_ * auVar100._12_4_;
          auVar269._16_4_ = auVar100._16_4_ * 0.0;
          auVar269._20_4_ = auVar100._20_4_ * 0.0;
          auVar269._24_4_ = auVar100._24_4_ * 0.0;
          auVar269._28_4_ = 0;
          auVar100 = vfmadd213ps_avx512vl(auVar124,auVar47,auVar107);
          auVar262._0_4_ = fVar162 * auVar100._0_4_;
          auVar262._4_4_ = fVar178 * auVar100._4_4_;
          auVar262._8_4_ = fVar180 * auVar100._8_4_;
          auVar262._12_4_ = fVar182 * auVar100._12_4_;
          auVar262._16_4_ = fVar184 * auVar100._16_4_;
          auVar262._20_4_ = fVar186 * auVar100._20_4_;
          auVar262._24_4_ = fVar188 * auVar100._24_4_;
          auVar262._28_4_ = 0;
          auVar100 = vmulps_avx512vl(local_700,auVar47);
          auVar109 = vmulps_avx512vl(local_720,auVar47);
          auVar111 = vmulps_avx512vl(_local_740,auVar47);
          auVar110 = vfmadd213ps_avx512vl(auVar104,auVar262,auVar235);
          auVar100 = vsubps_avx512vl(auVar100,auVar110);
          auVar110 = vfmadd213ps_avx512vl(auVar105,auVar262,auVar112);
          auVar110 = vsubps_avx512vl(auVar109,auVar110);
          auVar76 = vfmadd213ps_fma(auVar262,auVar106,auVar113);
          auVar109 = vsubps_avx(auVar111,ZEXT1632(auVar76));
          auVar261 = auVar109._0_28_;
          auVar107 = vfmadd213ps_avx512vl(auVar124,auVar269,auVar107);
          auVar107 = vmulps_avx512vl(auVar103,auVar107);
          auVar270 = ZEXT3264(auVar107);
          auVar103 = vmulps_avx512vl(local_700,auVar269);
          auVar111 = vmulps_avx512vl(local_720,auVar269);
          auVar120 = vmulps_avx512vl(_local_740,auVar269);
          auVar76 = vfmadd213ps_fma(auVar104,auVar107,auVar235);
          auVar109 = vsubps_avx(auVar103,ZEXT1632(auVar76));
          auVar76 = vfmadd213ps_fma(auVar105,auVar107,auVar112);
          auVar103 = vsubps_avx512vl(auVar111,ZEXT1632(auVar76));
          auVar76 = vfmadd213ps_fma(auVar106,auVar107,auVar113);
          auVar104 = vsubps_avx512vl(auVar120,ZEXT1632(auVar76));
          auVar252 = ZEXT3264(auVar104);
          auVar205._8_4_ = 0x7f800000;
          auVar205._0_8_ = 0x7f8000007f800000;
          auVar205._12_4_ = 0x7f800000;
          auVar205._16_4_ = 0x7f800000;
          auVar205._20_4_ = 0x7f800000;
          auVar205._24_4_ = 0x7f800000;
          auVar205._28_4_ = 0x7f800000;
          auVar104 = vblendmps_avx512vl(auVar205,auVar47);
          bVar72 = (bool)((byte)uVar70 & 1);
          auVar124._0_4_ = (uint)bVar72 * auVar104._0_4_ | (uint)!bVar72 * auVar82._0_4_;
          bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar72 * auVar104._4_4_ | (uint)!bVar72 * auVar82._4_4_;
          bVar72 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar72 * auVar104._8_4_ | (uint)!bVar72 * auVar82._8_4_;
          bVar72 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar72 * auVar104._12_4_ | (uint)!bVar72 * auVar82._12_4_;
          iVar1 = (uint)((byte)(uVar70 >> 4) & 1) * auVar104._16_4_;
          auVar124._16_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar70 >> 5) & 1) * auVar104._20_4_;
          auVar124._20_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar70 >> 6) & 1) * auVar104._24_4_;
          auVar124._24_4_ = iVar3;
          iVar4 = (uint)(byte)(uVar70 >> 7) * auVar104._28_4_;
          auVar124._28_4_ = iVar4;
          auVar206._8_4_ = 0xff800000;
          auVar206._0_8_ = 0xff800000ff800000;
          auVar206._12_4_ = 0xff800000;
          auVar206._16_4_ = 0xff800000;
          auVar206._20_4_ = 0xff800000;
          auVar206._24_4_ = 0xff800000;
          auVar206._28_4_ = 0xff800000;
          auVar104 = vblendmps_avx512vl(auVar206,auVar269);
          bVar72 = (bool)((byte)uVar70 & 1);
          auVar125._0_4_ = (uint)bVar72 * auVar104._0_4_ | (uint)!bVar72 * -0x800000;
          bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar72 * auVar104._4_4_ | (uint)!bVar72 * -0x800000;
          bVar72 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar72 * auVar104._8_4_ | (uint)!bVar72 * -0x800000;
          bVar72 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar72 * auVar104._12_4_ | (uint)!bVar72 * -0x800000;
          bVar72 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar125._16_4_ = (uint)bVar72 * auVar104._16_4_ | (uint)!bVar72 * -0x800000;
          bVar72 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar125._20_4_ = (uint)bVar72 * auVar104._20_4_ | (uint)!bVar72 * -0x800000;
          bVar72 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar125._24_4_ = (uint)bVar72 * auVar104._24_4_ | (uint)!bVar72 * -0x800000;
          bVar72 = SUB81(uVar70 >> 7,0);
          auVar125._28_4_ = (uint)bVar72 * auVar104._28_4_ | (uint)!bVar72 * -0x800000;
          auVar235._8_4_ = 0x36000000;
          auVar235._0_8_ = 0x3600000036000000;
          auVar235._12_4_ = 0x36000000;
          auVar235._16_4_ = 0x36000000;
          auVar235._20_4_ = 0x36000000;
          auVar235._24_4_ = 0x36000000;
          auVar235._28_4_ = 0x36000000;
          auVar104 = vmulps_avx512vl(local_7e0,auVar235);
          uVar24 = vcmpps_avx512vl(auVar104,local_980,0xe);
          uVar70 = uVar70 & uVar24;
          bVar67 = (byte)uVar70;
          if (bVar67 != 0) {
            uVar24 = vcmpps_avx512vl(auVar108,ZEXT1632(auVar83),2);
            auVar258._8_4_ = 0x7f800000;
            auVar258._0_8_ = 0x7f8000007f800000;
            auVar258._12_4_ = 0x7f800000;
            auVar258._16_4_ = 0x7f800000;
            auVar258._20_4_ = 0x7f800000;
            auVar258._24_4_ = 0x7f800000;
            auVar258._28_4_ = 0x7f800000;
            auVar264._8_4_ = 0xff800000;
            auVar264._0_8_ = 0xff800000ff800000;
            auVar264._12_4_ = 0xff800000;
            auVar264._16_4_ = 0xff800000;
            auVar264._20_4_ = 0xff800000;
            auVar264._24_4_ = 0xff800000;
            auVar264._28_4_ = 0xff800000;
            auVar105 = vblendmps_avx512vl(auVar258,auVar264);
            bVar64 = (byte)uVar24;
            uVar75 = (uint)(bVar64 & 1) * auVar105._0_4_ |
                     (uint)!(bool)(bVar64 & 1) * auVar104._0_4_;
            bVar72 = (bool)((byte)(uVar24 >> 1) & 1);
            uVar138 = (uint)bVar72 * auVar105._4_4_ | (uint)!bVar72 * auVar104._4_4_;
            bVar72 = (bool)((byte)(uVar24 >> 2) & 1);
            uVar139 = (uint)bVar72 * auVar105._8_4_ | (uint)!bVar72 * auVar104._8_4_;
            bVar72 = (bool)((byte)(uVar24 >> 3) & 1);
            uVar140 = (uint)bVar72 * auVar105._12_4_ | (uint)!bVar72 * auVar104._12_4_;
            bVar72 = (bool)((byte)(uVar24 >> 4) & 1);
            uVar141 = (uint)bVar72 * auVar105._16_4_ | (uint)!bVar72 * auVar104._16_4_;
            bVar72 = (bool)((byte)(uVar24 >> 5) & 1);
            uVar142 = (uint)bVar72 * auVar105._20_4_ | (uint)!bVar72 * auVar104._20_4_;
            bVar72 = (bool)((byte)(uVar24 >> 6) & 1);
            uVar143 = (uint)bVar72 * auVar105._24_4_ | (uint)!bVar72 * auVar104._24_4_;
            bVar72 = SUB81(uVar24 >> 7,0);
            uVar144 = (uint)bVar72 * auVar105._28_4_ | (uint)!bVar72 * auVar104._28_4_;
            auVar124._0_4_ = (bVar67 & 1) * uVar75 | !(bool)(bVar67 & 1) * auVar124._0_4_;
            bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar124._4_4_ = bVar72 * uVar138 | !bVar72 * auVar124._4_4_;
            bVar72 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar124._8_4_ = bVar72 * uVar139 | !bVar72 * auVar124._8_4_;
            bVar72 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar124._12_4_ = bVar72 * uVar140 | !bVar72 * auVar124._12_4_;
            bVar72 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar124._16_4_ = bVar72 * uVar141 | (uint)!bVar72 * iVar1;
            bVar72 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar124._20_4_ = bVar72 * uVar142 | (uint)!bVar72 * iVar2;
            bVar72 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar124._24_4_ = bVar72 * uVar143 | (uint)!bVar72 * iVar3;
            bVar72 = SUB81(uVar70 >> 7,0);
            auVar124._28_4_ = bVar72 * uVar144 | (uint)!bVar72 * iVar4;
            auVar104 = vblendmps_avx512vl(auVar264,auVar258);
            bVar72 = (bool)((byte)(uVar24 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar24 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar24 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar24 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar24 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar24 >> 6) & 1);
            bVar16 = SUB81(uVar24 >> 7,0);
            auVar125._0_4_ =
                 (uint)(bVar67 & 1) *
                 ((uint)(bVar64 & 1) * auVar104._0_4_ | !(bool)(bVar64 & 1) * uVar75) |
                 !(bool)(bVar67 & 1) * auVar125._0_4_;
            bVar10 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar125._4_4_ =
                 (uint)bVar10 * ((uint)bVar72 * auVar104._4_4_ | !bVar72 * uVar138) |
                 !bVar10 * auVar125._4_4_;
            bVar72 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar125._8_4_ =
                 (uint)bVar72 * ((uint)bVar11 * auVar104._8_4_ | !bVar11 * uVar139) |
                 !bVar72 * auVar125._8_4_;
            bVar72 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar125._12_4_ =
                 (uint)bVar72 * ((uint)bVar12 * auVar104._12_4_ | !bVar12 * uVar140) |
                 !bVar72 * auVar125._12_4_;
            bVar72 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar125._16_4_ =
                 (uint)bVar72 * ((uint)bVar13 * auVar104._16_4_ | !bVar13 * uVar141) |
                 !bVar72 * auVar125._16_4_;
            bVar72 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar125._20_4_ =
                 (uint)bVar72 * ((uint)bVar14 * auVar104._20_4_ | !bVar14 * uVar142) |
                 !bVar72 * auVar125._20_4_;
            bVar72 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar125._24_4_ =
                 (uint)bVar72 * ((uint)bVar15 * auVar104._24_4_ | !bVar15 * uVar143) |
                 !bVar72 * auVar125._24_4_;
            bVar72 = SUB81(uVar70 >> 7,0);
            auVar125._28_4_ =
                 (uint)bVar72 * ((uint)bVar16 * auVar104._28_4_ | !bVar16 * uVar144) |
                 !bVar72 * auVar125._28_4_;
            bVar69 = (~bVar67 | bVar64) & bVar69;
          }
        }
        auVar257._0_4_ = (float)local_740._0_4_ * auVar252._0_4_;
        auVar257._4_4_ = (float)local_740._4_4_ * auVar252._4_4_;
        auVar257._8_4_ = fStack_738 * auVar252._8_4_;
        auVar257._12_4_ = fStack_734 * auVar252._12_4_;
        auVar257._16_4_ = fStack_730 * auVar252._16_4_;
        auVar257._20_4_ = fStack_72c * auVar252._20_4_;
        auVar257._28_36_ = auVar252._28_36_;
        auVar257._24_4_ = fStack_728 * auVar252._24_4_;
        auVar76 = vfmadd231ps_fma(auVar257._0_32_,local_720,auVar103);
        auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_700,auVar109);
        _local_540 = local_6e0;
        local_520 = vminps_avx(local_5c0,auVar124);
        auVar256._8_4_ = 0x7fffffff;
        auVar256._0_8_ = 0x7fffffff7fffffff;
        auVar256._12_4_ = 0x7fffffff;
        auVar256._16_4_ = 0x7fffffff;
        auVar256._20_4_ = 0x7fffffff;
        auVar256._24_4_ = 0x7fffffff;
        auVar256._28_4_ = 0x7fffffff;
        auVar103 = vandps_avx(ZEXT1632(auVar76),auVar256);
        _local_660 = vmaxps_avx(local_6e0,auVar125);
        auVar251._8_4_ = 0x3e99999a;
        auVar251._0_8_ = 0x3e99999a3e99999a;
        auVar251._12_4_ = 0x3e99999a;
        auVar251._16_4_ = 0x3e99999a;
        auVar251._20_4_ = 0x3e99999a;
        auVar251._24_4_ = 0x3e99999a;
        auVar251._28_4_ = 0x3e99999a;
        uVar23 = vcmpps_avx512vl(auVar103,auVar251,1);
        uVar26 = vcmpps_avx512vl(local_6e0,local_520,2);
        bVar67 = (byte)uVar26 & bVar63;
        uVar25 = vcmpps_avx512vl(_local_660,local_5c0,2);
        if ((bVar63 & ((byte)uVar25 | (byte)uVar26)) == 0) {
          auVar160 = ZEXT3264(_DAT_01f7b040);
          auVar260 = ZEXT3264(local_a60);
          auVar265 = ZEXT3264(local_a80);
          auVar268 = ZEXT3264(local_aa0);
          auVar257 = ZEXT3264(local_a00);
          auVar252 = ZEXT3264(local_a20);
          auVar259 = ZEXT3264(local_a40);
          auVar263 = ZEXT3264(local_ac0);
        }
        else {
          bVar64 = (byte)uVar23 | ~bVar69;
          auVar48._4_4_ = (float)local_740._4_4_ * auVar261._4_4_;
          auVar48._0_4_ = (float)local_740._0_4_ * auVar261._0_4_;
          auVar48._8_4_ = fStack_738 * auVar261._8_4_;
          auVar48._12_4_ = fStack_734 * auVar261._12_4_;
          auVar48._16_4_ = fStack_730 * auVar261._16_4_;
          auVar48._20_4_ = fStack_72c * auVar261._20_4_;
          auVar48._24_4_ = fStack_728 * auVar261._24_4_;
          auVar48._28_4_ = local_660._28_4_;
          auVar76 = vfmadd213ps_fma(auVar110,local_720,auVar48);
          auVar76 = vfmadd213ps_fma(auVar100,local_700,ZEXT1632(auVar76));
          auVar100 = vandps_avx(ZEXT1632(auVar76),auVar256);
          uVar23 = vcmpps_avx512vl(auVar100,auVar251,1);
          bVar69 = (byte)uVar23 | ~bVar69;
          auVar154._8_4_ = 2;
          auVar154._0_8_ = 0x200000002;
          auVar154._12_4_ = 2;
          auVar154._16_4_ = 2;
          auVar154._20_4_ = 2;
          auVar154._24_4_ = 2;
          auVar154._28_4_ = 2;
          auVar39._8_4_ = 3;
          auVar39._0_8_ = 0x300000003;
          auVar39._12_4_ = 3;
          auVar39._16_4_ = 3;
          auVar39._20_4_ = 3;
          auVar39._24_4_ = 3;
          auVar39._28_4_ = 3;
          auVar100 = vpblendmd_avx512vl(auVar154,auVar39);
          local_5a0._0_4_ = (uint)(bVar69 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar69 & 1) * 2;
          bVar72 = (bool)(bVar69 >> 1 & 1);
          local_5a0._4_4_ = (uint)bVar72 * auVar100._4_4_ | (uint)!bVar72 * 2;
          bVar72 = (bool)(bVar69 >> 2 & 1);
          local_5a0._8_4_ = (uint)bVar72 * auVar100._8_4_ | (uint)!bVar72 * 2;
          bVar72 = (bool)(bVar69 >> 3 & 1);
          local_5a0._12_4_ = (uint)bVar72 * auVar100._12_4_ | (uint)!bVar72 * 2;
          bVar72 = (bool)(bVar69 >> 4 & 1);
          local_5a0._16_4_ = (uint)bVar72 * auVar100._16_4_ | (uint)!bVar72 * 2;
          bVar72 = (bool)(bVar69 >> 5 & 1);
          local_5a0._20_4_ = (uint)bVar72 * auVar100._20_4_ | (uint)!bVar72 * 2;
          bVar72 = (bool)(bVar69 >> 6 & 1);
          local_5a0._24_4_ = (uint)bVar72 * auVar100._24_4_ | (uint)!bVar72 * 2;
          local_5a0._28_4_ = (uint)(bVar69 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar69 >> 7) * 2;
          local_600 = vpbroadcastd_avx512vl();
          uVar23 = vpcmpd_avx512vl(local_600,local_5a0,5);
          local_640 = local_6e0._0_4_ + (float)local_9a0._0_4_;
          fStack_63c = local_6e0._4_4_ + (float)local_9a0._4_4_;
          fStack_638 = local_6e0._8_4_ + fStack_998;
          fStack_634 = local_6e0._12_4_ + fStack_994;
          fStack_630 = local_6e0._16_4_ + fStack_990;
          fStack_62c = local_6e0._20_4_ + fStack_98c;
          fStack_628 = local_6e0._24_4_ + fStack_988;
          fStack_624 = local_6e0._28_4_ + fStack_984;
          _local_5e0 = _local_660;
          for (bVar69 = (byte)uVar23 & bVar67; bVar69 != 0;
              bVar69 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar69 & (byte)uVar23) {
            auVar155._8_4_ = 0x7f800000;
            auVar155._0_8_ = 0x7f8000007f800000;
            auVar155._12_4_ = 0x7f800000;
            auVar155._16_4_ = 0x7f800000;
            auVar155._20_4_ = 0x7f800000;
            auVar155._24_4_ = 0x7f800000;
            auVar155._28_4_ = 0x7f800000;
            auVar100 = vblendmps_avx512vl(auVar155,local_6e0);
            auVar133._0_4_ =
                 (uint)(bVar69 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar69 & 1) * 0x7f800000;
            bVar72 = (bool)(bVar69 >> 1 & 1);
            auVar133._4_4_ = (uint)bVar72 * auVar100._4_4_ | (uint)!bVar72 * 0x7f800000;
            bVar72 = (bool)(bVar69 >> 2 & 1);
            auVar133._8_4_ = (uint)bVar72 * auVar100._8_4_ | (uint)!bVar72 * 0x7f800000;
            bVar72 = (bool)(bVar69 >> 3 & 1);
            auVar133._12_4_ = (uint)bVar72 * auVar100._12_4_ | (uint)!bVar72 * 0x7f800000;
            bVar72 = (bool)(bVar69 >> 4 & 1);
            auVar133._16_4_ = (uint)bVar72 * auVar100._16_4_ | (uint)!bVar72 * 0x7f800000;
            bVar72 = (bool)(bVar69 >> 5 & 1);
            auVar133._20_4_ = (uint)bVar72 * auVar100._20_4_ | (uint)!bVar72 * 0x7f800000;
            auVar133._24_4_ =
                 (uint)(bVar69 >> 6) * auVar100._24_4_ | (uint)!(bool)(bVar69 >> 6) * 0x7f800000;
            auVar133._28_4_ = 0x7f800000;
            auVar100 = vshufps_avx(auVar133,auVar133,0xb1);
            auVar100 = vminps_avx(auVar133,auVar100);
            auVar103 = vshufpd_avx(auVar100,auVar100,5);
            auVar100 = vminps_avx(auVar100,auVar103);
            auVar103 = vpermpd_avx2(auVar100,0x4e);
            auVar100 = vminps_avx(auVar100,auVar103);
            uVar23 = vcmpps_avx512vl(auVar133,auVar100,0);
            bVar65 = (byte)uVar23 & bVar69;
            bVar66 = bVar69;
            if (bVar65 != 0) {
              bVar66 = bVar65;
            }
            iVar2 = 0;
            for (uVar75 = (uint)bVar66; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar75 = *(uint *)(local_4e0 + (uint)(iVar2 << 2));
            fVar161 = auVar79._0_4_;
            auVar76 = ZEXT416(*(uint *)(local_540 + (uint)(iVar2 << 2)));
            if ((float)local_9e0._0_4_ < 0.0) {
              local_b00._0_16_ = ZEXT416(*(uint *)(local_540 + (uint)(iVar2 << 2)));
              auVar270 = ZEXT1664(auVar270._0_16_);
              fVar161 = sqrtf((float)local_9e0._0_4_);
              auVar76 = local_b00._0_16_;
            }
            auVar81 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar83 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar77 = vminps_avx(local_840._0_16_,local_880._0_16_);
            auVar84 = vminps_avx(auVar81,auVar77);
            auVar81 = vmaxps_avx(local_840._0_16_,local_880._0_16_);
            auVar77 = vmaxps_avx(auVar83,auVar81);
            auVar213._8_4_ = 0x7fffffff;
            auVar213._0_8_ = 0x7fffffff7fffffff;
            auVar213._12_4_ = 0x7fffffff;
            auVar83 = vandps_avx(auVar84,auVar213);
            auVar81 = vandps_avx(auVar77,auVar213);
            auVar83 = vmaxps_avx(auVar83,auVar81);
            auVar81 = vmovshdup_avx(auVar83);
            auVar81 = vmaxss_avx(auVar81,auVar83);
            auVar83 = vshufpd_avx(auVar83,auVar83,1);
            auVar83 = vmaxss_avx(auVar83,auVar81);
            local_800._0_4_ = auVar83._0_4_ * 1.9073486e-06;
            local_950 = vshufps_avx(auVar77,auVar77,0xff);
            auVar76 = vinsertps_avx(auVar76,ZEXT416(uVar75),0x10);
            auVar160 = ZEXT1664(auVar76);
            lVar71 = 5;
            do {
              do {
                bVar72 = lVar71 == 0;
                lVar71 = lVar71 + -1;
                if (bVar72) goto LAB_0182f6f6;
                uVar163 = auVar160._0_4_;
                auVar148._4_4_ = uVar163;
                auVar148._0_4_ = uVar163;
                auVar148._8_4_ = uVar163;
                auVar148._12_4_ = uVar163;
                auVar83 = vfmadd132ps_fma(auVar148,ZEXT816(0) << 0x40,local_9d0);
                auVar81 = auVar160._0_16_;
                auVar76 = vmovshdup_avx(auVar81);
                local_8a0._0_16_ = auVar76;
                fVar183 = 1.0 - auVar76._0_4_;
                auVar76 = vshufps_avx(auVar81,auVar81,0x55);
                fVar177 = auVar76._0_4_;
                auVar190._0_4_ = local_860._0_4_ * fVar177;
                fVar179 = auVar76._4_4_;
                auVar190._4_4_ = local_860._4_4_ * fVar179;
                fVar181 = auVar76._8_4_;
                auVar190._8_4_ = local_860._8_4_ * fVar181;
                fVar146 = auVar76._12_4_;
                auVar190._12_4_ = local_860._12_4_ * fVar146;
                _local_780 = ZEXT416((uint)fVar183);
                auVar214._4_4_ = fVar183;
                auVar214._0_4_ = fVar183;
                auVar214._8_4_ = fVar183;
                auVar214._12_4_ = fVar183;
                auVar76 = vfmadd231ps_fma(auVar190,auVar214,local_820._0_16_);
                auVar231._0_4_ = local_840._0_4_ * fVar177;
                auVar231._4_4_ = local_840._4_4_ * fVar179;
                auVar231._8_4_ = local_840._8_4_ * fVar181;
                auVar231._12_4_ = local_840._12_4_ * fVar146;
                auVar81 = vfmadd231ps_fma(auVar231,auVar214,local_860._0_16_);
                auVar238._0_4_ = fVar177 * (float)local_880._0_4_;
                auVar238._4_4_ = fVar179 * (float)local_880._4_4_;
                auVar238._8_4_ = fVar181 * fStack_878;
                auVar238._12_4_ = fVar146 * fStack_874;
                auVar77 = vfmadd231ps_fma(auVar238,auVar214,local_840._0_16_);
                auVar249._0_4_ = fVar177 * auVar81._0_4_;
                auVar249._4_4_ = fVar179 * auVar81._4_4_;
                auVar249._8_4_ = fVar181 * auVar81._8_4_;
                auVar249._12_4_ = fVar146 * auVar81._12_4_;
                auVar76 = vfmadd231ps_fma(auVar249,auVar214,auVar76);
                auVar191._0_4_ = fVar177 * auVar77._0_4_;
                auVar191._4_4_ = fVar179 * auVar77._4_4_;
                auVar191._8_4_ = fVar181 * auVar77._8_4_;
                auVar191._12_4_ = fVar146 * auVar77._12_4_;
                auVar81 = vfmadd231ps_fma(auVar191,auVar214,auVar81);
                auVar232._0_4_ = fVar177 * auVar81._0_4_;
                auVar232._4_4_ = fVar179 * auVar81._4_4_;
                auVar232._8_4_ = fVar181 * auVar81._8_4_;
                auVar232._12_4_ = fVar146 * auVar81._12_4_;
                auVar77 = vfmadd231ps_fma(auVar232,auVar76,auVar214);
                auVar76 = vsubps_avx(auVar81,auVar76);
                auVar28._8_4_ = 0x40400000;
                auVar28._0_8_ = 0x4040000040400000;
                auVar28._12_4_ = 0x40400000;
                auVar81 = vmulps_avx512vl(auVar76,auVar28);
                local_760._0_16_ = auVar77;
                auVar83 = vsubps_avx(auVar83,auVar77);
                auVar76 = vdpps_avx(auVar83,auVar83,0x7f);
                local_b00._0_16_ = auVar76;
                local_900 = auVar160;
                if (auVar76._0_4_ < 0.0) {
                  auVar259._0_4_ = sqrtf(auVar76._0_4_);
                  auVar259._4_60_ = extraout_var;
                  auVar76 = auVar259._0_16_;
                }
                else {
                  auVar76 = vsqrtss_avx(auVar76,auVar76);
                }
                local_7a0._0_16_ = vdpps_avx(auVar81,auVar81,0x7f);
                fVar177 = local_7a0._0_4_;
                auVar192._4_12_ = ZEXT812(0) << 0x20;
                auVar192._0_4_ = fVar177;
                local_980._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar192);
                fVar179 = local_980._0_4_;
                local_7c0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar192);
                auVar29._8_4_ = 0x80000000;
                auVar29._0_8_ = 0x8000000080000000;
                auVar29._12_4_ = 0x80000000;
                auVar84 = vxorps_avx512vl(local_7a0._0_16_,auVar29);
                auVar77 = vfnmadd213ss_fma(local_7c0._0_16_,local_7a0._0_16_,ZEXT416(0x40000000));
                local_7e0._0_4_ = auVar77._0_4_;
                local_9c0._0_4_ = auVar76._0_4_;
                if (fVar177 < auVar84._0_4_) {
                  fVar181 = sqrtf(fVar177);
                  auVar76 = ZEXT416((uint)local_9c0._0_4_);
                }
                else {
                  auVar77 = vsqrtss_avx(local_7a0._0_16_,local_7a0._0_16_);
                  fVar181 = auVar77._0_4_;
                }
                fVar146 = local_980._0_4_;
                fVar177 = fVar179 * 1.5 + fVar177 * -0.5 * fVar146 * fVar146 * fVar146;
                local_980._0_4_ = auVar81._0_4_ * fVar177;
                local_980._4_4_ = auVar81._4_4_ * fVar177;
                local_980._8_4_ = auVar81._8_4_ * fVar177;
                local_980._12_4_ = auVar81._12_4_ * fVar177;
                auVar77 = vdpps_avx(auVar83,local_980._0_16_,0x7f);
                fVar183 = auVar76._0_4_;
                fVar179 = auVar77._0_4_;
                auVar149._0_4_ = fVar179 * fVar179;
                auVar149._4_4_ = auVar77._4_4_ * auVar77._4_4_;
                auVar149._8_4_ = auVar77._8_4_ * auVar77._8_4_;
                auVar149._12_4_ = auVar77._12_4_ * auVar77._12_4_;
                auVar84 = vsubps_avx(local_b00._0_16_,auVar149);
                fVar146 = auVar84._0_4_;
                auVar166._4_12_ = ZEXT812(0) << 0x20;
                auVar166._0_4_ = fVar146;
                auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar166);
                auVar78 = vmulss_avx512f(auVar82,ZEXT416(0x3fc00000));
                auVar85 = vmulss_avx512f(auVar84,ZEXT416(0xbf000000));
                if (fVar146 < 0.0) {
                  local_910._0_4_ = fVar181;
                  local_930._0_4_ = auVar78._0_4_;
                  local_940._4_4_ = fVar177;
                  local_940._0_4_ = fVar177;
                  fStack_938 = fVar177;
                  fStack_934 = fVar177;
                  local_920 = auVar82;
                  fVar146 = sqrtf(fVar146);
                  auVar85 = ZEXT416(auVar85._0_4_);
                  auVar78 = ZEXT416((uint)local_930._0_4_);
                  auVar76 = ZEXT416((uint)local_9c0._0_4_);
                  auVar82 = local_920;
                  fVar177 = (float)local_940._0_4_;
                  fVar185 = (float)local_940._4_4_;
                  fVar187 = fStack_938;
                  fVar162 = fStack_934;
                  fVar181 = (float)local_910._0_4_;
                }
                else {
                  auVar84 = vsqrtss_avx(auVar84,auVar84);
                  fVar146 = auVar84._0_4_;
                  fVar185 = fVar177;
                  fVar187 = fVar177;
                  fVar162 = fVar177;
                }
                auVar270 = ZEXT1664(auVar77);
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_780,local_8a0._0_16_
                                         );
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_8a0._0_16_,_local_780
                                         );
                fVar178 = auVar84._0_4_ * 6.0;
                fVar180 = local_8a0._0_4_ * 6.0;
                auVar215._0_4_ = fVar180 * (float)local_880._0_4_;
                auVar215._4_4_ = fVar180 * (float)local_880._4_4_;
                auVar215._8_4_ = fVar180 * fStack_878;
                auVar215._12_4_ = fVar180 * fStack_874;
                auVar193._4_4_ = fVar178;
                auVar193._0_4_ = fVar178;
                auVar193._8_4_ = fVar178;
                auVar193._12_4_ = fVar178;
                auVar84 = vfmadd132ps_fma(auVar193,auVar215,local_840._0_16_);
                fVar178 = auVar87._0_4_ * 6.0;
                auVar167._4_4_ = fVar178;
                auVar167._0_4_ = fVar178;
                auVar167._8_4_ = fVar178;
                auVar167._12_4_ = fVar178;
                auVar84 = vfmadd132ps_fma(auVar167,auVar84,local_860._0_16_);
                fVar178 = local_780._0_4_ * 6.0;
                auVar194._4_4_ = fVar178;
                auVar194._0_4_ = fVar178;
                auVar194._8_4_ = fVar178;
                auVar194._12_4_ = fVar178;
                auVar84 = vfmadd132ps_fma(auVar194,auVar84,local_820._0_16_);
                auVar168._0_4_ = auVar84._0_4_ * (float)local_7a0._0_4_;
                auVar168._4_4_ = auVar84._4_4_ * (float)local_7a0._0_4_;
                auVar168._8_4_ = auVar84._8_4_ * (float)local_7a0._0_4_;
                auVar168._12_4_ = auVar84._12_4_ * (float)local_7a0._0_4_;
                auVar84 = vdpps_avx(auVar81,auVar84,0x7f);
                fVar178 = auVar84._0_4_;
                auVar195._0_4_ = auVar81._0_4_ * fVar178;
                auVar195._4_4_ = auVar81._4_4_ * fVar178;
                auVar195._8_4_ = auVar81._8_4_ * fVar178;
                auVar195._12_4_ = auVar81._12_4_ * fVar178;
                auVar84 = vsubps_avx(auVar168,auVar195);
                fVar178 = (float)local_7e0._0_4_ * (float)local_7c0._0_4_;
                auVar87 = vmaxss_avx(ZEXT416((uint)local_800._0_4_),
                                     ZEXT416((uint)(local_900._0_4_ * fVar161 * 1.9073486e-06)));
                auVar30._8_4_ = 0x80000000;
                auVar30._0_8_ = 0x8000000080000000;
                auVar30._12_4_ = 0x80000000;
                auVar86 = vxorps_avx512vl(auVar81,auVar30);
                auVar196._0_4_ = fVar177 * auVar84._0_4_ * fVar178;
                auVar196._4_4_ = fVar185 * auVar84._4_4_ * fVar178;
                auVar196._8_4_ = fVar187 * auVar84._8_4_ * fVar178;
                auVar196._12_4_ = fVar162 * auVar84._12_4_ * fVar178;
                auVar84 = vdpps_avx(auVar86,local_980._0_16_,0x7f);
                auVar88 = vfmadd213ss_fma(auVar76,ZEXT416((uint)local_800._0_4_),auVar87);
                auVar76 = vdpps_avx(auVar83,auVar196,0x7f);
                auVar88 = vfmadd213ss_fma(ZEXT416((uint)(fVar183 + 1.0)),
                                          ZEXT416((uint)((float)local_800._0_4_ / fVar181)),auVar88)
                ;
                fVar177 = auVar84._0_4_ + auVar76._0_4_;
                auVar76 = vdpps_avx(local_9d0,local_980._0_16_,0x7f);
                auVar84 = vdpps_avx(auVar83,auVar86,0x7f);
                auVar85 = vmulss_avx512f(auVar85,auVar82);
                auVar82 = vmulss_avx512f(auVar82,auVar82);
                auVar86 = vaddss_avx512f(auVar78,ZEXT416((uint)(auVar85._0_4_ * auVar82._0_4_)));
                auVar82 = vdpps_avx(auVar83,local_9d0,0x7f);
                auVar85 = vfnmadd231ss_fma(auVar84,auVar77,ZEXT416((uint)fVar177));
                auVar82 = vfnmadd231ss_fma(auVar82,auVar77,auVar76);
                auVar84 = vpermilps_avx(local_760._0_16_,0xff);
                fVar146 = fVar146 - auVar84._0_4_;
                auVar78 = vshufps_avx(auVar81,auVar81,0xff);
                auVar84 = vfmsub213ss_fma(auVar85,auVar86,auVar78);
                auVar254._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
                auVar254._8_4_ = auVar84._8_4_ ^ 0x80000000;
                auVar254._12_4_ = auVar84._12_4_ ^ 0x80000000;
                auVar82 = ZEXT416((uint)(auVar82._0_4_ * auVar86._0_4_));
                auVar85 = vfmsub231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar84._0_4_)),
                                          ZEXT416((uint)fVar177),auVar82);
                auVar84 = vinsertps_avx(auVar254,auVar82,0x1c);
                auVar239._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                auVar239._8_4_ = auVar76._8_4_ ^ 0x80000000;
                auVar239._12_4_ = auVar76._12_4_ ^ 0x80000000;
                auVar82 = vinsertps_avx(ZEXT416((uint)fVar177),auVar239,0x10);
                auVar216._0_4_ = auVar85._0_4_;
                auVar216._4_4_ = auVar216._0_4_;
                auVar216._8_4_ = auVar216._0_4_;
                auVar216._12_4_ = auVar216._0_4_;
                auVar76 = vdivps_avx(auVar84,auVar216);
                auVar84 = vdivps_avx(auVar82,auVar216);
                auVar217._0_4_ = fVar179 * auVar76._0_4_ + fVar146 * auVar84._0_4_;
                auVar217._4_4_ = fVar179 * auVar76._4_4_ + fVar146 * auVar84._4_4_;
                auVar217._8_4_ = fVar179 * auVar76._8_4_ + fVar146 * auVar84._8_4_;
                auVar217._12_4_ = fVar179 * auVar76._12_4_ + fVar146 * auVar84._12_4_;
                auVar76 = vsubps_avx(local_900._0_16_,auVar217);
                auVar160 = ZEXT1664(auVar76);
                auVar31._8_4_ = 0x7fffffff;
                auVar31._0_8_ = 0x7fffffff7fffffff;
                auVar31._12_4_ = 0x7fffffff;
                auVar84 = vandps_avx512vl(auVar77,auVar31);
              } while (auVar88._0_4_ <= auVar84._0_4_);
              auVar84 = vfmadd231ss_fma(ZEXT416((uint)(auVar88._0_4_ + auVar87._0_4_)),local_950,
                                        ZEXT416(0x36000000));
              auVar32._8_4_ = 0x7fffffff;
              auVar32._0_8_ = 0x7fffffff7fffffff;
              auVar32._12_4_ = 0x7fffffff;
              auVar82 = vandps_avx512vl(ZEXT416((uint)fVar146),auVar32);
            } while (auVar84._0_4_ <= auVar82._0_4_);
            fVar161 = auVar76._0_4_ + (float)local_960._0_4_;
            if ((fVar145 <= fVar161) &&
               (fVar177 = *(float *)(ray + k * 4 + 0x200), fVar161 <= fVar177)) {
              auVar76 = vmovshdup_avx(auVar76);
              fVar179 = auVar76._0_4_;
              if ((0.0 <= fVar179) && (fVar179 <= 1.0)) {
                auVar76 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_b00._0_4_));
                fVar181 = auVar76._0_4_;
                pGVar7 = (context->scene->geometries).items[uVar5].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  fVar181 = fVar181 * 1.5 + local_b00._0_4_ * -0.5 * fVar181 * fVar181 * fVar181;
                  auVar218._0_4_ = auVar83._0_4_ * fVar181;
                  auVar218._4_4_ = auVar83._4_4_ * fVar181;
                  auVar218._8_4_ = auVar83._8_4_ * fVar181;
                  auVar218._12_4_ = auVar83._12_4_ * fVar181;
                  auVar84 = vfmadd213ps_fma(auVar78,auVar218,auVar81);
                  auVar76 = vshufps_avx(auVar218,auVar218,0xc9);
                  auVar83 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar219._0_4_ = auVar218._0_4_ * auVar83._0_4_;
                  auVar219._4_4_ = auVar218._4_4_ * auVar83._4_4_;
                  auVar219._8_4_ = auVar218._8_4_ * auVar83._8_4_;
                  auVar219._12_4_ = auVar218._12_4_ * auVar83._12_4_;
                  auVar81 = vfmsub231ps_fma(auVar219,auVar81,auVar76);
                  auVar76 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar83 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                  auVar150._0_4_ = auVar84._0_4_ * auVar81._0_4_;
                  auVar150._4_4_ = auVar84._4_4_ * auVar81._4_4_;
                  auVar150._8_4_ = auVar84._8_4_ * auVar81._8_4_;
                  auVar150._12_4_ = auVar84._12_4_ * auVar81._12_4_;
                  auVar76 = vfmsub231ps_fma(auVar150,auVar76,auVar83);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar161;
                    uVar163 = vextractps_avx(auVar76,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar163;
                    uVar163 = vextractps_avx(auVar76,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar163;
                    *(int *)(ray + k * 4 + 0x380) = auVar76._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar179;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar6;
                    *(uint *)(ray + k * 4 + 0x480) = uVar5;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar9 = context->user;
                    auVar252 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar252,auVar160);
                    auVar160 = vpermps_avx512f(auVar252,ZEXT1664(auVar76));
                    auVar252 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar252,ZEXT1664(auVar76));
                    local_380 = vbroadcastss_avx512f(auVar76);
                    local_400[0] = (RTCHitN)auVar160[0];
                    local_400[1] = (RTCHitN)auVar160[1];
                    local_400[2] = (RTCHitN)auVar160[2];
                    local_400[3] = (RTCHitN)auVar160[3];
                    local_400[4] = (RTCHitN)auVar160[4];
                    local_400[5] = (RTCHitN)auVar160[5];
                    local_400[6] = (RTCHitN)auVar160[6];
                    local_400[7] = (RTCHitN)auVar160[7];
                    local_400[8] = (RTCHitN)auVar160[8];
                    local_400[9] = (RTCHitN)auVar160[9];
                    local_400[10] = (RTCHitN)auVar160[10];
                    local_400[0xb] = (RTCHitN)auVar160[0xb];
                    local_400[0xc] = (RTCHitN)auVar160[0xc];
                    local_400[0xd] = (RTCHitN)auVar160[0xd];
                    local_400[0xe] = (RTCHitN)auVar160[0xe];
                    local_400[0xf] = (RTCHitN)auVar160[0xf];
                    local_400[0x10] = (RTCHitN)auVar160[0x10];
                    local_400[0x11] = (RTCHitN)auVar160[0x11];
                    local_400[0x12] = (RTCHitN)auVar160[0x12];
                    local_400[0x13] = (RTCHitN)auVar160[0x13];
                    local_400[0x14] = (RTCHitN)auVar160[0x14];
                    local_400[0x15] = (RTCHitN)auVar160[0x15];
                    local_400[0x16] = (RTCHitN)auVar160[0x16];
                    local_400[0x17] = (RTCHitN)auVar160[0x17];
                    local_400[0x18] = (RTCHitN)auVar160[0x18];
                    local_400[0x19] = (RTCHitN)auVar160[0x19];
                    local_400[0x1a] = (RTCHitN)auVar160[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar160[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar160[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar160[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar160[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar160[0x1f];
                    local_400[0x20] = (RTCHitN)auVar160[0x20];
                    local_400[0x21] = (RTCHitN)auVar160[0x21];
                    local_400[0x22] = (RTCHitN)auVar160[0x22];
                    local_400[0x23] = (RTCHitN)auVar160[0x23];
                    local_400[0x24] = (RTCHitN)auVar160[0x24];
                    local_400[0x25] = (RTCHitN)auVar160[0x25];
                    local_400[0x26] = (RTCHitN)auVar160[0x26];
                    local_400[0x27] = (RTCHitN)auVar160[0x27];
                    local_400[0x28] = (RTCHitN)auVar160[0x28];
                    local_400[0x29] = (RTCHitN)auVar160[0x29];
                    local_400[0x2a] = (RTCHitN)auVar160[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar160[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar160[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar160[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar160[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar160[0x2f];
                    local_400[0x30] = (RTCHitN)auVar160[0x30];
                    local_400[0x31] = (RTCHitN)auVar160[0x31];
                    local_400[0x32] = (RTCHitN)auVar160[0x32];
                    local_400[0x33] = (RTCHitN)auVar160[0x33];
                    local_400[0x34] = (RTCHitN)auVar160[0x34];
                    local_400[0x35] = (RTCHitN)auVar160[0x35];
                    local_400[0x36] = (RTCHitN)auVar160[0x36];
                    local_400[0x37] = (RTCHitN)auVar160[0x37];
                    local_400[0x38] = (RTCHitN)auVar160[0x38];
                    local_400[0x39] = (RTCHitN)auVar160[0x39];
                    local_400[0x3a] = (RTCHitN)auVar160[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar160[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar160[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar160[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar160[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar160[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar160 = vmovdqa64_avx512f(local_440);
                    local_280 = vmovdqa64_avx512f(auVar160);
                    auVar100 = vpcmpeqd_avx2(auVar160._0_32_,auVar160._0_32_);
                    local_ad8[3] = auVar100;
                    local_ad8[2] = auVar100;
                    local_ad8[1] = auVar100;
                    *local_ad8 = auVar100;
                    local_240 = vbroadcastss_avx512f(ZEXT416(pRVar9->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(pRVar9->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar161;
                    auVar160 = vmovdqa64_avx512f(local_4c0);
                    local_6c0 = vmovdqa64_avx512f(auVar160);
                    local_b30.valid = (int *)local_6c0;
                    local_b30.geometryUserPtr = pGVar7->userPtr;
                    local_b30.context = context->user;
                    local_b30.hit = local_400;
                    local_b30.N = 0x10;
                    local_900._0_4_ = fVar177;
                    local_b30.ray = (RTCRayN *)ray;
                    if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar270 = ZEXT1664(auVar77);
                      (*pGVar7->intersectionFilterN)(&local_b30);
                      auVar160 = vmovdqa64_avx512f(local_6c0);
                      fVar177 = (float)local_900._0_4_;
                    }
                    uVar23 = vptestmd_avx512f(auVar160,auVar160);
                    if ((short)uVar23 != 0) {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar270 = ZEXT1664(auVar270._0_16_);
                        (*p_Var8)(&local_b30);
                        auVar160 = vmovdqa64_avx512f(local_6c0);
                        fVar177 = (float)local_900._0_4_;
                      }
                      uVar70 = vptestmd_avx512f(auVar160,auVar160);
                      if ((short)uVar70 != 0) {
                        iVar3 = *(int *)(local_b30.hit + 4);
                        iVar4 = *(int *)(local_b30.hit + 8);
                        iVar1 = *(int *)(local_b30.hit + 0xc);
                        iVar49 = *(int *)(local_b30.hit + 0x10);
                        iVar50 = *(int *)(local_b30.hit + 0x14);
                        iVar51 = *(int *)(local_b30.hit + 0x18);
                        iVar52 = *(int *)(local_b30.hit + 0x1c);
                        iVar53 = *(int *)(local_b30.hit + 0x20);
                        iVar54 = *(int *)(local_b30.hit + 0x24);
                        iVar55 = *(int *)(local_b30.hit + 0x28);
                        iVar56 = *(int *)(local_b30.hit + 0x2c);
                        iVar57 = *(int *)(local_b30.hit + 0x30);
                        iVar58 = *(int *)(local_b30.hit + 0x34);
                        iVar59 = *(int *)(local_b30.hit + 0x38);
                        iVar60 = *(int *)(local_b30.hit + 0x3c);
                        bVar66 = (byte)uVar70;
                        bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar70 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar70 >> 7) & 1);
                        bVar65 = (byte)(uVar70 >> 8);
                        bVar16 = (bool)((byte)(uVar70 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar70 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar70 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar70 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar70 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar70 >> 0xe) & 1);
                        bVar22 = SUB81(uVar70 >> 0xf,0);
                        *(uint *)(local_b30.ray + 0x300) =
                             (uint)(bVar66 & 1) * *(int *)local_b30.hit |
                             (uint)!(bool)(bVar66 & 1) * *(int *)(local_b30.ray + 0x300);
                        *(uint *)(local_b30.ray + 0x304) =
                             (uint)bVar72 * iVar3 | (uint)!bVar72 * *(int *)(local_b30.ray + 0x304);
                        *(uint *)(local_b30.ray + 0x308) =
                             (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_b30.ray + 0x308);
                        *(uint *)(local_b30.ray + 0x30c) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x30c);
                        *(uint *)(local_b30.ray + 0x310) =
                             (uint)bVar12 * iVar49 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x310)
                        ;
                        *(uint *)(local_b30.ray + 0x314) =
                             (uint)bVar13 * iVar50 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x314)
                        ;
                        *(uint *)(local_b30.ray + 0x318) =
                             (uint)bVar14 * iVar51 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x318)
                        ;
                        *(uint *)(local_b30.ray + 0x31c) =
                             (uint)bVar15 * iVar52 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x31c)
                        ;
                        *(uint *)(local_b30.ray + 800) =
                             (uint)(bVar65 & 1) * iVar53 |
                             (uint)!(bool)(bVar65 & 1) * *(int *)(local_b30.ray + 800);
                        *(uint *)(local_b30.ray + 0x324) =
                             (uint)bVar16 * iVar54 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x324)
                        ;
                        *(uint *)(local_b30.ray + 0x328) =
                             (uint)bVar17 * iVar55 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x328)
                        ;
                        *(uint *)(local_b30.ray + 0x32c) =
                             (uint)bVar18 * iVar56 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x32c)
                        ;
                        *(uint *)(local_b30.ray + 0x330) =
                             (uint)bVar19 * iVar57 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x330)
                        ;
                        *(uint *)(local_b30.ray + 0x334) =
                             (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x334)
                        ;
                        *(uint *)(local_b30.ray + 0x338) =
                             (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x338)
                        ;
                        *(uint *)(local_b30.ray + 0x33c) =
                             (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x33c)
                        ;
                        iVar3 = *(int *)(local_b30.hit + 0x44);
                        iVar4 = *(int *)(local_b30.hit + 0x48);
                        iVar1 = *(int *)(local_b30.hit + 0x4c);
                        iVar49 = *(int *)(local_b30.hit + 0x50);
                        iVar50 = *(int *)(local_b30.hit + 0x54);
                        iVar51 = *(int *)(local_b30.hit + 0x58);
                        iVar52 = *(int *)(local_b30.hit + 0x5c);
                        iVar53 = *(int *)(local_b30.hit + 0x60);
                        iVar54 = *(int *)(local_b30.hit + 100);
                        iVar55 = *(int *)(local_b30.hit + 0x68);
                        iVar56 = *(int *)(local_b30.hit + 0x6c);
                        iVar57 = *(int *)(local_b30.hit + 0x70);
                        iVar58 = *(int *)(local_b30.hit + 0x74);
                        iVar59 = *(int *)(local_b30.hit + 0x78);
                        iVar60 = *(int *)(local_b30.hit + 0x7c);
                        bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar70 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar70 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar70 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar70 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar70 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar70 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar70 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar70 >> 0xe) & 1);
                        bVar22 = SUB81(uVar70 >> 0xf,0);
                        *(uint *)(local_b30.ray + 0x340) =
                             (uint)(bVar66 & 1) * *(int *)(local_b30.hit + 0x40) |
                             (uint)!(bool)(bVar66 & 1) * *(int *)(local_b30.ray + 0x340);
                        *(uint *)(local_b30.ray + 0x344) =
                             (uint)bVar72 * iVar3 | (uint)!bVar72 * *(int *)(local_b30.ray + 0x344);
                        *(uint *)(local_b30.ray + 0x348) =
                             (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_b30.ray + 0x348);
                        *(uint *)(local_b30.ray + 0x34c) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x34c);
                        *(uint *)(local_b30.ray + 0x350) =
                             (uint)bVar12 * iVar49 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x350)
                        ;
                        *(uint *)(local_b30.ray + 0x354) =
                             (uint)bVar13 * iVar50 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x354)
                        ;
                        *(uint *)(local_b30.ray + 0x358) =
                             (uint)bVar14 * iVar51 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x358)
                        ;
                        *(uint *)(local_b30.ray + 0x35c) =
                             (uint)bVar15 * iVar52 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x35c)
                        ;
                        *(uint *)(local_b30.ray + 0x360) =
                             (uint)(bVar65 & 1) * iVar53 |
                             (uint)!(bool)(bVar65 & 1) * *(int *)(local_b30.ray + 0x360);
                        *(uint *)(local_b30.ray + 0x364) =
                             (uint)bVar16 * iVar54 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x364)
                        ;
                        *(uint *)(local_b30.ray + 0x368) =
                             (uint)bVar17 * iVar55 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x368)
                        ;
                        *(uint *)(local_b30.ray + 0x36c) =
                             (uint)bVar18 * iVar56 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x36c)
                        ;
                        *(uint *)(local_b30.ray + 0x370) =
                             (uint)bVar19 * iVar57 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x370)
                        ;
                        *(uint *)(local_b30.ray + 0x374) =
                             (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x374)
                        ;
                        *(uint *)(local_b30.ray + 0x378) =
                             (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x378)
                        ;
                        *(uint *)(local_b30.ray + 0x37c) =
                             (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x37c)
                        ;
                        iVar3 = *(int *)(local_b30.hit + 0x84);
                        iVar4 = *(int *)(local_b30.hit + 0x88);
                        iVar1 = *(int *)(local_b30.hit + 0x8c);
                        iVar49 = *(int *)(local_b30.hit + 0x90);
                        iVar50 = *(int *)(local_b30.hit + 0x94);
                        iVar51 = *(int *)(local_b30.hit + 0x98);
                        iVar52 = *(int *)(local_b30.hit + 0x9c);
                        iVar53 = *(int *)(local_b30.hit + 0xa0);
                        iVar54 = *(int *)(local_b30.hit + 0xa4);
                        iVar55 = *(int *)(local_b30.hit + 0xa8);
                        iVar56 = *(int *)(local_b30.hit + 0xac);
                        iVar57 = *(int *)(local_b30.hit + 0xb0);
                        iVar58 = *(int *)(local_b30.hit + 0xb4);
                        iVar59 = *(int *)(local_b30.hit + 0xb8);
                        iVar60 = *(int *)(local_b30.hit + 0xbc);
                        bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar70 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar70 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar70 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar70 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar70 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar70 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar70 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar70 >> 0xe) & 1);
                        bVar22 = SUB81(uVar70 >> 0xf,0);
                        *(uint *)(local_b30.ray + 0x380) =
                             (uint)(bVar66 & 1) * *(int *)(local_b30.hit + 0x80) |
                             (uint)!(bool)(bVar66 & 1) * *(int *)(local_b30.ray + 0x380);
                        *(uint *)(local_b30.ray + 900) =
                             (uint)bVar72 * iVar3 | (uint)!bVar72 * *(int *)(local_b30.ray + 900);
                        *(uint *)(local_b30.ray + 0x388) =
                             (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_b30.ray + 0x388);
                        *(uint *)(local_b30.ray + 0x38c) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x38c);
                        *(uint *)(local_b30.ray + 0x390) =
                             (uint)bVar12 * iVar49 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x390)
                        ;
                        *(uint *)(local_b30.ray + 0x394) =
                             (uint)bVar13 * iVar50 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x394)
                        ;
                        *(uint *)(local_b30.ray + 0x398) =
                             (uint)bVar14 * iVar51 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x398)
                        ;
                        *(uint *)(local_b30.ray + 0x39c) =
                             (uint)bVar15 * iVar52 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x39c)
                        ;
                        *(uint *)(local_b30.ray + 0x3a0) =
                             (uint)(bVar65 & 1) * iVar53 |
                             (uint)!(bool)(bVar65 & 1) * *(int *)(local_b30.ray + 0x3a0);
                        *(uint *)(local_b30.ray + 0x3a4) =
                             (uint)bVar16 * iVar54 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x3a4)
                        ;
                        *(uint *)(local_b30.ray + 0x3a8) =
                             (uint)bVar17 * iVar55 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x3a8)
                        ;
                        *(uint *)(local_b30.ray + 0x3ac) =
                             (uint)bVar18 * iVar56 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x3ac)
                        ;
                        *(uint *)(local_b30.ray + 0x3b0) =
                             (uint)bVar19 * iVar57 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x3b0)
                        ;
                        *(uint *)(local_b30.ray + 0x3b4) =
                             (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3b4)
                        ;
                        *(uint *)(local_b30.ray + 0x3b8) =
                             (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x3b8)
                        ;
                        *(uint *)(local_b30.ray + 0x3bc) =
                             (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3bc)
                        ;
                        iVar3 = *(int *)(local_b30.hit + 0xc4);
                        iVar4 = *(int *)(local_b30.hit + 200);
                        iVar1 = *(int *)(local_b30.hit + 0xcc);
                        iVar49 = *(int *)(local_b30.hit + 0xd0);
                        iVar50 = *(int *)(local_b30.hit + 0xd4);
                        iVar51 = *(int *)(local_b30.hit + 0xd8);
                        iVar52 = *(int *)(local_b30.hit + 0xdc);
                        iVar53 = *(int *)(local_b30.hit + 0xe0);
                        iVar54 = *(int *)(local_b30.hit + 0xe4);
                        iVar55 = *(int *)(local_b30.hit + 0xe8);
                        iVar56 = *(int *)(local_b30.hit + 0xec);
                        iVar57 = *(int *)(local_b30.hit + 0xf0);
                        iVar58 = *(int *)(local_b30.hit + 0xf4);
                        iVar59 = *(int *)(local_b30.hit + 0xf8);
                        iVar60 = *(int *)(local_b30.hit + 0xfc);
                        bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar70 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar70 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar70 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar70 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar70 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar70 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar70 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar70 >> 0xe) & 1);
                        bVar22 = SUB81(uVar70 >> 0xf,0);
                        *(uint *)(local_b30.ray + 0x3c0) =
                             (uint)(bVar66 & 1) * *(int *)(local_b30.hit + 0xc0) |
                             (uint)!(bool)(bVar66 & 1) * *(int *)(local_b30.ray + 0x3c0);
                        *(uint *)(local_b30.ray + 0x3c4) =
                             (uint)bVar72 * iVar3 | (uint)!bVar72 * *(int *)(local_b30.ray + 0x3c4);
                        *(uint *)(local_b30.ray + 0x3c8) =
                             (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_b30.ray + 0x3c8);
                        *(uint *)(local_b30.ray + 0x3cc) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x3cc);
                        *(uint *)(local_b30.ray + 0x3d0) =
                             (uint)bVar12 * iVar49 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x3d0)
                        ;
                        *(uint *)(local_b30.ray + 0x3d4) =
                             (uint)bVar13 * iVar50 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x3d4)
                        ;
                        *(uint *)(local_b30.ray + 0x3d8) =
                             (uint)bVar14 * iVar51 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x3d8)
                        ;
                        *(uint *)(local_b30.ray + 0x3dc) =
                             (uint)bVar15 * iVar52 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x3dc)
                        ;
                        *(uint *)(local_b30.ray + 0x3e0) =
                             (uint)(bVar65 & 1) * iVar53 |
                             (uint)!(bool)(bVar65 & 1) * *(int *)(local_b30.ray + 0x3e0);
                        *(uint *)(local_b30.ray + 0x3e4) =
                             (uint)bVar16 * iVar54 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x3e4)
                        ;
                        *(uint *)(local_b30.ray + 1000) =
                             (uint)bVar17 * iVar55 | (uint)!bVar17 * *(int *)(local_b30.ray + 1000);
                        *(uint *)(local_b30.ray + 0x3ec) =
                             (uint)bVar18 * iVar56 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x3ec)
                        ;
                        *(uint *)(local_b30.ray + 0x3f0) =
                             (uint)bVar19 * iVar57 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x3f0)
                        ;
                        *(uint *)(local_b30.ray + 0x3f4) =
                             (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x3f4)
                        ;
                        *(uint *)(local_b30.ray + 0x3f8) =
                             (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x3f8)
                        ;
                        *(uint *)(local_b30.ray + 0x3fc) =
                             (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x3fc)
                        ;
                        iVar3 = *(int *)(local_b30.hit + 0x104);
                        iVar4 = *(int *)(local_b30.hit + 0x108);
                        iVar1 = *(int *)(local_b30.hit + 0x10c);
                        iVar49 = *(int *)(local_b30.hit + 0x110);
                        iVar50 = *(int *)(local_b30.hit + 0x114);
                        iVar51 = *(int *)(local_b30.hit + 0x118);
                        iVar52 = *(int *)(local_b30.hit + 0x11c);
                        iVar53 = *(int *)(local_b30.hit + 0x120);
                        iVar54 = *(int *)(local_b30.hit + 0x124);
                        iVar55 = *(int *)(local_b30.hit + 0x128);
                        iVar56 = *(int *)(local_b30.hit + 300);
                        iVar57 = *(int *)(local_b30.hit + 0x130);
                        iVar58 = *(int *)(local_b30.hit + 0x134);
                        iVar59 = *(int *)(local_b30.hit + 0x138);
                        iVar60 = *(int *)(local_b30.hit + 0x13c);
                        bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar70 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar70 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar70 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar70 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar70 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar70 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar70 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar70 >> 0xe) & 1);
                        bVar22 = SUB81(uVar70 >> 0xf,0);
                        *(uint *)(local_b30.ray + 0x400) =
                             (uint)(bVar66 & 1) * *(int *)(local_b30.hit + 0x100) |
                             (uint)!(bool)(bVar66 & 1) * *(int *)(local_b30.ray + 0x400);
                        *(uint *)(local_b30.ray + 0x404) =
                             (uint)bVar72 * iVar3 | (uint)!bVar72 * *(int *)(local_b30.ray + 0x404);
                        *(uint *)(local_b30.ray + 0x408) =
                             (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_b30.ray + 0x408);
                        *(uint *)(local_b30.ray + 0x40c) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_b30.ray + 0x40c);
                        *(uint *)(local_b30.ray + 0x410) =
                             (uint)bVar12 * iVar49 | (uint)!bVar12 * *(int *)(local_b30.ray + 0x410)
                        ;
                        *(uint *)(local_b30.ray + 0x414) =
                             (uint)bVar13 * iVar50 | (uint)!bVar13 * *(int *)(local_b30.ray + 0x414)
                        ;
                        *(uint *)(local_b30.ray + 0x418) =
                             (uint)bVar14 * iVar51 | (uint)!bVar14 * *(int *)(local_b30.ray + 0x418)
                        ;
                        *(uint *)(local_b30.ray + 0x41c) =
                             (uint)bVar15 * iVar52 | (uint)!bVar15 * *(int *)(local_b30.ray + 0x41c)
                        ;
                        *(uint *)(local_b30.ray + 0x420) =
                             (uint)(bVar65 & 1) * iVar53 |
                             (uint)!(bool)(bVar65 & 1) * *(int *)(local_b30.ray + 0x420);
                        *(uint *)(local_b30.ray + 0x424) =
                             (uint)bVar16 * iVar54 | (uint)!bVar16 * *(int *)(local_b30.ray + 0x424)
                        ;
                        *(uint *)(local_b30.ray + 0x428) =
                             (uint)bVar17 * iVar55 | (uint)!bVar17 * *(int *)(local_b30.ray + 0x428)
                        ;
                        *(uint *)(local_b30.ray + 0x42c) =
                             (uint)bVar18 * iVar56 | (uint)!bVar18 * *(int *)(local_b30.ray + 0x42c)
                        ;
                        *(uint *)(local_b30.ray + 0x430) =
                             (uint)bVar19 * iVar57 | (uint)!bVar19 * *(int *)(local_b30.ray + 0x430)
                        ;
                        *(uint *)(local_b30.ray + 0x434) =
                             (uint)bVar20 * iVar58 | (uint)!bVar20 * *(int *)(local_b30.ray + 0x434)
                        ;
                        *(uint *)(local_b30.ray + 0x438) =
                             (uint)bVar21 * iVar59 | (uint)!bVar21 * *(int *)(local_b30.ray + 0x438)
                        ;
                        *(uint *)(local_b30.ray + 0x43c) =
                             (uint)bVar22 * iVar60 | (uint)!bVar22 * *(int *)(local_b30.ray + 0x43c)
                        ;
                        auVar160 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x140));
                        auVar160 = vmovdqu32_avx512f(auVar160);
                        *(undefined1 (*) [64])(local_b30.ray + 0x440) = auVar160;
                        auVar160 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x180));
                        auVar160 = vmovdqu32_avx512f(auVar160);
                        *(undefined1 (*) [64])(local_b30.ray + 0x480) = auVar160;
                        auVar160 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x1c0));
                        auVar160 = vmovdqa32_avx512f(auVar160);
                        *(undefined1 (*) [64])(local_b30.ray + 0x4c0) = auVar160;
                        auVar160 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x200));
                        auVar160 = vmovdqa32_avx512f(auVar160);
                        *(undefined1 (*) [64])(local_b30.ray + 0x500) = auVar160;
                        goto LAB_0182f6f6;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar177;
                  }
                }
              }
            }
LAB_0182f6f6:
            uVar163 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar242._4_4_ = uVar163;
            auVar242._0_4_ = uVar163;
            auVar242._8_4_ = uVar163;
            auVar242._12_4_ = uVar163;
            auVar242._16_4_ = uVar163;
            auVar242._20_4_ = uVar163;
            auVar242._24_4_ = uVar163;
            auVar242._28_4_ = uVar163;
            auVar160 = ZEXT3264(auVar242);
            auVar61._4_4_ = fStack_63c;
            auVar61._0_4_ = local_640;
            auVar61._8_4_ = fStack_638;
            auVar61._12_4_ = fStack_634;
            auVar61._16_4_ = fStack_630;
            auVar61._20_4_ = fStack_62c;
            auVar61._24_4_ = fStack_628;
            auVar61._28_4_ = fStack_624;
            uVar23 = vcmpps_avx512vl(auVar242,auVar61,0xd);
          }
          auVar156._0_4_ = (float)local_9a0._0_4_ + (float)local_660._0_4_;
          auVar156._4_4_ = (float)local_9a0._4_4_ + (float)local_660._4_4_;
          auVar156._8_4_ = fStack_998 + fStack_658;
          auVar156._12_4_ = fStack_994 + fStack_654;
          auVar156._16_4_ = fStack_990 + fStack_650;
          auVar156._20_4_ = fStack_98c + fStack_64c;
          auVar156._24_4_ = fStack_988 + fStack_648;
          auVar156._28_4_ = fStack_984 + fStack_644;
          uVar163 = auVar160._0_4_;
          auVar173._4_4_ = uVar163;
          auVar173._0_4_ = uVar163;
          auVar173._8_4_ = uVar163;
          auVar173._12_4_ = uVar163;
          auVar173._16_4_ = uVar163;
          auVar173._20_4_ = uVar163;
          auVar173._24_4_ = uVar163;
          auVar173._28_4_ = uVar163;
          uVar23 = vcmpps_avx512vl(auVar156,auVar173,2);
          auVar157._8_4_ = 2;
          auVar157._0_8_ = 0x200000002;
          auVar157._12_4_ = 2;
          auVar157._16_4_ = 2;
          auVar157._20_4_ = 2;
          auVar157._24_4_ = 2;
          auVar157._28_4_ = 2;
          auVar40._8_4_ = 3;
          auVar40._0_8_ = 0x300000003;
          auVar40._12_4_ = 3;
          auVar40._16_4_ = 3;
          auVar40._20_4_ = 3;
          auVar40._24_4_ = 3;
          auVar40._28_4_ = 3;
          auVar100 = vpblendmd_avx512vl(auVar157,auVar40);
          local_660._0_4_ = (uint)(bVar64 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
          bVar72 = (bool)(bVar64 >> 1 & 1);
          local_660._4_4_ = (uint)bVar72 * auVar100._4_4_ | (uint)!bVar72 * 2;
          bVar72 = (bool)(bVar64 >> 2 & 1);
          fStack_658 = (float)((uint)bVar72 * auVar100._8_4_ | (uint)!bVar72 * 2);
          bVar72 = (bool)(bVar64 >> 3 & 1);
          fStack_654 = (float)((uint)bVar72 * auVar100._12_4_ | (uint)!bVar72 * 2);
          bVar72 = (bool)(bVar64 >> 4 & 1);
          fStack_650 = (float)((uint)bVar72 * auVar100._16_4_ | (uint)!bVar72 * 2);
          bVar72 = (bool)(bVar64 >> 5 & 1);
          fStack_64c = (float)((uint)bVar72 * auVar100._20_4_ | (uint)!bVar72 * 2);
          bVar72 = (bool)(bVar64 >> 6 & 1);
          fStack_648 = (float)((uint)bVar72 * auVar100._24_4_ | (uint)!bVar72 * 2);
          fStack_644 = (float)((uint)(bVar64 >> 7) * auVar100._28_4_ |
                              (uint)!(bool)(bVar64 >> 7) * 2);
          bVar63 = (byte)uVar25 & bVar63 & (byte)uVar23;
          uVar23 = vpcmpd_avx512vl(_local_660,local_600,2);
          local_6e0 = _local_5e0;
          local_640 = (float)local_9a0._0_4_ + (float)local_5e0._0_4_;
          fStack_63c = (float)local_9a0._4_4_ + (float)local_5e0._4_4_;
          fStack_638 = fStack_998 + fStack_5d8;
          fStack_634 = fStack_994 + fStack_5d4;
          fStack_630 = fStack_990 + fStack_5d0;
          fStack_62c = fStack_98c + fStack_5cc;
          fStack_628 = fStack_988 + fStack_5c8;
          fStack_624 = fStack_984 + fStack_5c4;
          auVar260 = ZEXT3264(local_a60);
          auVar265 = ZEXT3264(local_a80);
          auVar268 = ZEXT3264(local_aa0);
          auVar257 = ZEXT3264(local_a00);
          auVar252 = ZEXT3264(local_a20);
          auVar259 = ZEXT3264(local_a40);
          auVar263 = ZEXT3264(local_ac0);
          for (bVar69 = (byte)uVar23 & bVar63; bVar69 != 0;
              bVar69 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar69 & (byte)uVar23) {
            auVar158._8_4_ = 0x7f800000;
            auVar158._0_8_ = 0x7f8000007f800000;
            auVar158._12_4_ = 0x7f800000;
            auVar158._16_4_ = 0x7f800000;
            auVar158._20_4_ = 0x7f800000;
            auVar158._24_4_ = 0x7f800000;
            auVar158._28_4_ = 0x7f800000;
            auVar100 = vblendmps_avx512vl(auVar158,local_6e0);
            auVar134._0_4_ =
                 (uint)(bVar69 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar69 & 1) * 0x7f800000;
            bVar72 = (bool)(bVar69 >> 1 & 1);
            auVar134._4_4_ = (uint)bVar72 * auVar100._4_4_ | (uint)!bVar72 * 0x7f800000;
            bVar72 = (bool)(bVar69 >> 2 & 1);
            auVar134._8_4_ = (uint)bVar72 * auVar100._8_4_ | (uint)!bVar72 * 0x7f800000;
            bVar72 = (bool)(bVar69 >> 3 & 1);
            auVar134._12_4_ = (uint)bVar72 * auVar100._12_4_ | (uint)!bVar72 * 0x7f800000;
            bVar72 = (bool)(bVar69 >> 4 & 1);
            auVar134._16_4_ = (uint)bVar72 * auVar100._16_4_ | (uint)!bVar72 * 0x7f800000;
            bVar72 = (bool)(bVar69 >> 5 & 1);
            auVar134._20_4_ = (uint)bVar72 * auVar100._20_4_ | (uint)!bVar72 * 0x7f800000;
            auVar134._24_4_ =
                 (uint)(bVar69 >> 6) * auVar100._24_4_ | (uint)!(bool)(bVar69 >> 6) * 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar100 = vshufps_avx(auVar134,auVar134,0xb1);
            auVar100 = vminps_avx(auVar134,auVar100);
            auVar103 = vshufpd_avx(auVar100,auVar100,5);
            auVar100 = vminps_avx(auVar100,auVar103);
            auVar103 = vpermpd_avx2(auVar100,0x4e);
            auVar100 = vminps_avx(auVar100,auVar103);
            uVar23 = vcmpps_avx512vl(auVar134,auVar100,0);
            bVar66 = (byte)uVar23 & bVar69;
            bVar64 = bVar69;
            if (bVar66 != 0) {
              bVar64 = bVar66;
            }
            iVar2 = 0;
            for (uVar75 = (uint)bVar64; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar75 = *(uint *)(local_500 + (uint)(iVar2 << 2));
            fVar161 = auVar80._0_4_;
            auVar76 = ZEXT416(*(uint *)(local_5c0 + (uint)(iVar2 << 2)));
            if ((float)local_9e0._0_4_ < 0.0) {
              local_b00._0_16_ = ZEXT416(*(uint *)(local_5c0 + (uint)(iVar2 << 2)));
              auVar270 = ZEXT1664(auVar270._0_16_);
              fVar161 = sqrtf((float)local_9e0._0_4_);
              auVar263 = ZEXT3264(local_ac0);
              auVar259 = ZEXT3264(local_a40);
              auVar252 = ZEXT3264(local_a20);
              auVar257 = ZEXT3264(local_a00);
              auVar268 = ZEXT3264(local_aa0);
              auVar265 = ZEXT3264(local_a80);
              auVar260 = ZEXT3264(local_a60);
              auVar76 = local_b00._0_16_;
            }
            auVar81 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar83 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar77 = vminps_avx(local_840._0_16_,local_880._0_16_);
            auVar84 = vminps_avx(auVar81,auVar77);
            auVar81 = vmaxps_avx(local_840._0_16_,local_880._0_16_);
            auVar77 = vmaxps_avx(auVar83,auVar81);
            auVar220._8_4_ = 0x7fffffff;
            auVar220._0_8_ = 0x7fffffff7fffffff;
            auVar220._12_4_ = 0x7fffffff;
            auVar83 = vandps_avx(auVar84,auVar220);
            auVar81 = vandps_avx(auVar77,auVar220);
            auVar83 = vmaxps_avx(auVar83,auVar81);
            auVar81 = vmovshdup_avx(auVar83);
            auVar81 = vmaxss_avx(auVar81,auVar83);
            auVar83 = vshufpd_avx(auVar83,auVar83,1);
            auVar83 = vmaxss_avx(auVar83,auVar81);
            local_800._0_4_ = auVar83._0_4_ * 1.9073486e-06;
            local_950 = vshufps_avx(auVar77,auVar77,0xff);
            auVar76 = vinsertps_avx(auVar76,ZEXT416(uVar75),0x10);
            auVar160 = ZEXT1664(auVar76);
            lVar71 = 5;
            do {
              do {
                bVar72 = lVar71 == 0;
                lVar71 = lVar71 + -1;
                if (bVar72) goto LAB_018303cf;
                uVar163 = auVar160._0_4_;
                auVar151._4_4_ = uVar163;
                auVar151._0_4_ = uVar163;
                auVar151._8_4_ = uVar163;
                auVar151._12_4_ = uVar163;
                auVar83 = vfmadd132ps_fma(auVar151,ZEXT816(0) << 0x40,local_9d0);
                auVar81 = auVar160._0_16_;
                auVar76 = vmovshdup_avx(auVar81);
                local_7a0._0_16_ = auVar76;
                fVar183 = 1.0 - auVar76._0_4_;
                auVar76 = vshufps_avx(auVar81,auVar81,0x55);
                fVar177 = auVar76._0_4_;
                auVar197._0_4_ = local_860._0_4_ * fVar177;
                fVar179 = auVar76._4_4_;
                auVar197._4_4_ = local_860._4_4_ * fVar179;
                fVar181 = auVar76._8_4_;
                auVar197._8_4_ = local_860._8_4_ * fVar181;
                fVar146 = auVar76._12_4_;
                auVar197._12_4_ = local_860._12_4_ * fVar146;
                _local_780 = ZEXT416((uint)fVar183);
                auVar221._4_4_ = fVar183;
                auVar221._0_4_ = fVar183;
                auVar221._8_4_ = fVar183;
                auVar221._12_4_ = fVar183;
                auVar76 = vfmadd231ps_fma(auVar197,auVar221,local_820._0_16_);
                auVar233._0_4_ = local_840._0_4_ * fVar177;
                auVar233._4_4_ = local_840._4_4_ * fVar179;
                auVar233._8_4_ = local_840._8_4_ * fVar181;
                auVar233._12_4_ = local_840._12_4_ * fVar146;
                auVar81 = vfmadd231ps_fma(auVar233,auVar221,local_860._0_16_);
                auVar240._0_4_ = fVar177 * (float)local_880._0_4_;
                auVar240._4_4_ = fVar179 * (float)local_880._4_4_;
                auVar240._8_4_ = fVar181 * fStack_878;
                auVar240._12_4_ = fVar146 * fStack_874;
                auVar77 = vfmadd231ps_fma(auVar240,auVar221,local_840._0_16_);
                auVar250._0_4_ = fVar177 * auVar81._0_4_;
                auVar250._4_4_ = fVar179 * auVar81._4_4_;
                auVar250._8_4_ = fVar181 * auVar81._8_4_;
                auVar250._12_4_ = fVar146 * auVar81._12_4_;
                auVar76 = vfmadd231ps_fma(auVar250,auVar221,auVar76);
                auVar198._0_4_ = fVar177 * auVar77._0_4_;
                auVar198._4_4_ = fVar179 * auVar77._4_4_;
                auVar198._8_4_ = fVar181 * auVar77._8_4_;
                auVar198._12_4_ = fVar146 * auVar77._12_4_;
                auVar81 = vfmadd231ps_fma(auVar198,auVar221,auVar81);
                auVar234._0_4_ = fVar177 * auVar81._0_4_;
                auVar234._4_4_ = fVar179 * auVar81._4_4_;
                auVar234._8_4_ = fVar181 * auVar81._8_4_;
                auVar234._12_4_ = fVar146 * auVar81._12_4_;
                auVar77 = vfmadd231ps_fma(auVar234,auVar76,auVar221);
                auVar76 = vsubps_avx(auVar81,auVar76);
                auVar33._8_4_ = 0x40400000;
                auVar33._0_8_ = 0x4040000040400000;
                auVar33._12_4_ = 0x40400000;
                auVar81 = vmulps_avx512vl(auVar76,auVar33);
                local_760._0_16_ = auVar77;
                auVar83 = vsubps_avx(auVar83,auVar77);
                auVar76 = vdpps_avx(auVar83,auVar83,0x7f);
                local_b00._0_16_ = auVar76;
                local_900 = auVar160;
                if (auVar76._0_4_ < 0.0) {
                  auVar252._0_4_ = sqrtf(auVar76._0_4_);
                  auVar252._4_60_ = extraout_var_00;
                  auVar76 = auVar252._0_16_;
                }
                else {
                  auVar76 = vsqrtss_avx(auVar76,auVar76);
                }
                local_7c0._0_16_ = vdpps_avx(auVar81,auVar81,0x7f);
                fVar177 = local_7c0._0_4_;
                auVar199._4_12_ = ZEXT812(0) << 0x20;
                auVar199._0_4_ = fVar177;
                local_9c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar199);
                fVar179 = local_9c0._0_4_;
                local_7e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar199);
                auVar34._8_4_ = 0x80000000;
                auVar34._0_8_ = 0x8000000080000000;
                auVar34._12_4_ = 0x80000000;
                auVar84 = vxorps_avx512vl(local_7c0._0_16_,auVar34);
                auVar77 = vfnmadd213ss_fma(local_7e0._0_16_,local_7c0._0_16_,ZEXT416(0x40000000));
                local_980._0_4_ = auVar77._0_4_;
                local_8a0._0_4_ = auVar76._0_4_;
                if (fVar177 < auVar84._0_4_) {
                  fVar181 = sqrtf(fVar177);
                  auVar76 = ZEXT416((uint)local_8a0._0_4_);
                }
                else {
                  auVar77 = vsqrtss_avx(local_7c0._0_16_,local_7c0._0_16_);
                  fVar181 = auVar77._0_4_;
                }
                fVar146 = local_9c0._0_4_;
                auVar82 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(fVar179 * 1.5 +
                                                   fVar177 * -0.5 * fVar146 * fVar146 * fVar146)));
                auVar84 = vmulps_avx512vl(auVar81,auVar82);
                local_9c0._0_16_ = vdpps_avx(auVar84,auVar83,0x7f);
                auVar85 = vaddss_avx512f(auVar76,ZEXT416(0x3f800000));
                auVar152._0_4_ = local_9c0._0_4_ * local_9c0._0_4_;
                auVar152._4_4_ = local_9c0._4_4_ * local_9c0._4_4_;
                auVar152._8_4_ = local_9c0._8_4_ * local_9c0._8_4_;
                auVar152._12_4_ = local_9c0._12_4_ * local_9c0._12_4_;
                auVar77 = vsubps_avx(local_b00._0_16_,auVar152);
                fVar177 = auVar77._0_4_;
                auVar169._4_12_ = ZEXT812(0) << 0x20;
                auVar169._0_4_ = fVar177;
                auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
                auVar87 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
                auVar88 = vmulss_avx512f(auVar77,ZEXT416(0xbf000000));
                uVar74 = fVar177 == 0.0;
                uVar73 = fVar177 < 0.0;
                if ((bool)uVar73) {
                  local_920._0_4_ = auVar87._0_4_;
                  _local_940 = auVar82;
                  local_930 = auVar84;
                  local_910 = auVar78;
                  fVar177 = sqrtf(fVar177);
                  auVar88 = ZEXT416(auVar88._0_4_);
                  auVar87 = ZEXT416((uint)local_920._0_4_);
                  auVar76 = ZEXT416((uint)local_8a0._0_4_);
                  auVar85 = ZEXT416(auVar85._0_4_);
                  auVar84 = local_930;
                  auVar78 = local_910;
                  auVar82 = _local_940;
                }
                else {
                  auVar77 = vsqrtss_avx(auVar77,auVar77);
                  fVar177 = auVar77._0_4_;
                }
                auVar270 = ZEXT1664(auVar81);
                auVar260 = ZEXT3264(local_a60);
                auVar265 = ZEXT3264(local_a80);
                auVar268 = ZEXT3264(local_aa0);
                auVar263 = ZEXT3264(local_ac0);
                auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_780,local_7a0._0_16_
                                         );
                auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7a0._0_16_,_local_780
                                         );
                fVar179 = auVar77._0_4_ * 6.0;
                fVar146 = local_7a0._0_4_ * 6.0;
                auVar222._0_4_ = fVar146 * (float)local_880._0_4_;
                auVar222._4_4_ = fVar146 * (float)local_880._4_4_;
                auVar222._8_4_ = fVar146 * fStack_878;
                auVar222._12_4_ = fVar146 * fStack_874;
                auVar200._4_4_ = fVar179;
                auVar200._0_4_ = fVar179;
                auVar200._8_4_ = fVar179;
                auVar200._12_4_ = fVar179;
                auVar77 = vfmadd132ps_fma(auVar200,auVar222,local_840._0_16_);
                fVar179 = auVar86._0_4_ * 6.0;
                auVar170._4_4_ = fVar179;
                auVar170._0_4_ = fVar179;
                auVar170._8_4_ = fVar179;
                auVar170._12_4_ = fVar179;
                auVar77 = vfmadd132ps_fma(auVar170,auVar77,local_860._0_16_);
                fVar179 = local_780._0_4_ * 6.0;
                auVar201._4_4_ = fVar179;
                auVar201._0_4_ = fVar179;
                auVar201._8_4_ = fVar179;
                auVar201._12_4_ = fVar179;
                auVar77 = vfmadd132ps_fma(auVar201,auVar77,local_820._0_16_);
                auVar171._0_4_ = auVar77._0_4_ * (float)local_7c0._0_4_;
                auVar171._4_4_ = auVar77._4_4_ * (float)local_7c0._0_4_;
                auVar171._8_4_ = auVar77._8_4_ * (float)local_7c0._0_4_;
                auVar171._12_4_ = auVar77._12_4_ * (float)local_7c0._0_4_;
                auVar77 = vdpps_avx(auVar81,auVar77,0x7f);
                fVar179 = auVar77._0_4_;
                auVar202._0_4_ = auVar81._0_4_ * fVar179;
                auVar202._4_4_ = auVar81._4_4_ * fVar179;
                auVar202._8_4_ = auVar81._8_4_ * fVar179;
                auVar202._12_4_ = auVar81._12_4_ * fVar179;
                auVar77 = vsubps_avx(auVar171,auVar202);
                fVar179 = (float)local_980._0_4_ * (float)local_7e0._0_4_;
                auVar86 = vmaxss_avx(ZEXT416((uint)local_800._0_4_),
                                     ZEXT416((uint)(local_900._0_4_ * fVar161 * 1.9073486e-06)));
                auVar203._0_4_ = auVar77._0_4_ * fVar179;
                auVar203._4_4_ = auVar77._4_4_ * fVar179;
                auVar203._8_4_ = auVar77._8_4_ * fVar179;
                auVar203._12_4_ = auVar77._12_4_ * fVar179;
                auVar35._8_4_ = 0x80000000;
                auVar35._0_8_ = 0x8000000080000000;
                auVar35._12_4_ = 0x80000000;
                auVar89 = vxorps_avx512vl(auVar81,auVar35);
                auVar90 = vmulps_avx512vl(auVar82,auVar203);
                auVar77 = vdpps_avx(auVar89,auVar84,0x7f);
                auVar82 = vfmadd213ss_fma(auVar76,ZEXT416((uint)local_800._0_4_),auVar86);
                auVar76 = vdpps_avx(auVar83,auVar90,0x7f);
                vfmadd213ss_avx512f(auVar85,ZEXT416((uint)((float)local_800._0_4_ / fVar181)),
                                    auVar82);
                fVar179 = auVar77._0_4_ + auVar76._0_4_;
                auVar76 = vdpps_avx(local_9d0,auVar84,0x7f);
                auVar77 = vdpps_avx(auVar83,auVar89,0x7f);
                auVar84 = vmulss_avx512f(auVar88,auVar78);
                auVar82 = vmulss_avx512f(auVar78,auVar78);
                auVar78 = vaddss_avx512f(auVar87,ZEXT416((uint)(auVar84._0_4_ * auVar82._0_4_)));
                auVar84 = vdpps_avx(auVar83,local_9d0,0x7f);
                auVar85 = vfnmadd231ss_avx512f(auVar77,local_9c0._0_16_,ZEXT416((uint)fVar179));
                auVar84 = vfnmadd231ss_avx512f(auVar84,local_9c0._0_16_,auVar76);
                auVar77 = vpermilps_avx(local_760._0_16_,0xff);
                fVar177 = fVar177 - auVar77._0_4_;
                auVar82 = vshufps_avx(auVar81,auVar81,0xff);
                auVar77 = vfmsub213ss_fma(auVar85,auVar78,auVar82);
                auVar255._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
                auVar255._8_4_ = auVar77._8_4_ ^ 0x80000000;
                auVar255._12_4_ = auVar77._12_4_ ^ 0x80000000;
                auVar84 = ZEXT416((uint)(auVar84._0_4_ * auVar78._0_4_));
                auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar77._0_4_)),
                                          ZEXT416((uint)fVar179),auVar84);
                auVar77 = vinsertps_avx(auVar255,auVar84,0x1c);
                auVar241._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                auVar241._8_4_ = auVar76._8_4_ ^ 0x80000000;
                auVar241._12_4_ = auVar76._12_4_ ^ 0x80000000;
                auVar84 = vinsertps_avx(ZEXT416((uint)fVar179),auVar241,0x10);
                auVar223._0_4_ = auVar78._0_4_;
                auVar223._4_4_ = auVar223._0_4_;
                auVar223._8_4_ = auVar223._0_4_;
                auVar223._12_4_ = auVar223._0_4_;
                auVar76 = vdivps_avx(auVar77,auVar223);
                auVar77 = vdivps_avx(auVar84,auVar223);
                auVar84 = vbroadcastss_avx512vl(local_9c0._0_16_);
                auVar224._0_4_ = auVar84._0_4_ * auVar76._0_4_ + fVar177 * auVar77._0_4_;
                auVar224._4_4_ = auVar84._4_4_ * auVar76._4_4_ + fVar177 * auVar77._4_4_;
                auVar224._8_4_ = auVar84._8_4_ * auVar76._8_4_ + fVar177 * auVar77._8_4_;
                auVar224._12_4_ = auVar84._12_4_ * auVar76._12_4_ + fVar177 * auVar77._12_4_;
                auVar76 = vsubps_avx(local_900._0_16_,auVar224);
                auVar160 = ZEXT1664(auVar76);
                auVar36._8_4_ = 0x7fffffff;
                auVar36._0_8_ = 0x7fffffff7fffffff;
                auVar36._12_4_ = 0x7fffffff;
                auVar77 = vandps_avx512vl(local_9c0._0_16_,auVar36);
                auVar77 = vucomiss_avx512f(auVar77);
                auVar257 = ZEXT3264(local_a00);
                auVar252 = ZEXT3264(local_a20);
                auVar259 = ZEXT3264(local_a40);
              } while ((bool)uVar73 || (bool)uVar74);
              auVar77 = vaddss_avx512f(auVar86,auVar77);
              auVar77 = vfmadd231ss_fma(auVar77,local_950,ZEXT416(0x36000000));
              auVar37._8_4_ = 0x7fffffff;
              auVar37._0_8_ = 0x7fffffff7fffffff;
              auVar37._12_4_ = 0x7fffffff;
              auVar84 = vandps_avx512vl(ZEXT416((uint)fVar177),auVar37);
            } while (auVar77._0_4_ <= auVar84._0_4_);
            fVar161 = auVar76._0_4_ + (float)local_960._0_4_;
            if (fVar145 <= fVar161) {
              auVar77 = vucomiss_avx512f(ZEXT416((uint)fVar161));
              if (fVar145 <= fVar161) {
                auVar76 = vmovshdup_avx(auVar76);
                fVar177 = auVar76._0_4_;
                if ((0.0 <= fVar177) && (fVar177 <= 1.0)) {
                  auVar76 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_b00._0_4_));
                  fVar179 = auVar76._0_4_;
                  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
                  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    fVar179 = fVar179 * 1.5 +
                              (float)local_b00._0_4_ * -0.5 * fVar179 * fVar179 * fVar179;
                    local_b60 = auVar83._0_4_;
                    fStack_b5c = auVar83._4_4_;
                    fStack_b58 = auVar83._8_4_;
                    fStack_b54 = auVar83._12_4_;
                    auVar225._0_4_ = fVar179 * local_b60;
                    auVar225._4_4_ = fVar179 * fStack_b5c;
                    auVar225._8_4_ = fVar179 * fStack_b58;
                    auVar225._12_4_ = fVar179 * fStack_b54;
                    auVar82 = vfmadd213ps_fma(auVar82,auVar225,auVar81);
                    auVar76 = vshufps_avx(auVar225,auVar225,0xc9);
                    auVar83 = vshufps_avx(auVar81,auVar81,0xc9);
                    auVar226._0_4_ = auVar225._0_4_ * auVar83._0_4_;
                    auVar226._4_4_ = auVar225._4_4_ * auVar83._4_4_;
                    auVar226._8_4_ = auVar225._8_4_ * auVar83._8_4_;
                    auVar226._12_4_ = auVar225._12_4_ * auVar83._12_4_;
                    auVar84 = vfmsub231ps_fma(auVar226,auVar81,auVar76);
                    auVar76 = vshufps_avx(auVar84,auVar84,0xc9);
                    auVar83 = vshufps_avx(auVar82,auVar82,0xc9);
                    auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                    auVar153._0_4_ = auVar82._0_4_ * auVar84._0_4_;
                    auVar153._4_4_ = auVar82._4_4_ * auVar84._4_4_;
                    auVar153._8_4_ = auVar82._8_4_ * auVar84._8_4_;
                    auVar153._12_4_ = auVar82._12_4_ * auVar84._12_4_;
                    auVar76 = vfmsub231ps_fma(auVar153,auVar76,auVar83);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x200) = fVar161;
                      uVar163 = vextractps_avx(auVar76,1);
                      *(undefined4 *)(ray + k * 4 + 0x300) = uVar163;
                      uVar163 = vextractps_avx(auVar76,2);
                      *(undefined4 *)(ray + k * 4 + 0x340) = uVar163;
                      *(int *)(ray + k * 4 + 0x380) = auVar76._0_4_;
                      *(float *)(ray + k * 4 + 0x3c0) = fVar177;
                      *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                      *(uint *)(ray + k * 4 + 0x440) = uVar6;
                      *(uint *)(ray + k * 4 + 0x480) = uVar5;
                      *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    }
                    else {
                      pRVar9 = context->user;
                      auVar137 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar137,auVar160);
                      auVar160 = vpermps_avx512f(auVar137,ZEXT1664(auVar76));
                      auVar137 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar137,ZEXT1664(auVar76));
                      local_380 = vbroadcastss_avx512f(auVar76);
                      local_400[0] = (RTCHitN)auVar160[0];
                      local_400[1] = (RTCHitN)auVar160[1];
                      local_400[2] = (RTCHitN)auVar160[2];
                      local_400[3] = (RTCHitN)auVar160[3];
                      local_400[4] = (RTCHitN)auVar160[4];
                      local_400[5] = (RTCHitN)auVar160[5];
                      local_400[6] = (RTCHitN)auVar160[6];
                      local_400[7] = (RTCHitN)auVar160[7];
                      local_400[8] = (RTCHitN)auVar160[8];
                      local_400[9] = (RTCHitN)auVar160[9];
                      local_400[10] = (RTCHitN)auVar160[10];
                      local_400[0xb] = (RTCHitN)auVar160[0xb];
                      local_400[0xc] = (RTCHitN)auVar160[0xc];
                      local_400[0xd] = (RTCHitN)auVar160[0xd];
                      local_400[0xe] = (RTCHitN)auVar160[0xe];
                      local_400[0xf] = (RTCHitN)auVar160[0xf];
                      local_400[0x10] = (RTCHitN)auVar160[0x10];
                      local_400[0x11] = (RTCHitN)auVar160[0x11];
                      local_400[0x12] = (RTCHitN)auVar160[0x12];
                      local_400[0x13] = (RTCHitN)auVar160[0x13];
                      local_400[0x14] = (RTCHitN)auVar160[0x14];
                      local_400[0x15] = (RTCHitN)auVar160[0x15];
                      local_400[0x16] = (RTCHitN)auVar160[0x16];
                      local_400[0x17] = (RTCHitN)auVar160[0x17];
                      local_400[0x18] = (RTCHitN)auVar160[0x18];
                      local_400[0x19] = (RTCHitN)auVar160[0x19];
                      local_400[0x1a] = (RTCHitN)auVar160[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar160[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar160[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar160[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar160[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar160[0x1f];
                      local_400[0x20] = (RTCHitN)auVar160[0x20];
                      local_400[0x21] = (RTCHitN)auVar160[0x21];
                      local_400[0x22] = (RTCHitN)auVar160[0x22];
                      local_400[0x23] = (RTCHitN)auVar160[0x23];
                      local_400[0x24] = (RTCHitN)auVar160[0x24];
                      local_400[0x25] = (RTCHitN)auVar160[0x25];
                      local_400[0x26] = (RTCHitN)auVar160[0x26];
                      local_400[0x27] = (RTCHitN)auVar160[0x27];
                      local_400[0x28] = (RTCHitN)auVar160[0x28];
                      local_400[0x29] = (RTCHitN)auVar160[0x29];
                      local_400[0x2a] = (RTCHitN)auVar160[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar160[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar160[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar160[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar160[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar160[0x2f];
                      local_400[0x30] = (RTCHitN)auVar160[0x30];
                      local_400[0x31] = (RTCHitN)auVar160[0x31];
                      local_400[0x32] = (RTCHitN)auVar160[0x32];
                      local_400[0x33] = (RTCHitN)auVar160[0x33];
                      local_400[0x34] = (RTCHitN)auVar160[0x34];
                      local_400[0x35] = (RTCHitN)auVar160[0x35];
                      local_400[0x36] = (RTCHitN)auVar160[0x36];
                      local_400[0x37] = (RTCHitN)auVar160[0x37];
                      local_400[0x38] = (RTCHitN)auVar160[0x38];
                      local_400[0x39] = (RTCHitN)auVar160[0x39];
                      local_400[0x3a] = (RTCHitN)auVar160[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar160[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar160[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar160[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar160[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar160[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar160 = vmovdqa64_avx512f(local_440);
                      local_280 = vmovdqa64_avx512f(auVar160);
                      auVar100 = vpcmpeqd_avx2(auVar160._0_32_,auVar160._0_32_);
                      local_ad8[3] = auVar100;
                      local_ad8[2] = auVar100;
                      local_ad8[1] = auVar100;
                      *local_ad8 = auVar100;
                      local_240 = vbroadcastss_avx512f(ZEXT416(pRVar9->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(pRVar9->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar161;
                      auVar160 = vmovdqa64_avx512f(local_4c0);
                      local_6c0 = vmovdqa64_avx512f(auVar160);
                      local_b30.valid = (int *)local_6c0;
                      local_b30.geometryUserPtr = pGVar7->userPtr;
                      local_b30.context = context->user;
                      local_b30.hit = local_400;
                      local_b30.N = 0x10;
                      local_900._0_4_ = auVar77._0_4_;
                      local_b30.ray = (RTCRayN *)ray;
                      uVar163 = auVar77._0_4_;
                      if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar270 = ZEXT1664(auVar81);
                        (*pGVar7->intersectionFilterN)(&local_b30);
                        auVar263 = ZEXT3264(local_ac0);
                        auVar259 = ZEXT3264(local_a40);
                        auVar252 = ZEXT3264(local_a20);
                        auVar257 = ZEXT3264(local_a00);
                        auVar268 = ZEXT3264(local_aa0);
                        auVar265 = ZEXT3264(local_a80);
                        auVar260 = ZEXT3264(local_a60);
                        auVar160 = vmovdqa64_avx512f(local_6c0);
                        uVar163 = local_900._0_4_;
                      }
                      uVar23 = vptestmd_avx512f(auVar160,auVar160);
                      if ((short)uVar23 != 0) {
                        p_Var8 = context->args->filter;
                        if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar270 = ZEXT1664(auVar270._0_16_);
                          (*p_Var8)(&local_b30);
                          auVar263 = ZEXT3264(local_ac0);
                          auVar259 = ZEXT3264(local_a40);
                          auVar252 = ZEXT3264(local_a20);
                          auVar257 = ZEXT3264(local_a00);
                          auVar268 = ZEXT3264(local_aa0);
                          auVar265 = ZEXT3264(local_a80);
                          auVar260 = ZEXT3264(local_a60);
                          auVar160 = vmovdqa64_avx512f(local_6c0);
                          uVar163 = local_900._0_4_;
                        }
                        uVar70 = vptestmd_avx512f(auVar160,auVar160);
                        if ((short)uVar70 != 0) {
                          iVar3 = *(int *)(local_b30.hit + 4);
                          iVar4 = *(int *)(local_b30.hit + 8);
                          iVar1 = *(int *)(local_b30.hit + 0xc);
                          iVar49 = *(int *)(local_b30.hit + 0x10);
                          iVar50 = *(int *)(local_b30.hit + 0x14);
                          iVar51 = *(int *)(local_b30.hit + 0x18);
                          iVar52 = *(int *)(local_b30.hit + 0x1c);
                          iVar53 = *(int *)(local_b30.hit + 0x20);
                          iVar54 = *(int *)(local_b30.hit + 0x24);
                          iVar55 = *(int *)(local_b30.hit + 0x28);
                          iVar56 = *(int *)(local_b30.hit + 0x2c);
                          iVar57 = *(int *)(local_b30.hit + 0x30);
                          iVar58 = *(int *)(local_b30.hit + 0x34);
                          iVar59 = *(int *)(local_b30.hit + 0x38);
                          iVar60 = *(int *)(local_b30.hit + 0x3c);
                          bVar64 = (byte)uVar70;
                          bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 7) & 1);
                          bVar66 = (byte)(uVar70 >> 8);
                          bVar16 = (bool)((byte)(uVar70 >> 9) & 1);
                          bVar17 = (bool)((byte)(uVar70 >> 10) & 1);
                          bVar18 = (bool)((byte)(uVar70 >> 0xb) & 1);
                          bVar19 = (bool)((byte)(uVar70 >> 0xc) & 1);
                          bVar20 = (bool)((byte)(uVar70 >> 0xd) & 1);
                          bVar21 = (bool)((byte)(uVar70 >> 0xe) & 1);
                          bVar22 = SUB81(uVar70 >> 0xf,0);
                          *(uint *)(local_b30.ray + 0x300) =
                               (uint)(bVar64 & 1) * *(int *)local_b30.hit |
                               (uint)!(bool)(bVar64 & 1) * *(int *)(local_b30.ray + 0x300);
                          *(uint *)(local_b30.ray + 0x304) =
                               (uint)bVar72 * iVar3 |
                               (uint)!bVar72 * *(int *)(local_b30.ray + 0x304);
                          *(uint *)(local_b30.ray + 0x308) =
                               (uint)bVar10 * iVar4 |
                               (uint)!bVar10 * *(int *)(local_b30.ray + 0x308);
                          *(uint *)(local_b30.ray + 0x30c) =
                               (uint)bVar11 * iVar1 |
                               (uint)!bVar11 * *(int *)(local_b30.ray + 0x30c);
                          *(uint *)(local_b30.ray + 0x310) =
                               (uint)bVar12 * iVar49 |
                               (uint)!bVar12 * *(int *)(local_b30.ray + 0x310);
                          *(uint *)(local_b30.ray + 0x314) =
                               (uint)bVar13 * iVar50 |
                               (uint)!bVar13 * *(int *)(local_b30.ray + 0x314);
                          *(uint *)(local_b30.ray + 0x318) =
                               (uint)bVar14 * iVar51 |
                               (uint)!bVar14 * *(int *)(local_b30.ray + 0x318);
                          *(uint *)(local_b30.ray + 0x31c) =
                               (uint)bVar15 * iVar52 |
                               (uint)!bVar15 * *(int *)(local_b30.ray + 0x31c);
                          *(uint *)(local_b30.ray + 800) =
                               (uint)(bVar66 & 1) * iVar53 |
                               (uint)!(bool)(bVar66 & 1) * *(int *)(local_b30.ray + 800);
                          *(uint *)(local_b30.ray + 0x324) =
                               (uint)bVar16 * iVar54 |
                               (uint)!bVar16 * *(int *)(local_b30.ray + 0x324);
                          *(uint *)(local_b30.ray + 0x328) =
                               (uint)bVar17 * iVar55 |
                               (uint)!bVar17 * *(int *)(local_b30.ray + 0x328);
                          *(uint *)(local_b30.ray + 0x32c) =
                               (uint)bVar18 * iVar56 |
                               (uint)!bVar18 * *(int *)(local_b30.ray + 0x32c);
                          *(uint *)(local_b30.ray + 0x330) =
                               (uint)bVar19 * iVar57 |
                               (uint)!bVar19 * *(int *)(local_b30.ray + 0x330);
                          *(uint *)(local_b30.ray + 0x334) =
                               (uint)bVar20 * iVar58 |
                               (uint)!bVar20 * *(int *)(local_b30.ray + 0x334);
                          *(uint *)(local_b30.ray + 0x338) =
                               (uint)bVar21 * iVar59 |
                               (uint)!bVar21 * *(int *)(local_b30.ray + 0x338);
                          *(uint *)(local_b30.ray + 0x33c) =
                               (uint)bVar22 * iVar60 |
                               (uint)!bVar22 * *(int *)(local_b30.ray + 0x33c);
                          iVar3 = *(int *)(local_b30.hit + 0x44);
                          iVar4 = *(int *)(local_b30.hit + 0x48);
                          iVar1 = *(int *)(local_b30.hit + 0x4c);
                          iVar49 = *(int *)(local_b30.hit + 0x50);
                          iVar50 = *(int *)(local_b30.hit + 0x54);
                          iVar51 = *(int *)(local_b30.hit + 0x58);
                          iVar52 = *(int *)(local_b30.hit + 0x5c);
                          iVar53 = *(int *)(local_b30.hit + 0x60);
                          iVar54 = *(int *)(local_b30.hit + 100);
                          iVar55 = *(int *)(local_b30.hit + 0x68);
                          iVar56 = *(int *)(local_b30.hit + 0x6c);
                          iVar57 = *(int *)(local_b30.hit + 0x70);
                          iVar58 = *(int *)(local_b30.hit + 0x74);
                          iVar59 = *(int *)(local_b30.hit + 0x78);
                          iVar60 = *(int *)(local_b30.hit + 0x7c);
                          bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 7) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 9) & 1);
                          bVar17 = (bool)((byte)(uVar70 >> 10) & 1);
                          bVar18 = (bool)((byte)(uVar70 >> 0xb) & 1);
                          bVar19 = (bool)((byte)(uVar70 >> 0xc) & 1);
                          bVar20 = (bool)((byte)(uVar70 >> 0xd) & 1);
                          bVar21 = (bool)((byte)(uVar70 >> 0xe) & 1);
                          bVar22 = SUB81(uVar70 >> 0xf,0);
                          *(uint *)(local_b30.ray + 0x340) =
                               (uint)(bVar64 & 1) * *(int *)(local_b30.hit + 0x40) |
                               (uint)!(bool)(bVar64 & 1) * *(int *)(local_b30.ray + 0x340);
                          *(uint *)(local_b30.ray + 0x344) =
                               (uint)bVar72 * iVar3 |
                               (uint)!bVar72 * *(int *)(local_b30.ray + 0x344);
                          *(uint *)(local_b30.ray + 0x348) =
                               (uint)bVar10 * iVar4 |
                               (uint)!bVar10 * *(int *)(local_b30.ray + 0x348);
                          *(uint *)(local_b30.ray + 0x34c) =
                               (uint)bVar11 * iVar1 |
                               (uint)!bVar11 * *(int *)(local_b30.ray + 0x34c);
                          *(uint *)(local_b30.ray + 0x350) =
                               (uint)bVar12 * iVar49 |
                               (uint)!bVar12 * *(int *)(local_b30.ray + 0x350);
                          *(uint *)(local_b30.ray + 0x354) =
                               (uint)bVar13 * iVar50 |
                               (uint)!bVar13 * *(int *)(local_b30.ray + 0x354);
                          *(uint *)(local_b30.ray + 0x358) =
                               (uint)bVar14 * iVar51 |
                               (uint)!bVar14 * *(int *)(local_b30.ray + 0x358);
                          *(uint *)(local_b30.ray + 0x35c) =
                               (uint)bVar15 * iVar52 |
                               (uint)!bVar15 * *(int *)(local_b30.ray + 0x35c);
                          *(uint *)(local_b30.ray + 0x360) =
                               (uint)(bVar66 & 1) * iVar53 |
                               (uint)!(bool)(bVar66 & 1) * *(int *)(local_b30.ray + 0x360);
                          *(uint *)(local_b30.ray + 0x364) =
                               (uint)bVar16 * iVar54 |
                               (uint)!bVar16 * *(int *)(local_b30.ray + 0x364);
                          *(uint *)(local_b30.ray + 0x368) =
                               (uint)bVar17 * iVar55 |
                               (uint)!bVar17 * *(int *)(local_b30.ray + 0x368);
                          *(uint *)(local_b30.ray + 0x36c) =
                               (uint)bVar18 * iVar56 |
                               (uint)!bVar18 * *(int *)(local_b30.ray + 0x36c);
                          *(uint *)(local_b30.ray + 0x370) =
                               (uint)bVar19 * iVar57 |
                               (uint)!bVar19 * *(int *)(local_b30.ray + 0x370);
                          *(uint *)(local_b30.ray + 0x374) =
                               (uint)bVar20 * iVar58 |
                               (uint)!bVar20 * *(int *)(local_b30.ray + 0x374);
                          *(uint *)(local_b30.ray + 0x378) =
                               (uint)bVar21 * iVar59 |
                               (uint)!bVar21 * *(int *)(local_b30.ray + 0x378);
                          *(uint *)(local_b30.ray + 0x37c) =
                               (uint)bVar22 * iVar60 |
                               (uint)!bVar22 * *(int *)(local_b30.ray + 0x37c);
                          iVar3 = *(int *)(local_b30.hit + 0x84);
                          iVar4 = *(int *)(local_b30.hit + 0x88);
                          iVar1 = *(int *)(local_b30.hit + 0x8c);
                          iVar49 = *(int *)(local_b30.hit + 0x90);
                          iVar50 = *(int *)(local_b30.hit + 0x94);
                          iVar51 = *(int *)(local_b30.hit + 0x98);
                          iVar52 = *(int *)(local_b30.hit + 0x9c);
                          iVar53 = *(int *)(local_b30.hit + 0xa0);
                          iVar54 = *(int *)(local_b30.hit + 0xa4);
                          iVar55 = *(int *)(local_b30.hit + 0xa8);
                          iVar56 = *(int *)(local_b30.hit + 0xac);
                          iVar57 = *(int *)(local_b30.hit + 0xb0);
                          iVar58 = *(int *)(local_b30.hit + 0xb4);
                          iVar59 = *(int *)(local_b30.hit + 0xb8);
                          iVar60 = *(int *)(local_b30.hit + 0xbc);
                          bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 7) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 9) & 1);
                          bVar17 = (bool)((byte)(uVar70 >> 10) & 1);
                          bVar18 = (bool)((byte)(uVar70 >> 0xb) & 1);
                          bVar19 = (bool)((byte)(uVar70 >> 0xc) & 1);
                          bVar20 = (bool)((byte)(uVar70 >> 0xd) & 1);
                          bVar21 = (bool)((byte)(uVar70 >> 0xe) & 1);
                          bVar22 = SUB81(uVar70 >> 0xf,0);
                          *(uint *)(local_b30.ray + 0x380) =
                               (uint)(bVar64 & 1) * *(int *)(local_b30.hit + 0x80) |
                               (uint)!(bool)(bVar64 & 1) * *(int *)(local_b30.ray + 0x380);
                          *(uint *)(local_b30.ray + 900) =
                               (uint)bVar72 * iVar3 | (uint)!bVar72 * *(int *)(local_b30.ray + 900);
                          *(uint *)(local_b30.ray + 0x388) =
                               (uint)bVar10 * iVar4 |
                               (uint)!bVar10 * *(int *)(local_b30.ray + 0x388);
                          *(uint *)(local_b30.ray + 0x38c) =
                               (uint)bVar11 * iVar1 |
                               (uint)!bVar11 * *(int *)(local_b30.ray + 0x38c);
                          *(uint *)(local_b30.ray + 0x390) =
                               (uint)bVar12 * iVar49 |
                               (uint)!bVar12 * *(int *)(local_b30.ray + 0x390);
                          *(uint *)(local_b30.ray + 0x394) =
                               (uint)bVar13 * iVar50 |
                               (uint)!bVar13 * *(int *)(local_b30.ray + 0x394);
                          *(uint *)(local_b30.ray + 0x398) =
                               (uint)bVar14 * iVar51 |
                               (uint)!bVar14 * *(int *)(local_b30.ray + 0x398);
                          *(uint *)(local_b30.ray + 0x39c) =
                               (uint)bVar15 * iVar52 |
                               (uint)!bVar15 * *(int *)(local_b30.ray + 0x39c);
                          *(uint *)(local_b30.ray + 0x3a0) =
                               (uint)(bVar66 & 1) * iVar53 |
                               (uint)!(bool)(bVar66 & 1) * *(int *)(local_b30.ray + 0x3a0);
                          *(uint *)(local_b30.ray + 0x3a4) =
                               (uint)bVar16 * iVar54 |
                               (uint)!bVar16 * *(int *)(local_b30.ray + 0x3a4);
                          *(uint *)(local_b30.ray + 0x3a8) =
                               (uint)bVar17 * iVar55 |
                               (uint)!bVar17 * *(int *)(local_b30.ray + 0x3a8);
                          *(uint *)(local_b30.ray + 0x3ac) =
                               (uint)bVar18 * iVar56 |
                               (uint)!bVar18 * *(int *)(local_b30.ray + 0x3ac);
                          *(uint *)(local_b30.ray + 0x3b0) =
                               (uint)bVar19 * iVar57 |
                               (uint)!bVar19 * *(int *)(local_b30.ray + 0x3b0);
                          *(uint *)(local_b30.ray + 0x3b4) =
                               (uint)bVar20 * iVar58 |
                               (uint)!bVar20 * *(int *)(local_b30.ray + 0x3b4);
                          *(uint *)(local_b30.ray + 0x3b8) =
                               (uint)bVar21 * iVar59 |
                               (uint)!bVar21 * *(int *)(local_b30.ray + 0x3b8);
                          *(uint *)(local_b30.ray + 0x3bc) =
                               (uint)bVar22 * iVar60 |
                               (uint)!bVar22 * *(int *)(local_b30.ray + 0x3bc);
                          iVar3 = *(int *)(local_b30.hit + 0xc4);
                          iVar4 = *(int *)(local_b30.hit + 200);
                          iVar1 = *(int *)(local_b30.hit + 0xcc);
                          iVar49 = *(int *)(local_b30.hit + 0xd0);
                          iVar50 = *(int *)(local_b30.hit + 0xd4);
                          iVar51 = *(int *)(local_b30.hit + 0xd8);
                          iVar52 = *(int *)(local_b30.hit + 0xdc);
                          iVar53 = *(int *)(local_b30.hit + 0xe0);
                          iVar54 = *(int *)(local_b30.hit + 0xe4);
                          iVar55 = *(int *)(local_b30.hit + 0xe8);
                          iVar56 = *(int *)(local_b30.hit + 0xec);
                          iVar57 = *(int *)(local_b30.hit + 0xf0);
                          iVar58 = *(int *)(local_b30.hit + 0xf4);
                          iVar59 = *(int *)(local_b30.hit + 0xf8);
                          iVar60 = *(int *)(local_b30.hit + 0xfc);
                          bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 7) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 9) & 1);
                          bVar17 = (bool)((byte)(uVar70 >> 10) & 1);
                          bVar18 = (bool)((byte)(uVar70 >> 0xb) & 1);
                          bVar19 = (bool)((byte)(uVar70 >> 0xc) & 1);
                          bVar20 = (bool)((byte)(uVar70 >> 0xd) & 1);
                          bVar21 = (bool)((byte)(uVar70 >> 0xe) & 1);
                          bVar22 = SUB81(uVar70 >> 0xf,0);
                          *(uint *)(local_b30.ray + 0x3c0) =
                               (uint)(bVar64 & 1) * *(int *)(local_b30.hit + 0xc0) |
                               (uint)!(bool)(bVar64 & 1) * *(int *)(local_b30.ray + 0x3c0);
                          *(uint *)(local_b30.ray + 0x3c4) =
                               (uint)bVar72 * iVar3 |
                               (uint)!bVar72 * *(int *)(local_b30.ray + 0x3c4);
                          *(uint *)(local_b30.ray + 0x3c8) =
                               (uint)bVar10 * iVar4 |
                               (uint)!bVar10 * *(int *)(local_b30.ray + 0x3c8);
                          *(uint *)(local_b30.ray + 0x3cc) =
                               (uint)bVar11 * iVar1 |
                               (uint)!bVar11 * *(int *)(local_b30.ray + 0x3cc);
                          *(uint *)(local_b30.ray + 0x3d0) =
                               (uint)bVar12 * iVar49 |
                               (uint)!bVar12 * *(int *)(local_b30.ray + 0x3d0);
                          *(uint *)(local_b30.ray + 0x3d4) =
                               (uint)bVar13 * iVar50 |
                               (uint)!bVar13 * *(int *)(local_b30.ray + 0x3d4);
                          *(uint *)(local_b30.ray + 0x3d8) =
                               (uint)bVar14 * iVar51 |
                               (uint)!bVar14 * *(int *)(local_b30.ray + 0x3d8);
                          *(uint *)(local_b30.ray + 0x3dc) =
                               (uint)bVar15 * iVar52 |
                               (uint)!bVar15 * *(int *)(local_b30.ray + 0x3dc);
                          *(uint *)(local_b30.ray + 0x3e0) =
                               (uint)(bVar66 & 1) * iVar53 |
                               (uint)!(bool)(bVar66 & 1) * *(int *)(local_b30.ray + 0x3e0);
                          *(uint *)(local_b30.ray + 0x3e4) =
                               (uint)bVar16 * iVar54 |
                               (uint)!bVar16 * *(int *)(local_b30.ray + 0x3e4);
                          *(uint *)(local_b30.ray + 1000) =
                               (uint)bVar17 * iVar55 |
                               (uint)!bVar17 * *(int *)(local_b30.ray + 1000);
                          *(uint *)(local_b30.ray + 0x3ec) =
                               (uint)bVar18 * iVar56 |
                               (uint)!bVar18 * *(int *)(local_b30.ray + 0x3ec);
                          *(uint *)(local_b30.ray + 0x3f0) =
                               (uint)bVar19 * iVar57 |
                               (uint)!bVar19 * *(int *)(local_b30.ray + 0x3f0);
                          *(uint *)(local_b30.ray + 0x3f4) =
                               (uint)bVar20 * iVar58 |
                               (uint)!bVar20 * *(int *)(local_b30.ray + 0x3f4);
                          *(uint *)(local_b30.ray + 0x3f8) =
                               (uint)bVar21 * iVar59 |
                               (uint)!bVar21 * *(int *)(local_b30.ray + 0x3f8);
                          *(uint *)(local_b30.ray + 0x3fc) =
                               (uint)bVar22 * iVar60 |
                               (uint)!bVar22 * *(int *)(local_b30.ray + 0x3fc);
                          iVar3 = *(int *)(local_b30.hit + 0x104);
                          iVar4 = *(int *)(local_b30.hit + 0x108);
                          iVar1 = *(int *)(local_b30.hit + 0x10c);
                          iVar49 = *(int *)(local_b30.hit + 0x110);
                          iVar50 = *(int *)(local_b30.hit + 0x114);
                          iVar51 = *(int *)(local_b30.hit + 0x118);
                          iVar52 = *(int *)(local_b30.hit + 0x11c);
                          iVar53 = *(int *)(local_b30.hit + 0x120);
                          iVar54 = *(int *)(local_b30.hit + 0x124);
                          iVar55 = *(int *)(local_b30.hit + 0x128);
                          iVar56 = *(int *)(local_b30.hit + 300);
                          iVar57 = *(int *)(local_b30.hit + 0x130);
                          iVar58 = *(int *)(local_b30.hit + 0x134);
                          iVar59 = *(int *)(local_b30.hit + 0x138);
                          iVar60 = *(int *)(local_b30.hit + 0x13c);
                          bVar72 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 7) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 9) & 1);
                          bVar17 = (bool)((byte)(uVar70 >> 10) & 1);
                          bVar18 = (bool)((byte)(uVar70 >> 0xb) & 1);
                          bVar19 = (bool)((byte)(uVar70 >> 0xc) & 1);
                          bVar20 = (bool)((byte)(uVar70 >> 0xd) & 1);
                          bVar21 = (bool)((byte)(uVar70 >> 0xe) & 1);
                          bVar22 = SUB81(uVar70 >> 0xf,0);
                          *(uint *)(local_b30.ray + 0x400) =
                               (uint)(bVar64 & 1) * *(int *)(local_b30.hit + 0x100) |
                               (uint)!(bool)(bVar64 & 1) * *(int *)(local_b30.ray + 0x400);
                          *(uint *)(local_b30.ray + 0x404) =
                               (uint)bVar72 * iVar3 |
                               (uint)!bVar72 * *(int *)(local_b30.ray + 0x404);
                          *(uint *)(local_b30.ray + 0x408) =
                               (uint)bVar10 * iVar4 |
                               (uint)!bVar10 * *(int *)(local_b30.ray + 0x408);
                          *(uint *)(local_b30.ray + 0x40c) =
                               (uint)bVar11 * iVar1 |
                               (uint)!bVar11 * *(int *)(local_b30.ray + 0x40c);
                          *(uint *)(local_b30.ray + 0x410) =
                               (uint)bVar12 * iVar49 |
                               (uint)!bVar12 * *(int *)(local_b30.ray + 0x410);
                          *(uint *)(local_b30.ray + 0x414) =
                               (uint)bVar13 * iVar50 |
                               (uint)!bVar13 * *(int *)(local_b30.ray + 0x414);
                          *(uint *)(local_b30.ray + 0x418) =
                               (uint)bVar14 * iVar51 |
                               (uint)!bVar14 * *(int *)(local_b30.ray + 0x418);
                          *(uint *)(local_b30.ray + 0x41c) =
                               (uint)bVar15 * iVar52 |
                               (uint)!bVar15 * *(int *)(local_b30.ray + 0x41c);
                          *(uint *)(local_b30.ray + 0x420) =
                               (uint)(bVar66 & 1) * iVar53 |
                               (uint)!(bool)(bVar66 & 1) * *(int *)(local_b30.ray + 0x420);
                          *(uint *)(local_b30.ray + 0x424) =
                               (uint)bVar16 * iVar54 |
                               (uint)!bVar16 * *(int *)(local_b30.ray + 0x424);
                          *(uint *)(local_b30.ray + 0x428) =
                               (uint)bVar17 * iVar55 |
                               (uint)!bVar17 * *(int *)(local_b30.ray + 0x428);
                          *(uint *)(local_b30.ray + 0x42c) =
                               (uint)bVar18 * iVar56 |
                               (uint)!bVar18 * *(int *)(local_b30.ray + 0x42c);
                          *(uint *)(local_b30.ray + 0x430) =
                               (uint)bVar19 * iVar57 |
                               (uint)!bVar19 * *(int *)(local_b30.ray + 0x430);
                          *(uint *)(local_b30.ray + 0x434) =
                               (uint)bVar20 * iVar58 |
                               (uint)!bVar20 * *(int *)(local_b30.ray + 0x434);
                          *(uint *)(local_b30.ray + 0x438) =
                               (uint)bVar21 * iVar59 |
                               (uint)!bVar21 * *(int *)(local_b30.ray + 0x438);
                          *(uint *)(local_b30.ray + 0x43c) =
                               (uint)bVar22 * iVar60 |
                               (uint)!bVar22 * *(int *)(local_b30.ray + 0x43c);
                          auVar160 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x140)
                                                      );
                          auVar160 = vmovdqu32_avx512f(auVar160);
                          *(undefined1 (*) [64])(local_b30.ray + 0x440) = auVar160;
                          auVar160 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x180)
                                                      );
                          auVar160 = vmovdqu32_avx512f(auVar160);
                          *(undefined1 (*) [64])(local_b30.ray + 0x480) = auVar160;
                          auVar160 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x1c0)
                                                      );
                          auVar160 = vmovdqa32_avx512f(auVar160);
                          *(undefined1 (*) [64])(local_b30.ray + 0x4c0) = auVar160;
                          auVar160 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b30.hit + 0x200)
                                                      );
                          auVar160 = vmovdqa32_avx512f(auVar160);
                          *(undefined1 (*) [64])(local_b30.ray + 0x500) = auVar160;
                          goto LAB_018303cf;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x200) = uVar163;
                    }
                  }
                }
              }
            }
LAB_018303cf:
            uVar163 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar243._4_4_ = uVar163;
            auVar243._0_4_ = uVar163;
            auVar243._8_4_ = uVar163;
            auVar243._12_4_ = uVar163;
            auVar243._16_4_ = uVar163;
            auVar243._20_4_ = uVar163;
            auVar243._24_4_ = uVar163;
            auVar243._28_4_ = uVar163;
            auVar160 = ZEXT3264(auVar243);
            auVar62._4_4_ = fStack_63c;
            auVar62._0_4_ = local_640;
            auVar62._8_4_ = fStack_638;
            auVar62._12_4_ = fStack_634;
            auVar62._16_4_ = fStack_630;
            auVar62._20_4_ = fStack_62c;
            auVar62._24_4_ = fStack_628;
            auVar62._28_4_ = fStack_624;
            uVar23 = vcmpps_avx512vl(auVar243,auVar62,0xd);
          }
          uVar26 = vpcmpd_avx512vl(local_600,local_5a0,1);
          uVar25 = vpcmpd_avx512vl(local_600,_local_660,1);
          auVar174._0_4_ = (float)local_9a0._0_4_ + (float)local_540._0_4_;
          auVar174._4_4_ = (float)local_9a0._4_4_ + (float)local_540._4_4_;
          auVar174._8_4_ = fStack_998 + fStack_538;
          auVar174._12_4_ = fStack_994 + fStack_534;
          auVar174._16_4_ = fStack_990 + fStack_530;
          auVar174._20_4_ = fStack_98c + fStack_52c;
          auVar174._24_4_ = fStack_988 + fStack_528;
          auVar174._28_4_ = fStack_984 + fStack_524;
          uVar163 = auVar160._0_4_;
          auVar207._4_4_ = uVar163;
          auVar207._0_4_ = uVar163;
          auVar207._8_4_ = uVar163;
          auVar207._12_4_ = uVar163;
          auVar207._16_4_ = uVar163;
          auVar207._20_4_ = uVar163;
          auVar207._24_4_ = uVar163;
          auVar207._28_4_ = uVar163;
          uVar23 = vcmpps_avx512vl(auVar174,auVar207,2);
          bVar67 = bVar67 & (byte)uVar26 & (byte)uVar23;
          auVar228._0_4_ = (float)local_9a0._0_4_ + local_5e0._0_4_;
          auVar228._4_4_ = (float)local_9a0._4_4_ + local_5e0._4_4_;
          auVar228._8_4_ = fStack_998 + local_5e0._8_4_;
          auVar228._12_4_ = fStack_994 + local_5e0._12_4_;
          auVar228._16_4_ = fStack_990 + local_5e0._16_4_;
          auVar228._20_4_ = fStack_98c + local_5e0._20_4_;
          auVar228._24_4_ = fStack_988 + local_5e0._24_4_;
          auVar228._28_4_ = fStack_984 + local_5e0._28_4_;
          uVar23 = vcmpps_avx512vl(auVar228,auVar207,2);
          bVar63 = bVar63 & (byte)uVar25 & (byte)uVar23 | bVar67;
          if (bVar63 != 0) {
            abStack_1a0[uVar68 * 0x60] = bVar63;
            auVar135._0_4_ =
                 (uint)(bVar67 & 1) * local_540._0_4_ |
                 (uint)!(bool)(bVar67 & 1) * (int)local_5e0._0_4_;
            bVar72 = (bool)(bVar67 >> 1 & 1);
            auVar135._4_4_ = (uint)bVar72 * local_540._4_4_ | (uint)!bVar72 * (int)local_5e0._4_4_;
            bVar72 = (bool)(bVar67 >> 2 & 1);
            auVar135._8_4_ = (uint)bVar72 * (int)fStack_538 | (uint)!bVar72 * (int)local_5e0._8_4_;
            bVar72 = (bool)(bVar67 >> 3 & 1);
            auVar135._12_4_ = (uint)bVar72 * (int)fStack_534 | (uint)!bVar72 * (int)local_5e0._12_4_
            ;
            bVar72 = (bool)(bVar67 >> 4 & 1);
            auVar135._16_4_ = (uint)bVar72 * (int)fStack_530 | (uint)!bVar72 * (int)local_5e0._16_4_
            ;
            bVar72 = (bool)(bVar67 >> 5 & 1);
            auVar135._20_4_ = (uint)bVar72 * (int)fStack_52c | (uint)!bVar72 * (int)local_5e0._20_4_
            ;
            auVar135._24_4_ =
                 (uint)(bVar67 >> 6) * (int)fStack_528 |
                 (uint)!(bool)(bVar67 >> 6) * (int)local_5e0._24_4_;
            auVar135._28_4_ = local_5e0._28_4_;
            *(undefined1 (*) [32])(auStack_180 + uVar68 * 0x60) = auVar135;
            uVar70 = vmovlps_avx(local_610);
            (&uStack_160)[uVar68 * 0xc] = uVar70;
            aiStack_158[uVar68 * 0x18] = local_d04 + 1;
            uVar68 = (ulong)((int)uVar68 + 1);
          }
          auVar160 = ZEXT3264(_DAT_01f7b040);
          prim = local_ad0;
          fVar161 = (float)local_9a0._0_4_;
          fVar177 = (float)local_9a0._4_4_;
          fVar179 = fStack_998;
          fVar181 = fStack_994;
          fVar146 = fStack_990;
          fVar183 = fStack_98c;
          fVar185 = fStack_988;
          fVar187 = fStack_984;
        }
      }
    }
    do {
      uVar75 = (uint)uVar68;
      uVar68 = (ulong)(uVar75 - 1);
      if (uVar75 == 0) {
        uVar163 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar38._4_4_ = uVar163;
        auVar38._0_4_ = uVar163;
        auVar38._8_4_ = uVar163;
        auVar38._12_4_ = uVar163;
        uVar23 = vcmpps_avx512vl(local_620,auVar38,2);
        local_ac8 = (ulong)((uint)local_ac8 & (uint)uVar23);
        goto LAB_0182dedb;
      }
      lVar71 = uVar68 * 0x60;
      auVar100 = *(undefined1 (*) [32])(auStack_180 + lVar71);
      auVar175._0_4_ = fVar161 + auVar100._0_4_;
      auVar175._4_4_ = fVar177 + auVar100._4_4_;
      auVar175._8_4_ = fVar179 + auVar100._8_4_;
      auVar175._12_4_ = fVar181 + auVar100._12_4_;
      auVar175._16_4_ = fVar146 + auVar100._16_4_;
      auVar175._20_4_ = fVar183 + auVar100._20_4_;
      auVar175._24_4_ = fVar185 + auVar100._24_4_;
      auVar175._28_4_ = fVar187 + auVar100._28_4_;
      uVar163 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar41._4_4_ = uVar163;
      auVar41._0_4_ = uVar163;
      auVar41._8_4_ = uVar163;
      auVar41._12_4_ = uVar163;
      auVar41._16_4_ = uVar163;
      auVar41._20_4_ = uVar163;
      auVar41._24_4_ = uVar163;
      auVar41._28_4_ = uVar163;
      uVar23 = vcmpps_avx512vl(auVar175,auVar41,2);
      uVar138 = (uint)uVar23 & (uint)abStack_1a0[lVar71];
    } while (uVar138 == 0);
    uVar70 = (&uStack_160)[uVar68 * 0xc];
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar70;
    auVar208._8_4_ = 0x7f800000;
    auVar208._0_8_ = 0x7f8000007f800000;
    auVar208._12_4_ = 0x7f800000;
    auVar208._16_4_ = 0x7f800000;
    auVar208._20_4_ = 0x7f800000;
    auVar208._24_4_ = 0x7f800000;
    auVar208._28_4_ = 0x7f800000;
    auVar103 = vblendmps_avx512vl(auVar208,auVar100);
    bVar63 = (byte)uVar138;
    auVar136._0_4_ =
         (uint)(bVar63 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar63 & 1) * (int)auVar100._0_4_;
    bVar72 = (bool)((byte)(uVar138 >> 1) & 1);
    auVar136._4_4_ = (uint)bVar72 * auVar103._4_4_ | (uint)!bVar72 * (int)auVar100._4_4_;
    bVar72 = (bool)((byte)(uVar138 >> 2) & 1);
    auVar136._8_4_ = (uint)bVar72 * auVar103._8_4_ | (uint)!bVar72 * (int)auVar100._8_4_;
    bVar72 = (bool)((byte)(uVar138 >> 3) & 1);
    auVar136._12_4_ = (uint)bVar72 * auVar103._12_4_ | (uint)!bVar72 * (int)auVar100._12_4_;
    bVar72 = (bool)((byte)(uVar138 >> 4) & 1);
    auVar136._16_4_ = (uint)bVar72 * auVar103._16_4_ | (uint)!bVar72 * (int)auVar100._16_4_;
    bVar72 = (bool)((byte)(uVar138 >> 5) & 1);
    auVar136._20_4_ = (uint)bVar72 * auVar103._20_4_ | (uint)!bVar72 * (int)auVar100._20_4_;
    bVar72 = (bool)((byte)(uVar138 >> 6) & 1);
    auVar136._24_4_ = (uint)bVar72 * auVar103._24_4_ | (uint)!bVar72 * (int)auVar100._24_4_;
    auVar136._28_4_ =
         (uVar138 >> 7) * auVar103._28_4_ | (uint)!SUB41(uVar138 >> 7,0) * (int)auVar100._28_4_;
    auVar100 = vshufps_avx(auVar136,auVar136,0xb1);
    auVar100 = vminps_avx(auVar136,auVar100);
    auVar103 = vshufpd_avx(auVar100,auVar100,5);
    auVar100 = vminps_avx(auVar100,auVar103);
    auVar103 = vpermpd_avx2(auVar100,0x4e);
    auVar100 = vminps_avx(auVar100,auVar103);
    uVar23 = vcmpps_avx512vl(auVar136,auVar100,0);
    bVar69 = (byte)uVar23 & bVar63;
    if (bVar69 != 0) {
      uVar138 = (uint)bVar69;
    }
    uVar139 = 0;
    for (; (uVar138 & 1) == 0; uVar138 = uVar138 >> 1 | 0x80000000) {
      uVar139 = uVar139 + 1;
    }
    local_d04 = aiStack_158[uVar68 * 0x18];
    bVar63 = ~('\x01' << ((byte)uVar139 & 0x1f)) & bVar63;
    abStack_1a0[lVar71] = bVar63;
    if (bVar63 == 0) {
      uVar75 = uVar75 - 1;
    }
    uVar163 = (undefined4)uVar70;
    auVar159._4_4_ = uVar163;
    auVar159._0_4_ = uVar163;
    auVar159._8_4_ = uVar163;
    auVar159._12_4_ = uVar163;
    auVar159._16_4_ = uVar163;
    auVar159._20_4_ = uVar163;
    auVar159._24_4_ = uVar163;
    auVar159._28_4_ = uVar163;
    auVar76 = vmovshdup_avx(auVar172);
    auVar76 = vsubps_avx(auVar76,auVar172);
    auVar176._0_4_ = auVar76._0_4_;
    auVar176._4_4_ = auVar176._0_4_;
    auVar176._8_4_ = auVar176._0_4_;
    auVar176._12_4_ = auVar176._0_4_;
    auVar176._16_4_ = auVar176._0_4_;
    auVar176._20_4_ = auVar176._0_4_;
    auVar176._24_4_ = auVar176._0_4_;
    auVar176._28_4_ = auVar176._0_4_;
    auVar76 = vfmadd132ps_fma(auVar176,auVar159,auVar160._0_32_);
    auVar100 = ZEXT1632(auVar76);
    local_400[0] = (RTCHitN)auVar100[0];
    local_400[1] = (RTCHitN)auVar100[1];
    local_400[2] = (RTCHitN)auVar100[2];
    local_400[3] = (RTCHitN)auVar100[3];
    local_400[4] = (RTCHitN)auVar100[4];
    local_400[5] = (RTCHitN)auVar100[5];
    local_400[6] = (RTCHitN)auVar100[6];
    local_400[7] = (RTCHitN)auVar100[7];
    local_400[8] = (RTCHitN)auVar100[8];
    local_400[9] = (RTCHitN)auVar100[9];
    local_400[10] = (RTCHitN)auVar100[10];
    local_400[0xb] = (RTCHitN)auVar100[0xb];
    local_400[0xc] = (RTCHitN)auVar100[0xc];
    local_400[0xd] = (RTCHitN)auVar100[0xd];
    local_400[0xe] = (RTCHitN)auVar100[0xe];
    local_400[0xf] = (RTCHitN)auVar100[0xf];
    local_400[0x10] = (RTCHitN)auVar100[0x10];
    local_400[0x11] = (RTCHitN)auVar100[0x11];
    local_400[0x12] = (RTCHitN)auVar100[0x12];
    local_400[0x13] = (RTCHitN)auVar100[0x13];
    local_400[0x14] = (RTCHitN)auVar100[0x14];
    local_400[0x15] = (RTCHitN)auVar100[0x15];
    local_400[0x16] = (RTCHitN)auVar100[0x16];
    local_400[0x17] = (RTCHitN)auVar100[0x17];
    local_400[0x18] = (RTCHitN)auVar100[0x18];
    local_400[0x19] = (RTCHitN)auVar100[0x19];
    local_400[0x1a] = (RTCHitN)auVar100[0x1a];
    local_400[0x1b] = (RTCHitN)auVar100[0x1b];
    local_400[0x1c] = (RTCHitN)auVar100[0x1c];
    local_400[0x1d] = (RTCHitN)auVar100[0x1d];
    local_400[0x1e] = (RTCHitN)auVar100[0x1e];
    local_400[0x1f] = (RTCHitN)auVar100[0x1f];
    local_610._8_8_ = 0;
    local_610._0_8_ = *(ulong *)(local_400 + (ulong)uVar139 * 4);
    uVar68 = (ulong)uVar75;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }